

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Primitive PVar30;
  Geometry *pGVar31;
  __int_type_conflict _Var32;
  long lVar33;
  RTCFilterFunctionN p_Var34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  bool bVar98;
  bool bVar99;
  bool bVar100;
  bool bVar101;
  bool bVar102;
  bool bVar103;
  bool bVar104;
  bool bVar105;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  uint uVar112;
  ulong uVar113;
  byte bVar114;
  ulong uVar115;
  long lVar116;
  long lVar117;
  uint uVar118;
  long lVar119;
  ulong uVar120;
  ulong uVar121;
  byte bVar122;
  float fVar123;
  __m128 a;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  float fVar186;
  float fVar188;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar189;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar190;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar187;
  float fVar191;
  float fVar192;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  float fVar193;
  float fVar194;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar213;
  float fVar215;
  float fVar219;
  float fVar221;
  float fVar222;
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar220 [16];
  undefined1 auVar207 [32];
  float fVar214;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar223;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar224;
  float fVar241;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [28];
  float fVar239;
  float fVar240;
  float fVar242;
  float fVar243;
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar244;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar245;
  float fVar246;
  float fVar262;
  float fVar264;
  float fVar266;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar268;
  float fVar270;
  float fVar272;
  undefined1 auVar257 [32];
  float fVar263;
  float fVar265;
  float fVar267;
  float fVar269;
  float fVar271;
  float fVar273;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar261 [32];
  float fVar274;
  float fVar291;
  float fVar292;
  undefined1 auVar275 [16];
  float fVar293;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  float fVar297;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar309;
  float fVar310;
  float fVar312;
  float fVar313;
  float fVar316;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar314;
  float fVar317;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  float fVar311;
  float fVar315;
  float fVar318;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [64];
  float fVar319;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [64];
  float fVar334;
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  float fVar349;
  float fVar353;
  float fVar361;
  float fVar364;
  float fVar367;
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  float fVar335;
  float fVar336;
  float fVar337;
  undefined1 auVar344 [32];
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar362;
  float fVar363;
  float fVar365;
  float fVar366;
  float fVar368;
  float fVar369;
  float fVar370;
  undefined1 auVar345 [32];
  undefined1 auVar381 [16];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  float fVar379;
  float fVar380;
  undefined1 auVar377 [32];
  undefined1 auVar378 [64];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [64];
  undefined1 auVar388 [16];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  float fVar395;
  undefined1 auVar394 [64];
  undefined1 auVar397 [16];
  float fVar396;
  float fVar405;
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar410;
  float in_register_0000151c;
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar407;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [64];
  float fVar411;
  float fVar412;
  undefined1 auVar413 [16];
  float fVar418;
  float fVar420;
  float fVar424;
  float fVar426;
  float fVar428;
  undefined1 auVar414 [32];
  undefined1 auVar415 [32];
  float fVar419;
  float fVar421;
  float fVar422;
  float fVar423;
  float fVar425;
  float fVar427;
  float fVar429;
  undefined1 auVar416 [32];
  float fVar430;
  undefined1 auVar417 [32];
  float fVar431;
  float fVar437;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float in_register_0000159c;
  undefined1 auVar432 [32];
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  float fVar443;
  float fVar445;
  float fVar446;
  float fVar447;
  float fVar448;
  float fVar449;
  float fVar450;
  float in_register_000015dc;
  undefined1 auVar444 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_af1;
  int local_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab8;
  undefined4 uStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  ulong local_a88;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [32];
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  RTCFilterFunctionNArguments local_990;
  undefined1 local_960 [32];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_920;
  undefined4 local_918;
  float local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  uint local_904;
  uint local_900;
  ulong local_8e8;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  Primitive *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  ulong local_660;
  undefined1 auStack_658 [24];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0 [4];
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar30 = prim[1];
  uVar113 = (ulong)(byte)PVar30;
  lVar116 = uVar113 * 0x25;
  fVar224 = *(float *)(prim + lVar116 + 0x12);
  auVar127 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + lVar116 + 6));
  auVar158._0_4_ = fVar224 * auVar127._0_4_;
  auVar158._4_4_ = fVar224 * auVar127._4_4_;
  auVar158._8_4_ = fVar224 * auVar127._8_4_;
  auVar158._12_4_ = fVar224 * auVar127._12_4_;
  auVar275._0_4_ = fVar224 * (ray->dir).field_0.m128[0];
  auVar275._4_4_ = fVar224 * (ray->dir).field_0.m128[1];
  auVar275._8_4_ = fVar224 * (ray->dir).field_0.m128[2];
  auVar275._12_4_ = fVar224 * (ray->dir).field_0.m128[3];
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 4 + 6)));
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 4 + 10)));
  auVar139._16_16_ = auVar135;
  auVar139._0_16_ = auVar127;
  lVar33 = uVar113 * 5;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar33 + 6)));
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar33 + 10)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar205._16_16_ = auVar135;
  auVar205._0_16_ = auVar127;
  auVar35 = vcvtdq2ps_avx(auVar205);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 6 + 6)));
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 6 + 10)));
  auVar232._16_16_ = auVar135;
  auVar232._0_16_ = auVar127;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0xf + 6)));
  auVar36 = vcvtdq2ps_avx(auVar232);
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0xf + 10)));
  auVar233._16_16_ = auVar135;
  auVar233._0_16_ = auVar127;
  lVar119 = (ulong)(byte)PVar30 * 0x10;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar233);
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + 10)));
  auVar300._16_16_ = auVar135;
  auVar300._0_16_ = auVar127;
  auVar38 = vcvtdq2ps_avx(auVar300);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + uVar113 + 6)));
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar119 + uVar113 + 10)));
  auVar320._16_16_ = auVar135;
  auVar320._0_16_ = auVar127;
  auVar39 = vcvtdq2ps_avx(auVar320);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1a + 6)));
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1a + 10)));
  auVar340._16_16_ = auVar135;
  auVar340._0_16_ = auVar127;
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1b + 6)));
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1b + 10)));
  auVar417 = vcvtdq2ps_avx(auVar340);
  auVar373._16_16_ = auVar135;
  auVar373._0_16_ = auVar127;
  auVar40 = vcvtdq2ps_avx(auVar373);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1c + 6)));
  auVar135 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar113 * 0x1c + 10)));
  auVar382._16_16_ = auVar135;
  auVar382._0_16_ = auVar127;
  auVar41 = vcvtdq2ps_avx(auVar382);
  auVar127 = vshufps_avx(auVar275,auVar275,0);
  auVar135 = vshufps_avx(auVar275,auVar275,0x55);
  auVar129 = vshufps_avx(auVar275,auVar275,0xaa);
  fVar224 = auVar129._0_4_;
  fVar187 = auVar129._4_4_;
  fVar239 = auVar129._8_4_;
  fVar192 = auVar129._12_4_;
  fVar240 = auVar135._0_4_;
  fVar123 = auVar135._4_4_;
  fVar241 = auVar135._8_4_;
  fVar189 = auVar135._12_4_;
  fVar242 = auVar127._0_4_;
  fVar243 = auVar127._4_4_;
  fVar244 = auVar127._8_4_;
  fVar245 = auVar127._12_4_;
  auVar398._0_4_ = fVar242 * auVar139._0_4_ + fVar240 * auVar35._0_4_ + fVar224 * auVar36._0_4_;
  auVar398._4_4_ = fVar243 * auVar139._4_4_ + fVar123 * auVar35._4_4_ + fVar187 * auVar36._4_4_;
  auVar398._8_4_ = fVar244 * auVar139._8_4_ + fVar241 * auVar35._8_4_ + fVar239 * auVar36._8_4_;
  auVar398._12_4_ = fVar245 * auVar139._12_4_ + fVar189 * auVar35._12_4_ + fVar192 * auVar36._12_4_;
  auVar398._16_4_ = fVar242 * auVar139._16_4_ + fVar240 * auVar35._16_4_ + fVar224 * auVar36._16_4_;
  auVar398._20_4_ = fVar243 * auVar139._20_4_ + fVar123 * auVar35._20_4_ + fVar187 * auVar36._20_4_;
  auVar398._24_4_ = fVar244 * auVar139._24_4_ + fVar241 * auVar35._24_4_ + fVar239 * auVar36._24_4_;
  auVar398._28_4_ = fVar189 + in_register_000015dc + in_register_0000151c;
  auVar389._0_4_ = fVar242 * auVar37._0_4_ + fVar240 * auVar38._0_4_ + fVar224 * auVar39._0_4_;
  auVar389._4_4_ = fVar243 * auVar37._4_4_ + fVar123 * auVar38._4_4_ + fVar187 * auVar39._4_4_;
  auVar389._8_4_ = fVar244 * auVar37._8_4_ + fVar241 * auVar38._8_4_ + fVar239 * auVar39._8_4_;
  auVar389._12_4_ = fVar245 * auVar37._12_4_ + fVar189 * auVar38._12_4_ + fVar192 * auVar39._12_4_;
  auVar389._16_4_ = fVar242 * auVar37._16_4_ + fVar240 * auVar38._16_4_ + fVar224 * auVar39._16_4_;
  auVar389._20_4_ = fVar243 * auVar37._20_4_ + fVar123 * auVar38._20_4_ + fVar187 * auVar39._20_4_;
  auVar389._24_4_ = fVar244 * auVar37._24_4_ + fVar241 * auVar38._24_4_ + fVar239 * auVar39._24_4_;
  auVar389._28_4_ = fVar189 + in_register_000015dc + in_register_0000159c;
  auVar279._0_4_ = fVar242 * auVar417._0_4_ + fVar240 * auVar40._0_4_ + auVar41._0_4_ * fVar224;
  auVar279._4_4_ = fVar243 * auVar417._4_4_ + fVar123 * auVar40._4_4_ + auVar41._4_4_ * fVar187;
  auVar279._8_4_ = fVar244 * auVar417._8_4_ + fVar241 * auVar40._8_4_ + auVar41._8_4_ * fVar239;
  auVar279._12_4_ = fVar245 * auVar417._12_4_ + fVar189 * auVar40._12_4_ + auVar41._12_4_ * fVar192;
  auVar279._16_4_ = fVar242 * auVar417._16_4_ + fVar240 * auVar40._16_4_ + auVar41._16_4_ * fVar224;
  auVar279._20_4_ = fVar243 * auVar417._20_4_ + fVar123 * auVar40._20_4_ + auVar41._20_4_ * fVar187;
  auVar279._24_4_ = fVar244 * auVar417._24_4_ + fVar241 * auVar40._24_4_ + auVar41._24_4_ * fVar239;
  auVar279._28_4_ = fVar245 + fVar189 + fVar192;
  auVar127 = vshufps_avx(auVar158,auVar158,0);
  auVar135 = vshufps_avx(auVar158,auVar158,0x55);
  auVar129 = vshufps_avx(auVar158,auVar158,0xaa);
  fVar187 = auVar129._0_4_;
  fVar239 = auVar129._4_4_;
  fVar192 = auVar129._8_4_;
  fVar240 = auVar129._12_4_;
  fVar243 = auVar135._0_4_;
  fVar244 = auVar135._4_4_;
  fVar245 = auVar135._8_4_;
  fVar262 = auVar135._12_4_;
  fVar123 = auVar127._0_4_;
  fVar241 = auVar127._4_4_;
  fVar189 = auVar127._8_4_;
  fVar242 = auVar127._12_4_;
  fVar224 = auVar139._28_4_;
  auVar206._0_4_ = fVar123 * auVar139._0_4_ + fVar243 * auVar35._0_4_ + fVar187 * auVar36._0_4_;
  auVar206._4_4_ = fVar241 * auVar139._4_4_ + fVar244 * auVar35._4_4_ + fVar239 * auVar36._4_4_;
  auVar206._8_4_ = fVar189 * auVar139._8_4_ + fVar245 * auVar35._8_4_ + fVar192 * auVar36._8_4_;
  auVar206._12_4_ = fVar242 * auVar139._12_4_ + fVar262 * auVar35._12_4_ + fVar240 * auVar36._12_4_;
  auVar206._16_4_ = fVar123 * auVar139._16_4_ + fVar243 * auVar35._16_4_ + fVar187 * auVar36._16_4_;
  auVar206._20_4_ = fVar241 * auVar139._20_4_ + fVar244 * auVar35._20_4_ + fVar239 * auVar36._20_4_;
  auVar206._24_4_ = fVar189 * auVar139._24_4_ + fVar245 * auVar35._24_4_ + fVar192 * auVar36._24_4_;
  auVar206._28_4_ = fVar224 + auVar35._28_4_ + auVar36._28_4_;
  auVar169._0_4_ = fVar123 * auVar37._0_4_ + fVar243 * auVar38._0_4_ + fVar187 * auVar39._0_4_;
  auVar169._4_4_ = fVar241 * auVar37._4_4_ + fVar244 * auVar38._4_4_ + fVar239 * auVar39._4_4_;
  auVar169._8_4_ = fVar189 * auVar37._8_4_ + fVar245 * auVar38._8_4_ + fVar192 * auVar39._8_4_;
  auVar169._12_4_ = fVar242 * auVar37._12_4_ + fVar262 * auVar38._12_4_ + fVar240 * auVar39._12_4_;
  auVar169._16_4_ = fVar123 * auVar37._16_4_ + fVar243 * auVar38._16_4_ + fVar187 * auVar39._16_4_;
  auVar169._20_4_ = fVar241 * auVar37._20_4_ + fVar244 * auVar38._20_4_ + fVar239 * auVar39._20_4_;
  auVar169._24_4_ = fVar189 * auVar37._24_4_ + fVar245 * auVar38._24_4_ + fVar192 * auVar39._24_4_;
  auVar169._28_4_ = fVar224 + auVar36._28_4_ + auVar39._28_4_;
  auVar140._0_4_ = fVar123 * auVar417._0_4_ + fVar243 * auVar40._0_4_ + auVar41._0_4_ * fVar187;
  auVar140._4_4_ = fVar241 * auVar417._4_4_ + fVar244 * auVar40._4_4_ + auVar41._4_4_ * fVar239;
  auVar140._8_4_ = fVar189 * auVar417._8_4_ + fVar245 * auVar40._8_4_ + auVar41._8_4_ * fVar192;
  auVar140._12_4_ = fVar242 * auVar417._12_4_ + fVar262 * auVar40._12_4_ + auVar41._12_4_ * fVar240;
  auVar140._16_4_ = fVar123 * auVar417._16_4_ + fVar243 * auVar40._16_4_ + auVar41._16_4_ * fVar187;
  auVar140._20_4_ = fVar241 * auVar417._20_4_ + fVar244 * auVar40._20_4_ + auVar41._20_4_ * fVar239;
  auVar140._24_4_ = fVar189 * auVar417._24_4_ + fVar245 * auVar40._24_4_ + auVar41._24_4_ * fVar192;
  auVar140._28_4_ = fVar224 + auVar38._28_4_ + fVar240;
  auVar301._8_4_ = 0x7fffffff;
  auVar301._0_8_ = 0x7fffffff7fffffff;
  auVar301._12_4_ = 0x7fffffff;
  auVar301._16_4_ = 0x7fffffff;
  auVar301._20_4_ = 0x7fffffff;
  auVar301._24_4_ = 0x7fffffff;
  auVar301._28_4_ = 0x7fffffff;
  auVar321._8_4_ = 0x219392ef;
  auVar321._0_8_ = 0x219392ef219392ef;
  auVar321._12_4_ = 0x219392ef;
  auVar321._16_4_ = 0x219392ef;
  auVar321._20_4_ = 0x219392ef;
  auVar321._24_4_ = 0x219392ef;
  auVar321._28_4_ = 0x219392ef;
  auVar139 = vandps_avx(auVar398,auVar301);
  auVar139 = vcmpps_avx(auVar139,auVar321,1);
  auVar35 = vblendvps_avx(auVar398,auVar321,auVar139);
  auVar139 = vandps_avx(auVar389,auVar301);
  auVar139 = vcmpps_avx(auVar139,auVar321,1);
  auVar36 = vblendvps_avx(auVar389,auVar321,auVar139);
  auVar139 = vandps_avx(auVar279,auVar301);
  auVar139 = vcmpps_avx(auVar139,auVar321,1);
  auVar139 = vblendvps_avx(auVar279,auVar321,auVar139);
  auVar37 = vrcpps_avx(auVar35);
  fVar224 = auVar37._0_4_;
  fVar239 = auVar37._4_4_;
  auVar38._4_4_ = auVar35._4_4_ * fVar239;
  auVar38._0_4_ = auVar35._0_4_ * fVar224;
  fVar240 = auVar37._8_4_;
  auVar38._8_4_ = auVar35._8_4_ * fVar240;
  fVar241 = auVar37._12_4_;
  auVar38._12_4_ = auVar35._12_4_ * fVar241;
  fVar242 = auVar37._16_4_;
  auVar38._16_4_ = auVar35._16_4_ * fVar242;
  fVar243 = auVar37._20_4_;
  auVar38._20_4_ = auVar35._20_4_ * fVar243;
  fVar244 = auVar37._24_4_;
  auVar38._24_4_ = auVar35._24_4_ * fVar244;
  auVar38._28_4_ = auVar35._28_4_;
  auVar322._8_4_ = 0x3f800000;
  auVar322._0_8_ = &DAT_3f8000003f800000;
  auVar322._12_4_ = 0x3f800000;
  auVar322._16_4_ = 0x3f800000;
  auVar322._20_4_ = 0x3f800000;
  auVar322._24_4_ = 0x3f800000;
  auVar322._28_4_ = 0x3f800000;
  auVar39 = vsubps_avx(auVar322,auVar38);
  fVar224 = fVar224 + fVar224 * auVar39._0_4_;
  fVar239 = fVar239 + fVar239 * auVar39._4_4_;
  fVar240 = fVar240 + fVar240 * auVar39._8_4_;
  fVar241 = fVar241 + fVar241 * auVar39._12_4_;
  fVar242 = fVar242 + fVar242 * auVar39._16_4_;
  fVar243 = fVar243 + fVar243 * auVar39._20_4_;
  fVar244 = fVar244 + fVar244 * auVar39._24_4_;
  auVar38 = vrcpps_avx(auVar36);
  fVar245 = auVar38._0_4_;
  fVar262 = auVar38._4_4_;
  auVar35._4_4_ = fVar262 * auVar36._4_4_;
  auVar35._0_4_ = fVar245 * auVar36._0_4_;
  fVar264 = auVar38._8_4_;
  auVar35._8_4_ = fVar264 * auVar36._8_4_;
  fVar266 = auVar38._12_4_;
  auVar35._12_4_ = fVar266 * auVar36._12_4_;
  fVar268 = auVar38._16_4_;
  auVar35._16_4_ = fVar268 * auVar36._16_4_;
  fVar270 = auVar38._20_4_;
  auVar35._20_4_ = fVar270 * auVar36._20_4_;
  fVar272 = auVar38._24_4_;
  auVar35._24_4_ = fVar272 * auVar36._24_4_;
  auVar35._28_4_ = auVar36._28_4_;
  auVar36 = vsubps_avx(auVar322,auVar35);
  fVar245 = fVar245 + fVar245 * auVar36._0_4_;
  fVar262 = fVar262 + fVar262 * auVar36._4_4_;
  fVar264 = fVar264 + fVar264 * auVar36._8_4_;
  fVar266 = fVar266 + fVar266 * auVar36._12_4_;
  fVar268 = fVar268 + fVar268 * auVar36._16_4_;
  fVar270 = fVar270 + fVar270 * auVar36._20_4_;
  fVar272 = fVar272 + fVar272 * auVar36._24_4_;
  auVar35 = vrcpps_avx(auVar139);
  fVar274 = auVar35._0_4_;
  fVar291 = auVar35._4_4_;
  auVar417._4_4_ = fVar291 * auVar139._4_4_;
  auVar417._0_4_ = fVar274 * auVar139._0_4_;
  fVar292 = auVar35._8_4_;
  auVar417._8_4_ = fVar292 * auVar139._8_4_;
  fVar293 = auVar35._12_4_;
  auVar417._12_4_ = fVar293 * auVar139._12_4_;
  fVar294 = auVar35._16_4_;
  auVar417._16_4_ = fVar294 * auVar139._16_4_;
  fVar295 = auVar35._20_4_;
  auVar417._20_4_ = fVar295 * auVar139._20_4_;
  fVar296 = auVar35._24_4_;
  auVar417._24_4_ = fVar296 * auVar139._24_4_;
  auVar417._28_4_ = auVar139._28_4_;
  auVar139 = vsubps_avx(auVar322,auVar417);
  fVar274 = fVar274 + fVar274 * auVar139._0_4_;
  fVar291 = fVar291 + fVar291 * auVar139._4_4_;
  fVar292 = fVar292 + fVar292 * auVar139._8_4_;
  fVar293 = fVar293 + fVar293 * auVar139._12_4_;
  fVar294 = fVar294 + fVar294 * auVar139._16_4_;
  fVar295 = fVar295 + fVar295 * auVar139._20_4_;
  fVar296 = fVar296 + fVar296 * auVar139._24_4_;
  auVar127 = ZEXT416((uint)(((ray->dir).field_0.m128[3] - *(float *)(prim + lVar116 + 0x16)) *
                           *(float *)(prim + lVar116 + 0x1a)));
  auVar220 = vshufps_avx(auVar127,auVar127,0);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar113 * 7 + 6);
  auVar127 = vpmovsxwd_avx(auVar127);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(prim + uVar113 * 7 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar135);
  auVar323._16_16_ = auVar135;
  auVar323._0_16_ = auVar127;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = *(ulong *)(prim + uVar113 * 0xb + 6);
  auVar127 = vpmovsxwd_avx(auVar129);
  auVar139 = vcvtdq2ps_avx(auVar323);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar113 * 0xb + 0xe);
  auVar135 = vpmovsxwd_avx(auVar134);
  auVar341._16_16_ = auVar135;
  auVar341._0_16_ = auVar127;
  auVar35 = vcvtdq2ps_avx(auVar341);
  auVar35 = vsubps_avx(auVar35,auVar139);
  fVar187 = auVar220._0_4_;
  fVar192 = auVar220._4_4_;
  fVar123 = auVar220._8_4_;
  fVar189 = auVar220._12_4_;
  auVar324._0_4_ = auVar35._0_4_ * fVar187 + auVar139._0_4_;
  auVar324._4_4_ = auVar35._4_4_ * fVar192 + auVar139._4_4_;
  auVar324._8_4_ = auVar35._8_4_ * fVar123 + auVar139._8_4_;
  auVar324._12_4_ = auVar35._12_4_ * fVar189 + auVar139._12_4_;
  auVar324._16_4_ = auVar35._16_4_ * fVar187 + auVar139._16_4_;
  auVar324._20_4_ = auVar35._20_4_ * fVar192 + auVar139._20_4_;
  auVar324._24_4_ = auVar35._24_4_ * fVar123 + auVar139._24_4_;
  auVar324._28_4_ = auVar35._28_4_ + auVar139._28_4_;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + uVar113 * 9 + 6);
  auVar127 = vpmovsxwd_avx(auVar220);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar113 * 9 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar128);
  auVar342._16_16_ = auVar135;
  auVar342._0_16_ = auVar127;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar113 * 0xd + 6);
  auVar127 = vpmovsxwd_avx(auVar12);
  auVar139 = vcvtdq2ps_avx(auVar342);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar113 * 0xd + 0xe);
  auVar135 = vpmovsxwd_avx(auVar13);
  auVar374._16_16_ = auVar135;
  auVar374._0_16_ = auVar127;
  auVar35 = vcvtdq2ps_avx(auVar374);
  auVar35 = vsubps_avx(auVar35,auVar139);
  auVar343._0_4_ = auVar139._0_4_ + auVar35._0_4_ * fVar187;
  auVar343._4_4_ = auVar139._4_4_ + auVar35._4_4_ * fVar192;
  auVar343._8_4_ = auVar139._8_4_ + auVar35._8_4_ * fVar123;
  auVar343._12_4_ = auVar139._12_4_ + auVar35._12_4_ * fVar189;
  auVar343._16_4_ = auVar139._16_4_ + auVar35._16_4_ * fVar187;
  auVar343._20_4_ = auVar139._20_4_ + auVar35._20_4_ * fVar192;
  auVar343._24_4_ = auVar139._24_4_ + auVar35._24_4_ * fVar123;
  auVar343._28_4_ = auVar139._28_4_ + auVar35._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar113 * 0x12 + 6);
  auVar127 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar113 * 0x12 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar15);
  auVar375._16_16_ = auVar135;
  auVar375._0_16_ = auVar127;
  uVar120 = (ulong)(uint)((int)lVar33 << 2);
  lVar116 = uVar113 * 2 + uVar120;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + lVar116 + 6);
  auVar127 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar116 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar17);
  auVar139 = vcvtdq2ps_avx(auVar375);
  auVar383._16_16_ = auVar135;
  auVar383._0_16_ = auVar127;
  auVar35 = vcvtdq2ps_avx(auVar383);
  auVar35 = vsubps_avx(auVar35,auVar139);
  auVar376._0_4_ = auVar139._0_4_ + auVar35._0_4_ * fVar187;
  auVar376._4_4_ = auVar139._4_4_ + auVar35._4_4_ * fVar192;
  auVar376._8_4_ = auVar139._8_4_ + auVar35._8_4_ * fVar123;
  auVar376._12_4_ = auVar139._12_4_ + auVar35._12_4_ * fVar189;
  auVar376._16_4_ = auVar139._16_4_ + auVar35._16_4_ * fVar187;
  auVar376._20_4_ = auVar139._20_4_ + auVar35._20_4_ * fVar192;
  auVar376._24_4_ = auVar139._24_4_ + auVar35._24_4_ * fVar123;
  auVar376._28_4_ = auVar139._28_4_ + auVar35._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar120 + 6);
  auVar127 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar120 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar19);
  auVar384._16_16_ = auVar135;
  auVar384._0_16_ = auVar127;
  auVar139 = vcvtdq2ps_avx(auVar384);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar113 * 0x18 + 6);
  auVar127 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar113 * 0x18 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar21);
  auVar390._16_16_ = auVar135;
  auVar390._0_16_ = auVar127;
  auVar35 = vcvtdq2ps_avx(auVar390);
  auVar35 = vsubps_avx(auVar35,auVar139);
  auVar385._0_4_ = auVar139._0_4_ + auVar35._0_4_ * fVar187;
  auVar385._4_4_ = auVar139._4_4_ + auVar35._4_4_ * fVar192;
  auVar385._8_4_ = auVar139._8_4_ + auVar35._8_4_ * fVar123;
  auVar385._12_4_ = auVar139._12_4_ + auVar35._12_4_ * fVar189;
  auVar385._16_4_ = auVar139._16_4_ + auVar35._16_4_ * fVar187;
  auVar385._20_4_ = auVar139._20_4_ + auVar35._20_4_ * fVar192;
  auVar385._24_4_ = auVar139._24_4_ + auVar35._24_4_ * fVar123;
  auVar385._28_4_ = auVar139._28_4_ + auVar35._28_4_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar113 * 0x1d + 6);
  auVar127 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar113 * 0x1d + 0xe);
  auVar135 = vpmovsxwd_avx(auVar23);
  auVar391._16_16_ = auVar135;
  auVar391._0_16_ = auVar127;
  lVar116 = uVar113 + (ulong)(byte)PVar30 * 0x20;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + lVar116 + 6);
  auVar127 = vpmovsxwd_avx(auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar116 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar25);
  auVar399._16_16_ = auVar135;
  auVar399._0_16_ = auVar127;
  auVar139 = vcvtdq2ps_avx(auVar391);
  auVar35 = vcvtdq2ps_avx(auVar399);
  auVar35 = vsubps_avx(auVar35,auVar139);
  auVar392._0_4_ = auVar139._0_4_ + auVar35._0_4_ * fVar187;
  auVar392._4_4_ = auVar139._4_4_ + auVar35._4_4_ * fVar192;
  auVar392._8_4_ = auVar139._8_4_ + auVar35._8_4_ * fVar123;
  auVar392._12_4_ = auVar139._12_4_ + auVar35._12_4_ * fVar189;
  auVar392._16_4_ = auVar139._16_4_ + auVar35._16_4_ * fVar187;
  auVar392._20_4_ = auVar139._20_4_ + auVar35._20_4_ * fVar192;
  auVar392._24_4_ = auVar139._24_4_ + auVar35._24_4_ * fVar123;
  auVar392._28_4_ = auVar139._28_4_ + auVar35._28_4_;
  lVar116 = (ulong)(byte)PVar30 * 0x20 - uVar113;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar116 + 6);
  auVar127 = vpmovsxwd_avx(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar116 + 0xe);
  auVar135 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar113 * 0x23 + 6);
  auVar129 = vpmovsxwd_avx(auVar28);
  auVar400._16_16_ = auVar135;
  auVar400._0_16_ = auVar127;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar113 * 0x23 + 0xe);
  auVar127 = vpmovsxwd_avx(auVar29);
  auVar414._16_16_ = auVar127;
  auVar414._0_16_ = auVar129;
  auVar139 = vcvtdq2ps_avx(auVar400);
  auVar35 = vcvtdq2ps_avx(auVar414);
  auVar35 = vsubps_avx(auVar35,auVar139);
  auVar401._0_4_ = auVar139._0_4_ + auVar35._0_4_ * fVar187;
  auVar401._4_4_ = auVar139._4_4_ + auVar35._4_4_ * fVar192;
  auVar401._8_4_ = auVar139._8_4_ + auVar35._8_4_ * fVar123;
  auVar401._12_4_ = auVar139._12_4_ + auVar35._12_4_ * fVar189;
  auVar401._16_4_ = auVar139._16_4_ + auVar35._16_4_ * fVar187;
  auVar401._20_4_ = auVar139._20_4_ + auVar35._20_4_ * fVar192;
  auVar401._24_4_ = auVar139._24_4_ + auVar35._24_4_ * fVar123;
  auVar401._28_4_ = auVar139._28_4_ + fVar189;
  auVar139 = vsubps_avx(auVar324,auVar206);
  auVar298._0_4_ = fVar224 * auVar139._0_4_;
  auVar298._4_4_ = fVar239 * auVar139._4_4_;
  auVar298._8_4_ = fVar240 * auVar139._8_4_;
  auVar298._12_4_ = fVar241 * auVar139._12_4_;
  auVar40._16_4_ = fVar242 * auVar139._16_4_;
  auVar40._0_16_ = auVar298;
  auVar40._20_4_ = fVar243 * auVar139._20_4_;
  auVar40._24_4_ = fVar244 * auVar139._24_4_;
  auVar40._28_4_ = auVar139._28_4_;
  auVar139 = vsubps_avx(auVar343,auVar206);
  auVar225._0_4_ = fVar224 * auVar139._0_4_;
  auVar225._4_4_ = fVar239 * auVar139._4_4_;
  auVar225._8_4_ = fVar240 * auVar139._8_4_;
  auVar225._12_4_ = fVar241 * auVar139._12_4_;
  auVar41._16_4_ = fVar242 * auVar139._16_4_;
  auVar41._0_16_ = auVar225;
  auVar41._20_4_ = fVar243 * auVar139._20_4_;
  auVar41._24_4_ = fVar244 * auVar139._24_4_;
  auVar41._28_4_ = auVar37._28_4_ + auVar39._28_4_;
  auVar139 = vsubps_avx(auVar376,auVar169);
  auVar195._0_4_ = fVar245 * auVar139._0_4_;
  auVar195._4_4_ = fVar262 * auVar139._4_4_;
  auVar195._8_4_ = fVar264 * auVar139._8_4_;
  auVar195._12_4_ = fVar266 * auVar139._12_4_;
  auVar37._16_4_ = fVar268 * auVar139._16_4_;
  auVar37._0_16_ = auVar195;
  auVar37._20_4_ = fVar270 * auVar139._20_4_;
  auVar37._24_4_ = fVar272 * auVar139._24_4_;
  auVar37._28_4_ = auVar139._28_4_;
  auVar139 = vsubps_avx(auVar385,auVar169);
  auVar247._0_4_ = fVar245 * auVar139._0_4_;
  auVar247._4_4_ = fVar262 * auVar139._4_4_;
  auVar247._8_4_ = fVar264 * auVar139._8_4_;
  auVar247._12_4_ = fVar266 * auVar139._12_4_;
  auVar39._16_4_ = fVar268 * auVar139._16_4_;
  auVar39._0_16_ = auVar247;
  auVar39._20_4_ = fVar270 * auVar139._20_4_;
  auVar39._24_4_ = fVar272 * auVar139._24_4_;
  auVar39._28_4_ = auVar38._28_4_ + auVar36._28_4_;
  auVar139 = vsubps_avx(auVar392,auVar140);
  auVar159._0_4_ = fVar274 * auVar139._0_4_;
  auVar159._4_4_ = fVar291 * auVar139._4_4_;
  auVar159._8_4_ = fVar292 * auVar139._8_4_;
  auVar159._12_4_ = fVar293 * auVar139._12_4_;
  auVar36._16_4_ = fVar294 * auVar139._16_4_;
  auVar36._0_16_ = auVar159;
  auVar36._20_4_ = fVar295 * auVar139._20_4_;
  auVar36._24_4_ = fVar296 * auVar139._24_4_;
  auVar36._28_4_ = auVar139._28_4_;
  auVar139 = vsubps_avx(auVar401,auVar140);
  auVar124._0_4_ = fVar274 * auVar139._0_4_;
  auVar124._4_4_ = fVar291 * auVar139._4_4_;
  auVar124._8_4_ = fVar292 * auVar139._8_4_;
  auVar124._12_4_ = fVar293 * auVar139._12_4_;
  auVar345._16_4_ = fVar294 * auVar139._16_4_;
  auVar345._0_16_ = auVar124;
  auVar345._20_4_ = fVar295 * auVar139._20_4_;
  auVar345._24_4_ = fVar296 * auVar139._24_4_;
  auVar345._28_4_ = auVar139._28_4_;
  auVar127 = vpminsd_avx(auVar40._16_16_,auVar41._16_16_);
  auVar135 = vpminsd_avx(auVar298,auVar225);
  auVar344._16_16_ = auVar127;
  auVar344._0_16_ = auVar135;
  auVar220 = auVar37._16_16_;
  auVar387 = ZEXT1664(auVar220);
  auVar127 = vpminsd_avx(auVar220,auVar39._16_16_);
  auVar135 = vpminsd_avx(auVar195,auVar247);
  auVar393._16_16_ = auVar127;
  auVar393._0_16_ = auVar135;
  auVar139 = vmaxps_avx(auVar344,auVar393);
  auVar129 = auVar345._16_16_;
  auVar394 = ZEXT1664(auVar129);
  auVar134 = auVar36._16_16_;
  auVar404 = ZEXT1664(auVar134);
  auVar127 = vpminsd_avx(auVar134,auVar129);
  auVar135 = vpminsd_avx(auVar159,auVar124);
  auVar415._16_16_ = auVar127;
  auVar415._0_16_ = auVar135;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar432._4_4_ = uVar7;
  auVar432._0_4_ = uVar7;
  auVar432._8_4_ = uVar7;
  auVar432._12_4_ = uVar7;
  auVar432._16_4_ = uVar7;
  auVar432._20_4_ = uVar7;
  auVar432._24_4_ = uVar7;
  auVar432._28_4_ = uVar7;
  auVar35 = vmaxps_avx(auVar415,auVar432);
  auVar139 = vmaxps_avx(auVar139,auVar35);
  local_2c0._4_4_ = auVar139._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar139._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar139._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar139._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar139._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar139._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar139._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar139._28_4_;
  auVar127 = vpmaxsd_avx(auVar40._16_16_,auVar41._16_16_);
  auVar135 = vpmaxsd_avx(auVar298,auVar225);
  auVar234._16_16_ = auVar127;
  auVar234._0_16_ = auVar135;
  auVar127 = vpmaxsd_avx(auVar220,auVar39._16_16_);
  auVar135 = vpmaxsd_avx(auVar195,auVar247);
  auVar207._16_16_ = auVar127;
  auVar207._0_16_ = auVar135;
  auVar139 = vminps_avx(auVar234,auVar207);
  auVar127 = vpmaxsd_avx(auVar134,auVar129);
  auVar135 = vpmaxsd_avx(auVar159,auVar124);
  auVar141._16_16_ = auVar127;
  auVar141._0_16_ = auVar135;
  fVar224 = ray->tfar;
  auVar170._4_4_ = fVar224;
  auVar170._0_4_ = fVar224;
  auVar170._8_4_ = fVar224;
  auVar170._12_4_ = fVar224;
  auVar170._16_4_ = fVar224;
  auVar170._20_4_ = fVar224;
  auVar170._24_4_ = fVar224;
  auVar170._28_4_ = fVar224;
  auVar35 = vminps_avx(auVar141,auVar170);
  auVar139 = vminps_avx(auVar139,auVar35);
  auVar42._4_4_ = auVar139._4_4_ * 1.0000004;
  auVar42._0_4_ = auVar139._0_4_ * 1.0000004;
  auVar42._8_4_ = auVar139._8_4_ * 1.0000004;
  auVar42._12_4_ = auVar139._12_4_ * 1.0000004;
  auVar42._16_4_ = auVar139._16_4_ * 1.0000004;
  auVar42._20_4_ = auVar139._20_4_ * 1.0000004;
  auVar42._24_4_ = auVar139._24_4_ * 1.0000004;
  auVar42._28_4_ = auVar139._28_4_;
  auVar139 = vcmpps_avx(local_2c0,auVar42,2);
  auVar127 = vpshufd_avx(ZEXT116((byte)PVar30),0);
  auVar171._16_16_ = auVar127;
  auVar171._0_16_ = auVar127;
  auVar35 = vcvtdq2ps_avx(auVar171);
  auVar35 = vcmpps_avx(_DAT_02020f40,auVar35,1);
  auVar139 = vandps_avx(auVar139,auVar35);
  uVar112 = vmovmskps_avx(auVar139);
  local_af1 = uVar112 != 0;
  if (uVar112 == 0) {
    return local_af1;
  }
  uVar112 = uVar112 & 0xff;
  auVar142._16_16_ = mm_lookupmask_ps._240_16_;
  auVar142._0_16_ = mm_lookupmask_ps._240_16_;
  local_2a0 = vblendps_avx(auVar142,ZEXT832(0) << 0x20,0x80);
  auVar327 = ZEXT1664((undefined1  [16])0x0);
  local_7f0 = prim;
LAB_012153b1:
  local_7e8 = (ulong)uVar112;
  lVar116 = 0;
  if (local_7e8 != 0) {
    for (; (uVar112 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
    }
  }
  local_a88 = (ulong)*(uint *)(local_7f0 + 2);
  local_8e8 = (ulong)*(uint *)(local_7f0 + lVar116 * 4 + 6);
  pGVar31 = (context->scene->geometries).items[local_a88].ptr;
  uVar113 = (ulong)*(uint *)(*(long *)&pGVar31->field_0x58 +
                            local_8e8 *
                            pGVar31[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar224 = (pGVar31->time_range).lower;
  fVar224 = pGVar31->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar224) / ((pGVar31->time_range).upper - fVar224));
  auVar127 = vroundss_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),9);
  auVar127 = vminss_avx(auVar127,ZEXT416((uint)(pGVar31->fnumTimeSegments + -1.0)));
  auVar127 = vmaxss_avx(auVar327._0_16_,auVar127);
  fVar224 = fVar224 - auVar127._0_4_;
  _Var32 = pGVar31[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar117 = (long)(int)auVar127._0_4_ * 0x38;
  lVar116 = *(long *)(_Var32 + 0x10 + lVar117);
  lVar33 = *(long *)(_Var32 + 0x38 + lVar117);
  lVar119 = *(long *)(_Var32 + 0x48 + lVar117);
  auVar127 = vshufps_avx(ZEXT416((uint)fVar224),ZEXT416((uint)fVar224),0);
  pfVar1 = (float *)(lVar33 + uVar113 * lVar119);
  fVar240 = auVar127._0_4_;
  fVar123 = auVar127._4_4_;
  fVar241 = auVar127._8_4_;
  fVar189 = auVar127._12_4_;
  pfVar2 = (float *)(lVar33 + (uVar113 + 1) * lVar119);
  pfVar3 = (float *)(lVar33 + (uVar113 + 2) * lVar119);
  uVar115 = lVar119 * (uVar113 + 3);
  pfVar4 = (float *)(lVar33 + uVar115);
  lVar33 = *(long *)(_Var32 + lVar117);
  auVar127 = vshufps_avx(ZEXT416((uint)(1.0 - fVar224)),ZEXT416((uint)(1.0 - fVar224)),0);
  pfVar5 = (float *)(lVar33 + lVar116 * uVar113);
  fVar224 = auVar127._0_4_;
  fVar187 = auVar127._4_4_;
  fVar239 = auVar127._8_4_;
  fVar192 = auVar127._12_4_;
  pfVar6 = (float *)(lVar33 + lVar116 * (uVar113 + 1));
  auVar196._0_4_ = fVar240 * *pfVar1 + fVar224 * *pfVar5;
  auVar196._4_4_ = fVar123 * pfVar1[1] + fVar187 * pfVar5[1];
  auVar196._8_4_ = fVar241 * pfVar1[2] + fVar239 * pfVar5[2];
  auVar196._12_4_ = fVar189 * pfVar1[3] + fVar192 * pfVar5[3];
  pfVar1 = (float *)(lVar33 + lVar116 * (uVar113 + 2));
  auVar226._0_4_ = fVar224 * *pfVar6 + fVar240 * *pfVar2;
  auVar226._4_4_ = fVar187 * pfVar6[1] + fVar123 * pfVar2[1];
  auVar226._8_4_ = fVar239 * pfVar6[2] + fVar241 * pfVar2[2];
  auVar226._12_4_ = fVar192 * pfVar6[3] + fVar189 * pfVar2[3];
  auVar248._0_4_ = fVar224 * *pfVar1 + fVar240 * *pfVar3;
  auVar248._4_4_ = fVar187 * pfVar1[1] + fVar123 * pfVar3[1];
  auVar248._8_4_ = fVar239 * pfVar1[2] + fVar241 * pfVar3[2];
  auVar248._12_4_ = fVar192 * pfVar1[3] + fVar189 * pfVar3[3];
  pfVar1 = (float *)(lVar33 + lVar116 * (uVar113 + 3));
  auVar276._0_4_ = fVar224 * *pfVar1 + fVar240 * *pfVar4;
  auVar276._4_4_ = fVar187 * pfVar1[1] + fVar123 * pfVar4[1];
  auVar276._8_4_ = fVar239 * pfVar1[2] + fVar241 * pfVar4[2];
  auVar276._12_4_ = fVar192 * pfVar1[3] + fVar189 * pfVar4[3];
  auVar125._0_4_ = (auVar196._0_4_ + auVar226._0_4_ + auVar248._0_4_ + auVar276._0_4_) * 0.25;
  auVar125._4_4_ = (auVar196._4_4_ + auVar226._4_4_ + auVar248._4_4_ + auVar276._4_4_) * 0.25;
  auVar125._8_4_ = (auVar196._8_4_ + auVar226._8_4_ + auVar248._8_4_ + auVar276._8_4_) * 0.25;
  auVar125._12_4_ = (auVar196._12_4_ + auVar226._12_4_ + auVar248._12_4_ + auVar276._12_4_) * 0.25;
  aVar9 = (ray->org).field_0.field_1;
  aVar10 = (ray->dir).field_0.field_1;
  auVar127 = vsubps_avx(auVar125,(undefined1  [16])aVar9);
  auVar127 = vdpps_avx(auVar127,(undefined1  [16])aVar10,0x7f);
  auVar135 = vdpps_avx((undefined1  [16])aVar10,(undefined1  [16])aVar10,0x7f);
  auVar129 = vrcpss_avx(auVar135,auVar135);
  auVar378 = ZEXT464(0x40000000);
  fVar224 = auVar127._0_4_ * auVar129._0_4_ * (2.0 - auVar129._0_4_ * auVar135._0_4_);
  local_810 = ZEXT416((uint)fVar224);
  auVar135 = vshufps_avx(local_810,ZEXT416((uint)fVar224),0);
  fVar224 = aVar10.x;
  fVar187 = aVar10.y;
  fVar239 = aVar10.z;
  aVar190 = aVar10.field_3;
  auVar299._0_4_ = aVar9.x + fVar224 * auVar135._0_4_;
  auVar299._4_4_ = aVar9.y + fVar187 * auVar135._4_4_;
  auVar299._8_4_ = aVar9.z + fVar239 * auVar135._8_4_;
  auVar299._12_4_ = aVar9.field_3.w + aVar190.w * auVar135._12_4_;
  auVar127 = vblendps_avx(auVar299,_DAT_01feba10,8);
  auVar308 = ZEXT1664(auVar127);
  _local_9a0 = vsubps_avx(auVar196,auVar127);
  auVar327 = ZEXT1664(_local_9a0);
  _local_9b0 = vsubps_avx(auVar248,auVar127);
  _local_9c0 = vsubps_avx(auVar226,auVar127);
  _local_9d0 = vsubps_avx(auVar276,auVar127);
  auVar127 = vshufps_avx(_local_9a0,_local_9a0,0);
  register0x00001290 = auVar127;
  _local_1a0 = auVar127;
  auVar127 = vshufps_avx(_local_9a0,_local_9a0,0x55);
  register0x00001290 = auVar127;
  _local_1c0 = auVar127;
  auVar127 = vshufps_avx(_local_9a0,_local_9a0,0xaa);
  register0x00001290 = auVar127;
  _local_1e0 = auVar127;
  auVar127 = vshufps_avx(_local_9a0,_local_9a0,0xff);
  register0x00001290 = auVar127;
  _local_200 = auVar127;
  auVar127 = vshufps_avx(_local_9c0,_local_9c0,0);
  register0x00001290 = auVar127;
  _local_220 = auVar127;
  auVar127 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001290 = auVar127;
  _local_300 = auVar127;
  auVar127 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001290 = auVar127;
  _local_240 = auVar127;
  auVar160._0_4_ = fVar224 * fVar224;
  auVar160._4_4_ = fVar187 * fVar187;
  auVar160._8_4_ = fVar239 * fVar239;
  auVar160._12_4_ = aVar190.w * aVar190.w;
  auVar127 = vshufps_avx(auVar160,auVar160,0xaa);
  auVar129 = vshufps_avx(auVar160,auVar160,0x55);
  auVar134 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x000012d0 = auVar134;
  _local_260 = auVar134;
  auVar134 = vshufps_avx(auVar160,auVar160,0);
  local_280._0_4_ = auVar134._0_4_ + auVar129._0_4_ + auVar127._0_4_;
  local_280._4_4_ = auVar134._4_4_ + auVar129._4_4_ + auVar127._4_4_;
  local_280._8_4_ = auVar134._8_4_ + auVar129._8_4_ + auVar127._8_4_;
  local_280._12_4_ = auVar134._12_4_ + auVar129._12_4_ + auVar127._12_4_;
  local_280._16_4_ = auVar134._0_4_ + auVar129._0_4_ + auVar127._0_4_;
  local_280._20_4_ = auVar134._4_4_ + auVar129._4_4_ + auVar127._4_4_;
  local_280._24_4_ = auVar134._8_4_ + auVar129._8_4_ + auVar127._8_4_;
  local_280._28_4_ = auVar134._12_4_ + auVar129._12_4_ + auVar127._12_4_;
  auVar127 = vshufps_avx(_local_9b0,_local_9b0,0);
  register0x00001250 = auVar127;
  _local_320 = auVar127;
  auVar127 = vshufps_avx(_local_9b0,_local_9b0,0x55);
  register0x00001250 = auVar127;
  _local_340 = auVar127;
  auVar127 = vshufps_avx(_local_9b0,_local_9b0,0xaa);
  register0x00001250 = auVar127;
  _local_360 = auVar127;
  auVar127 = vshufps_avx(_local_9b0,_local_9b0,0xff);
  register0x00001250 = auVar127;
  _local_380 = auVar127;
  auVar127 = vshufps_avx(_local_9d0,_local_9d0,0);
  register0x00001250 = auVar127;
  _local_3a0 = auVar127;
  auVar127 = vshufps_avx(_local_9d0,_local_9d0,0x55);
  register0x00001250 = auVar127;
  _local_3c0 = auVar127;
  auVar127 = vshufps_avx(_local_9d0,_local_9d0,0xaa);
  register0x00001250 = auVar127;
  _local_3e0 = auVar127;
  auVar127 = vshufps_avx(_local_9d0,_local_9d0,0xff);
  local_400._16_16_ = auVar127;
  local_400._0_16_ = auVar127;
  register0x00001210 = auVar135;
  _local_860 = auVar135;
  uVar120 = 1;
  uVar113 = 0;
  bVar122 = 0;
  local_540 = (ray->dir).field_0.m128[0];
  local_740 = (ray->dir).field_0.m128[1];
  local_520 = (ray->dir).field_0.m128[2];
  auVar143._8_4_ = 0x7fffffff;
  auVar143._0_8_ = 0x7fffffff7fffffff;
  auVar143._12_4_ = 0x7fffffff;
  auVar143._16_4_ = 0x7fffffff;
  auVar143._20_4_ = 0x7fffffff;
  auVar143._24_4_ = 0x7fffffff;
  auVar143._28_4_ = 0x7fffffff;
  local_420 = vandps_avx(local_280,auVar143);
  local_800 = ZEXT816(0x3f80000000000000);
  auVar290 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  fStack_73c = local_740;
  fStack_738 = local_740;
  fStack_734 = local_740;
  fStack_730 = local_740;
  fStack_72c = local_740;
  fStack_728 = local_740;
  fStack_724 = local_740;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  fStack_51c = local_520;
  fStack_518 = local_520;
  fStack_514 = local_520;
  fStack_510 = local_520;
  fStack_50c = local_520;
  fStack_508 = local_520;
  fStack_504 = local_520;
  do {
    auVar127 = vmovshdup_avx(local_800);
    fVar189 = auVar127._0_4_ - local_800._0_4_;
    auVar127 = vshufps_avx(local_800,local_800,0);
    local_6e0._16_16_ = auVar127;
    local_6e0._0_16_ = auVar127;
    auVar135 = vshufps_avx(ZEXT416((uint)fVar189),ZEXT416((uint)fVar189),0);
    local_700._16_16_ = auVar135;
    local_700._0_16_ = auVar135;
    fVar430 = auVar135._0_4_;
    fVar186 = auVar135._4_4_;
    fVar188 = auVar135._8_4_;
    fVar191 = auVar135._12_4_;
    fVar193 = auVar127._0_4_;
    auVar235._0_4_ = fVar193 + fVar430 * 0.0;
    fVar213 = auVar127._4_4_;
    auVar235._4_4_ = fVar213 + fVar186 * 0.14285715;
    fVar215 = auVar127._8_4_;
    auVar235._8_4_ = fVar215 + fVar188 * 0.2857143;
    fVar217 = auVar127._12_4_;
    auVar235._12_4_ = fVar217 + fVar191 * 0.42857146;
    auVar235._16_4_ = fVar193 + fVar430 * 0.5714286;
    auVar235._20_4_ = fVar213 + fVar186 * 0.71428573;
    auVar235._24_4_ = fVar215 + fVar188 * 0.8571429;
    auVar235._28_4_ = fVar217 + fVar191;
    auVar139 = vsubps_avx(auVar290._0_32_,auVar235);
    fVar224 = auVar139._0_4_;
    fVar187 = auVar139._4_4_;
    fVar239 = auVar139._8_4_;
    fVar192 = auVar139._12_4_;
    fVar240 = auVar139._16_4_;
    fVar123 = auVar139._20_4_;
    fVar241 = auVar139._24_4_;
    fVar245 = fVar224 * fVar224 * fVar224;
    fVar266 = fVar187 * fVar187 * fVar187;
    fVar270 = fVar239 * fVar239 * fVar239;
    fVar291 = fVar192 * fVar192 * fVar192;
    fVar295 = fVar240 * fVar240 * fVar240;
    fVar313 = fVar123 * fVar123 * fVar123;
    fVar316 = fVar241 * fVar241 * fVar241;
    fVar319 = auVar235._0_4_ * auVar235._0_4_ * auVar235._0_4_;
    fVar328 = auVar235._4_4_ * auVar235._4_4_ * auVar235._4_4_;
    fVar329 = auVar235._8_4_ * auVar235._8_4_ * auVar235._8_4_;
    fVar330 = auVar235._12_4_ * auVar235._12_4_ * auVar235._12_4_;
    fVar331 = auVar235._16_4_ * auVar235._16_4_ * auVar235._16_4_;
    fVar332 = auVar235._20_4_ * auVar235._20_4_ * auVar235._20_4_;
    fVar333 = auVar235._24_4_ * auVar235._24_4_ * auVar235._24_4_;
    fVar242 = auVar235._0_4_ * fVar224;
    fVar243 = auVar235._4_4_ * fVar187;
    fVar244 = auVar235._8_4_ * fVar239;
    fVar262 = auVar235._12_4_ * fVar192;
    fVar272 = auVar235._16_4_ * fVar240;
    fVar292 = auVar235._20_4_ * fVar123;
    fVar293 = auVar235._24_4_ * fVar241;
    fVar264 = auVar387._28_4_ + auVar404._28_4_;
    fVar370 = auVar327._28_4_ + auVar290._28_4_ + fVar264;
    fVar379 = fVar264 + auVar308._28_4_ + auVar394._28_4_ + auVar378._28_4_;
    fVar264 = fVar245 * 0.16666667;
    fVar268 = fVar266 * 0.16666667;
    fVar274 = fVar270 * 0.16666667;
    fVar294 = fVar291 * 0.16666667;
    fVar296 = fVar295 * 0.16666667;
    fVar314 = fVar313 * 0.16666667;
    fVar317 = fVar316 * 0.16666667;
    fVar334 = (fVar319 + fVar245 * 4.0 + fVar224 * fVar242 * 12.0 + auVar235._0_4_ * fVar242 * 6.0)
              * 0.16666667;
    fVar349 = (fVar328 + fVar266 * 4.0 + fVar187 * fVar243 * 12.0 + auVar235._4_4_ * fVar243 * 6.0)
              * 0.16666667;
    fVar353 = (fVar329 + fVar270 * 4.0 + fVar239 * fVar244 * 12.0 + auVar235._8_4_ * fVar244 * 6.0)
              * 0.16666667;
    fVar357 = (fVar330 + fVar291 * 4.0 + fVar192 * fVar262 * 12.0 + auVar235._12_4_ * fVar262 * 6.0)
              * 0.16666667;
    fVar361 = (fVar331 + fVar295 * 4.0 + fVar240 * fVar272 * 12.0 + auVar235._16_4_ * fVar272 * 6.0)
              * 0.16666667;
    fVar364 = (fVar332 + fVar313 * 4.0 + fVar123 * fVar292 * 12.0 + auVar235._20_4_ * fVar292 * 6.0)
              * 0.16666667;
    fVar367 = (fVar333 + fVar316 * 4.0 + fVar241 * fVar293 * 12.0 + auVar235._24_4_ * fVar293 * 6.0)
              * 0.16666667;
    fVar245 = (fVar319 * 4.0 + fVar245 + auVar235._0_4_ * fVar242 * 12.0 + fVar224 * fVar242 * 6.0)
              * 0.16666667;
    fVar266 = (fVar328 * 4.0 + fVar266 + auVar235._4_4_ * fVar243 * 12.0 + fVar187 * fVar243 * 6.0)
              * 0.16666667;
    fVar270 = (fVar329 * 4.0 + fVar270 + auVar235._8_4_ * fVar244 * 12.0 + fVar239 * fVar244 * 6.0)
              * 0.16666667;
    fVar291 = (fVar330 * 4.0 + fVar291 + auVar235._12_4_ * fVar262 * 12.0 + fVar192 * fVar262 * 6.0)
              * 0.16666667;
    fVar295 = (fVar331 * 4.0 + fVar295 + auVar235._16_4_ * fVar272 * 12.0 + fVar240 * fVar272 * 6.0)
              * 0.16666667;
    fVar313 = (fVar332 * 4.0 + fVar313 + auVar235._20_4_ * fVar292 * 12.0 + fVar123 * fVar292 * 6.0)
              * 0.16666667;
    fVar316 = (fVar333 * 4.0 + fVar316 + auVar235._24_4_ * fVar293 * 12.0 + fVar241 * fVar293 * 6.0)
              * 0.16666667;
    fVar319 = fVar319 * 0.16666667;
    fVar328 = fVar328 * 0.16666667;
    fVar329 = fVar329 * 0.16666667;
    fVar330 = fVar330 * 0.16666667;
    fVar331 = fVar331 * 0.16666667;
    fVar332 = fVar332 * 0.16666667;
    fVar333 = fVar333 * 0.16666667;
    fVar395 = auVar394._28_4_ + 12.0;
    fVar380 = fVar379 + 12.166667;
    local_940 = (float)local_1a0._0_4_ * fVar264 +
                fVar334 * (float)local_220._0_4_ +
                fVar319 * (float)local_3a0._0_4_ + fVar245 * (float)local_320._0_4_;
    fStack_93c = (float)local_1a0._4_4_ * fVar268 +
                 fVar349 * (float)local_220._4_4_ +
                 fVar328 * (float)local_3a0._4_4_ + fVar266 * (float)local_320._4_4_;
    fStack_938 = fStack_198 * fVar274 +
                 fVar353 * fStack_218 + fVar329 * fStack_398 + fVar270 * fStack_318;
    fStack_934 = fStack_194 * fVar294 +
                 fVar357 * fStack_214 + fVar330 * fStack_394 + fVar291 * fStack_314;
    fStack_930 = fStack_190 * fVar296 +
                 fVar361 * fStack_210 + fVar331 * fStack_390 + fVar295 * fStack_310;
    fStack_92c = fStack_18c * fVar314 +
                 fVar364 * fStack_20c + fVar332 * fStack_38c + fVar313 * fStack_30c;
    fStack_928 = fStack_188 * fVar317 +
                 fVar367 * fStack_208 + fVar333 * fStack_388 + fVar316 * fStack_308;
    fStack_924 = fVar370 + fVar380;
    fVar335 = (float)local_1c0._0_4_ * fVar264 +
              fVar334 * (float)local_300._0_4_ +
              fVar319 * (float)local_3c0._0_4_ + fVar245 * (float)local_340._0_4_;
    fVar350 = (float)local_1c0._4_4_ * fVar268 +
              fVar349 * (float)local_300._4_4_ +
              fVar328 * (float)local_3c0._4_4_ + fVar266 * (float)local_340._4_4_;
    fVar354 = fStack_1b8 * fVar274 +
              fVar353 * fStack_2f8 + fVar329 * fStack_3b8 + fVar270 * fStack_338;
    fVar358 = fStack_1b4 * fVar294 +
              fVar357 * fStack_2f4 + fVar330 * fStack_3b4 + fVar291 * fStack_334;
    fStack_ab0 = fStack_1b0 * fVar296 +
                 fVar361 * fStack_2f0 + fVar331 * fStack_3b0 + fVar295 * fStack_330;
    fStack_aac = fStack_1ac * fVar314 +
                 fVar364 * fStack_2ec + fVar332 * fStack_3ac + fVar313 * fStack_32c;
    fStack_aa8 = fStack_1a8 * fVar317 +
                 fVar367 * fStack_2e8 + fVar333 * fStack_3a8 + fVar316 * fStack_328;
    fStack_aa4 = fStack_924 + fVar395 + 12.166667;
    local_a80 = (float)local_1e0._0_4_ * fVar264 +
                (float)local_240._0_4_ * fVar334 +
                fVar319 * (float)local_3e0._0_4_ + fVar245 * (float)local_360._0_4_;
    fStack_a7c = (float)local_1e0._4_4_ * fVar268 +
                 (float)local_240._4_4_ * fVar349 +
                 fVar328 * (float)local_3e0._4_4_ + fVar266 * (float)local_360._4_4_;
    fStack_a78 = fStack_1d8 * fVar274 +
                 fStack_238 * fVar353 + fVar329 * fStack_3d8 + fVar270 * fStack_358;
    fStack_a74 = fStack_1d4 * fVar294 +
                 fStack_234 * fVar357 + fVar330 * fStack_3d4 + fVar291 * fStack_354;
    fStack_a70 = fStack_1d0 * fVar296 +
                 fStack_230 * fVar361 + fVar331 * fStack_3d0 + fVar295 * fStack_350;
    fStack_a6c = fStack_1cc * fVar314 +
                 fStack_22c * fVar364 + fVar332 * fStack_3cc + fVar313 * fStack_34c;
    fStack_a68 = fStack_1c8 * fVar317 +
                 fStack_228 * fVar367 + fVar333 * fStack_3c8 + fVar316 * fStack_348;
    fStack_a64 = fStack_aa4 + fVar395 + auVar404._28_4_ + 12.0;
    local_ae0._0_4_ =
         (float)local_200._0_4_ * fVar264 +
         (float)local_260._0_4_ * fVar334 +
         fVar245 * (float)local_380._0_4_ + local_400._0_4_ * fVar319;
    local_ae0._4_4_ =
         (float)local_200._4_4_ * fVar268 +
         (float)local_260._4_4_ * fVar349 +
         fVar266 * (float)local_380._4_4_ + local_400._4_4_ * fVar328;
    fStack_ad8 = fStack_1f8 * fVar274 +
                 fStack_258 * fVar353 + fVar270 * fStack_378 + local_400._8_4_ * fVar329;
    fStack_ad4 = fStack_1f4 * fVar294 +
                 fStack_254 * fVar357 + fVar291 * fStack_374 + local_400._12_4_ * fVar330;
    fStack_ad0 = fStack_1f0 * fVar296 +
                 fStack_250 * fVar361 + fVar295 * fStack_370 + local_400._16_4_ * fVar331;
    fStack_acc = fStack_1ec * fVar314 +
                 fStack_24c * fVar364 + fVar313 * fStack_36c + local_400._20_4_ * fVar332;
    fStack_ac8 = fStack_1e8 * fVar317 +
                 fStack_248 * fVar367 + fVar316 * fStack_368 + local_400._24_4_ * fVar333;
    fStack_ac4 = auVar308._28_4_ + fVar370 + fVar379 + auVar327._28_4_;
    auVar43._4_4_ = auVar235._4_4_ * -auVar235._4_4_;
    auVar43._0_4_ = auVar235._0_4_ * -auVar235._0_4_;
    auVar43._8_4_ = auVar235._8_4_ * -auVar235._8_4_;
    auVar43._12_4_ = auVar235._12_4_ * -auVar235._12_4_;
    auVar43._16_4_ = auVar235._16_4_ * -auVar235._16_4_;
    auVar43._20_4_ = auVar235._20_4_ * -auVar235._20_4_;
    auVar43._24_4_ = auVar235._24_4_ * -auVar235._24_4_;
    auVar43._28_4_ = auVar235._28_4_;
    auVar44._4_4_ = fVar243 * 4.0;
    auVar44._0_4_ = fVar242 * 4.0;
    auVar44._8_4_ = fVar244 * 4.0;
    auVar44._12_4_ = fVar262 * 4.0;
    auVar44._16_4_ = fVar272 * 4.0;
    auVar44._20_4_ = fVar292 * 4.0;
    auVar44._24_4_ = fVar293 * 4.0;
    auVar44._28_4_ = auVar290._28_4_;
    auVar139 = vsubps_avx(auVar43,auVar44);
    fVar316 = fVar224 * -fVar224 * 0.5;
    fVar317 = fVar187 * -fVar187 * 0.5;
    fVar319 = fVar239 * -fVar239 * 0.5;
    fVar328 = fVar192 * -fVar192 * 0.5;
    fVar329 = fVar240 * -fVar240 * 0.5;
    fVar330 = fVar123 * -fVar123 * 0.5;
    fVar331 = fVar241 * -fVar241 * 0.5;
    fVar270 = auVar139._0_4_ * 0.5;
    fVar274 = auVar139._4_4_ * 0.5;
    fVar294 = auVar139._8_4_ * 0.5;
    fVar295 = auVar139._12_4_ * 0.5;
    fVar296 = auVar139._16_4_ * 0.5;
    fVar313 = auVar139._20_4_ * 0.5;
    fVar314 = auVar139._24_4_ * 0.5;
    fVar245 = (fVar224 * fVar224 + fVar242 * 4.0) * 0.5;
    fVar264 = (fVar187 * fVar187 + fVar243 * 4.0) * 0.5;
    fVar266 = (fVar239 * fVar239 + fVar244 * 4.0) * 0.5;
    fVar268 = (fVar192 * fVar192 + fVar262 * 4.0) * 0.5;
    fVar291 = (fVar240 * fVar240 + fVar272 * 4.0) * 0.5;
    fVar292 = (fVar123 * fVar123 + fVar292 * 4.0) * 0.5;
    fVar293 = (fVar241 * fVar241 + fVar293 * 4.0) * 0.5;
    fVar224 = auVar235._0_4_ * auVar235._0_4_ * 0.5;
    fVar187 = auVar235._4_4_ * auVar235._4_4_ * 0.5;
    fVar239 = auVar235._8_4_ * auVar235._8_4_ * 0.5;
    fVar192 = auVar235._12_4_ * auVar235._12_4_ * 0.5;
    fVar241 = auVar235._16_4_ * auVar235._16_4_ * 0.5;
    fVar242 = auVar235._20_4_ * auVar235._20_4_ * 0.5;
    fVar243 = auVar235._24_4_ * auVar235._24_4_ * 0.5;
    fVar380 = fStack_aa4 + fVar380;
    auVar127 = vpermilps_avx(ZEXT416((uint)(fVar189 * 0.04761905)),0);
    fVar240 = auVar127._0_4_;
    fVar336 = fVar240 * ((float)local_1a0._0_4_ * fVar316 +
                        (float)local_220._0_4_ * fVar270 +
                        fVar245 * (float)local_320._0_4_ + fVar224 * (float)local_3a0._0_4_);
    fVar244 = auVar127._4_4_;
    fVar351 = fVar244 * ((float)local_1a0._4_4_ * fVar317 +
                        (float)local_220._4_4_ * fVar274 +
                        fVar264 * (float)local_320._4_4_ + fVar187 * (float)local_3a0._4_4_);
    local_a20._4_4_ = fVar351;
    local_a20._0_4_ = fVar336;
    fVar262 = auVar127._8_4_;
    fVar355 = fVar262 * (fStack_198 * fVar319 +
                        fStack_218 * fVar294 + fVar266 * fStack_318 + fVar239 * fStack_398);
    local_a20._8_4_ = fVar355;
    fVar272 = auVar127._12_4_;
    fVar359 = fVar272 * (fStack_194 * fVar328 +
                        fStack_214 * fVar295 + fVar268 * fStack_314 + fVar192 * fStack_394);
    local_a20._12_4_ = fVar359;
    fVar362 = fVar240 * (fStack_190 * fVar329 +
                        fStack_210 * fVar296 + fVar291 * fStack_310 + fVar241 * fStack_390);
    local_a20._16_4_ = fVar362;
    fVar365 = fVar244 * (fStack_18c * fVar330 +
                        fStack_20c * fVar313 + fVar292 * fStack_30c + fVar242 * fStack_38c);
    local_a20._20_4_ = fVar365;
    fVar368 = fVar262 * (fStack_188 * fVar331 +
                        fStack_208 * fVar314 + fVar293 * fStack_308 + fVar243 * fStack_388);
    local_a20._24_4_ = fVar368;
    local_a20._28_4_ = fVar380;
    fVar396 = fVar240 * ((float)local_1c0._0_4_ * fVar316 +
                        fVar270 * (float)local_300._0_4_ +
                        fVar245 * (float)local_340._0_4_ + fVar224 * (float)local_3c0._0_4_);
    fVar405 = fVar244 * ((float)local_1c0._4_4_ * fVar317 +
                        fVar274 * (float)local_300._4_4_ +
                        fVar264 * (float)local_340._4_4_ + fVar187 * (float)local_3c0._4_4_);
    auVar45._4_4_ = fVar405;
    auVar45._0_4_ = fVar396;
    fVar406 = fVar262 * (fStack_1b8 * fVar319 +
                        fVar294 * fStack_2f8 + fVar266 * fStack_338 + fVar239 * fStack_3b8);
    auVar45._8_4_ = fVar406;
    fVar407 = fVar272 * (fStack_1b4 * fVar328 +
                        fVar295 * fStack_2f4 + fVar268 * fStack_334 + fVar192 * fStack_3b4);
    auVar45._12_4_ = fVar407;
    fVar408 = fVar240 * (fStack_1b0 * fVar329 +
                        fVar296 * fStack_2f0 + fVar291 * fStack_330 + fVar241 * fStack_3b0);
    auVar45._16_4_ = fVar408;
    fVar409 = fVar244 * (fStack_1ac * fVar330 +
                        fVar313 * fStack_2ec + fVar292 * fStack_32c + fVar242 * fStack_3ac);
    auVar45._20_4_ = fVar409;
    fVar410 = fVar262 * (fStack_1a8 * fVar331 +
                        fVar314 * fStack_2e8 + fVar293 * fStack_328 + fVar243 * fStack_3a8);
    auVar45._24_4_ = fVar410;
    auVar45._28_4_ = fStack_1a4;
    fVar411 = fVar240 * ((float)local_1e0._0_4_ * fVar316 +
                        fVar224 * (float)local_3e0._0_4_ + fVar245 * (float)local_360._0_4_ +
                        (float)local_240._0_4_ * fVar270);
    fVar418 = fVar244 * ((float)local_1e0._4_4_ * fVar317 +
                        fVar187 * (float)local_3e0._4_4_ + fVar264 * (float)local_360._4_4_ +
                        (float)local_240._4_4_ * fVar274);
    auVar46._4_4_ = fVar418;
    auVar46._0_4_ = fVar411;
    fVar420 = fVar262 * (fStack_1d8 * fVar319 +
                        fVar239 * fStack_3d8 + fVar266 * fStack_358 + fStack_238 * fVar294);
    auVar46._8_4_ = fVar420;
    fVar422 = fVar272 * (fStack_1d4 * fVar328 +
                        fVar192 * fStack_3d4 + fVar268 * fStack_354 + fStack_234 * fVar295);
    auVar46._12_4_ = fVar422;
    fVar424 = fVar240 * (fStack_1d0 * fVar329 +
                        fVar241 * fStack_3d0 + fVar291 * fStack_350 + fStack_230 * fVar296);
    auVar46._16_4_ = fVar424;
    fVar426 = fVar244 * (fStack_1cc * fVar330 +
                        fVar242 * fStack_3cc + fVar292 * fStack_34c + fStack_22c * fVar313);
    auVar46._20_4_ = fVar426;
    fVar428 = fVar262 * (fStack_1c8 * fVar331 +
                        fVar243 * fStack_3c8 + fVar293 * fStack_348 + fStack_228 * fVar314);
    auVar46._24_4_ = fVar428;
    auVar46._28_4_ = uStack_1e4;
    fVar123 = fVar240 * ((float)local_200._0_4_ * fVar316 +
                        (float)local_260._0_4_ * fVar270 +
                        fVar224 * local_400._0_4_ + fVar245 * (float)local_380._0_4_);
    fVar245 = fVar244 * ((float)local_200._4_4_ * fVar317 +
                        (float)local_260._4_4_ * fVar274 +
                        fVar187 * local_400._4_4_ + fVar264 * (float)local_380._4_4_);
    auVar47._4_4_ = fVar245;
    auVar47._0_4_ = fVar123;
    fVar270 = fVar262 * (fStack_1f8 * fVar319 +
                        fStack_258 * fVar294 + fVar239 * local_400._8_4_ + fVar266 * fStack_378);
    auVar47._8_4_ = fVar270;
    fVar274 = fVar272 * (fStack_1f4 * fVar328 +
                        fStack_254 * fVar295 + fVar192 * local_400._12_4_ + fVar268 * fStack_374);
    auVar47._12_4_ = fVar274;
    fVar240 = fVar240 * (fStack_1f0 * fVar329 +
                        fStack_250 * fVar296 + fVar241 * local_400._16_4_ + fVar291 * fStack_370);
    auVar47._16_4_ = fVar240;
    fVar244 = fVar244 * (fStack_1ec * fVar330 +
                        fStack_24c * fVar313 + fVar242 * local_400._20_4_ + fVar292 * fStack_36c);
    auVar47._20_4_ = fVar244;
    fVar262 = fVar262 * (fStack_1e8 * fVar331 +
                        fStack_248 * fVar314 + fVar243 * local_400._24_4_ + fVar293 * fStack_368);
    auVar47._24_4_ = fVar262;
    auVar47._28_4_ = fVar272;
    auVar106._4_4_ = fVar350;
    auVar106._0_4_ = fVar335;
    auVar106._8_4_ = fVar354;
    auVar106._12_4_ = fVar358;
    auVar106._16_4_ = fStack_ab0;
    auVar106._20_4_ = fStack_aac;
    auVar106._24_4_ = fStack_aa8;
    auVar106._28_4_ = fStack_aa4;
    auVar139 = vperm2f128_avx(auVar106,auVar106,1);
    auVar139 = vshufps_avx(auVar139,auVar106,0x30);
    local_960 = vshufps_avx(auVar106,auVar139,0x29);
    auVar108._4_4_ = fStack_a7c;
    auVar108._0_4_ = local_a80;
    auVar108._8_4_ = fStack_a78;
    auVar108._12_4_ = fStack_a74;
    auVar108._16_4_ = fStack_a70;
    auVar108._20_4_ = fStack_a6c;
    auVar108._24_4_ = fStack_a68;
    auVar108._28_4_ = fStack_a64;
    auVar139 = vperm2f128_avx(auVar108,auVar108,1);
    auVar139 = vshufps_avx(auVar139,auVar108,0x30);
    _local_8e0 = vshufps_avx(auVar108,auVar139,0x29);
    auVar35 = vsubps_avx(_local_ae0,auVar47);
    auVar139 = vperm2f128_avx(auVar35,auVar35,1);
    auVar139 = vshufps_avx(auVar139,auVar35,0x30);
    local_720 = vshufps_avx(auVar35,auVar139,0x29);
    auVar36 = vsubps_avx(local_960,auVar106);
    auVar38 = vsubps_avx(_local_8e0,auVar108);
    fVar187 = auVar36._0_4_;
    fVar189 = auVar36._4_4_;
    auVar48._4_4_ = fVar418 * fVar189;
    auVar48._0_4_ = fVar411 * fVar187;
    fVar264 = auVar36._8_4_;
    auVar48._8_4_ = fVar420 * fVar264;
    fVar291 = auVar36._12_4_;
    auVar48._12_4_ = fVar422 * fVar291;
    fVar313 = auVar36._16_4_;
    auVar48._16_4_ = fVar424 * fVar313;
    fVar329 = auVar36._20_4_;
    auVar48._20_4_ = fVar426 * fVar329;
    fVar349 = auVar36._24_4_;
    auVar48._24_4_ = fVar428 * fVar349;
    auVar48._28_4_ = auVar35._28_4_;
    fVar239 = auVar38._0_4_;
    fVar242 = auVar38._4_4_;
    auVar49._4_4_ = fVar405 * fVar242;
    auVar49._0_4_ = fVar396 * fVar239;
    fVar266 = auVar38._8_4_;
    auVar49._8_4_ = fVar406 * fVar266;
    fVar292 = auVar38._12_4_;
    auVar49._12_4_ = fVar407 * fVar292;
    fVar314 = auVar38._16_4_;
    auVar49._16_4_ = fVar408 * fVar314;
    fVar330 = auVar38._20_4_;
    auVar49._20_4_ = fVar409 * fVar330;
    fVar353 = auVar38._24_4_;
    auVar49._24_4_ = fVar410 * fVar353;
    auVar49._28_4_ = auVar139._28_4_;
    auVar36 = vsubps_avx(auVar49,auVar48);
    auVar109._4_4_ = fStack_93c;
    auVar109._0_4_ = local_940;
    auVar109._8_4_ = fStack_938;
    auVar109._12_4_ = fStack_934;
    auVar109._16_4_ = fStack_930;
    auVar109._20_4_ = fStack_92c;
    auVar109._24_4_ = fStack_928;
    auVar109._28_4_ = fStack_924;
    auVar139 = vperm2f128_avx(auVar109,auVar109,1);
    auVar139 = vshufps_avx(auVar139,auVar109,0x30);
    local_a00 = vshufps_avx(auVar109,auVar139,0x29);
    auVar35 = vsubps_avx(local_a00,auVar109);
    auVar50._4_4_ = fVar351 * fVar242;
    auVar50._0_4_ = fVar336 * fVar239;
    auVar50._8_4_ = fVar355 * fVar266;
    auVar50._12_4_ = fVar359 * fVar292;
    auVar50._16_4_ = fVar362 * fVar314;
    auVar50._20_4_ = fVar365 * fVar330;
    auVar50._24_4_ = fVar368 * fVar353;
    auVar50._28_4_ = auVar139._28_4_;
    fVar192 = auVar35._0_4_;
    fVar243 = auVar35._4_4_;
    auVar51._4_4_ = fVar418 * fVar243;
    auVar51._0_4_ = fVar411 * fVar192;
    fVar268 = auVar35._8_4_;
    auVar51._8_4_ = fVar420 * fVar268;
    fVar293 = auVar35._12_4_;
    auVar51._12_4_ = fVar422 * fVar293;
    fVar316 = auVar35._16_4_;
    auVar51._16_4_ = fVar424 * fVar316;
    fVar331 = auVar35._20_4_;
    auVar51._20_4_ = fVar426 * fVar331;
    fVar357 = auVar35._24_4_;
    auVar51._24_4_ = fVar428 * fVar357;
    auVar51._28_4_ = local_8e0._28_4_;
    auVar37 = vsubps_avx(auVar51,auVar50);
    auVar52._4_4_ = fVar405 * fVar243;
    auVar52._0_4_ = fVar396 * fVar192;
    auVar52._8_4_ = fVar406 * fVar268;
    auVar52._12_4_ = fVar407 * fVar293;
    auVar52._16_4_ = fVar408 * fVar316;
    auVar52._20_4_ = fVar409 * fVar331;
    auVar52._24_4_ = fVar410 * fVar357;
    auVar52._28_4_ = local_8e0._28_4_;
    auVar53._4_4_ = fVar351 * fVar189;
    auVar53._0_4_ = fVar336 * fVar187;
    auVar53._8_4_ = fVar355 * fVar264;
    auVar53._12_4_ = fVar359 * fVar291;
    auVar53._16_4_ = fVar362 * fVar313;
    auVar53._20_4_ = fVar365 * fVar329;
    auVar53._24_4_ = fVar368 * fVar349;
    auVar53._28_4_ = uStack_1c4;
    auVar39 = vsubps_avx(auVar53,auVar52);
    fVar224 = auVar39._28_4_;
    auVar172._0_4_ = fVar192 * fVar192 + fVar187 * fVar187 + fVar239 * fVar239;
    auVar172._4_4_ = fVar243 * fVar243 + fVar189 * fVar189 + fVar242 * fVar242;
    auVar172._8_4_ = fVar268 * fVar268 + fVar264 * fVar264 + fVar266 * fVar266;
    auVar172._12_4_ = fVar293 * fVar293 + fVar291 * fVar291 + fVar292 * fVar292;
    auVar172._16_4_ = fVar316 * fVar316 + fVar313 * fVar313 + fVar314 * fVar314;
    auVar172._20_4_ = fVar331 * fVar331 + fVar329 * fVar329 + fVar330 * fVar330;
    auVar172._24_4_ = fVar357 * fVar357 + fVar349 * fVar349 + fVar353 * fVar353;
    auVar172._28_4_ = fVar224 + fVar224 + auVar36._28_4_;
    auVar139 = vrcpps_avx(auVar172);
    fVar294 = auVar139._0_4_;
    fVar295 = auVar139._4_4_;
    auVar54._4_4_ = fVar295 * auVar172._4_4_;
    auVar54._0_4_ = fVar294 * auVar172._0_4_;
    fVar296 = auVar139._8_4_;
    auVar54._8_4_ = fVar296 * auVar172._8_4_;
    fVar317 = auVar139._12_4_;
    auVar54._12_4_ = fVar317 * auVar172._12_4_;
    fVar319 = auVar139._16_4_;
    auVar54._16_4_ = fVar319 * auVar172._16_4_;
    fVar328 = auVar139._20_4_;
    auVar54._20_4_ = fVar328 * auVar172._20_4_;
    fVar332 = auVar139._24_4_;
    auVar54._24_4_ = fVar332 * auVar172._24_4_;
    auVar54._28_4_ = uStack_1c4;
    auVar433._8_4_ = 0x3f800000;
    auVar433._0_8_ = &DAT_3f8000003f800000;
    auVar433._12_4_ = 0x3f800000;
    auVar433._16_4_ = 0x3f800000;
    auVar433._20_4_ = 0x3f800000;
    auVar433._24_4_ = 0x3f800000;
    auVar433._28_4_ = 0x3f800000;
    auVar417 = vsubps_avx(auVar433,auVar54);
    fVar294 = auVar417._0_4_ * fVar294 + fVar294;
    fVar295 = auVar417._4_4_ * fVar295 + fVar295;
    fVar296 = auVar417._8_4_ * fVar296 + fVar296;
    fVar317 = auVar417._12_4_ * fVar317 + fVar317;
    fVar319 = auVar417._16_4_ * fVar319 + fVar319;
    fVar328 = auVar417._20_4_ * fVar328 + fVar328;
    fVar332 = auVar417._24_4_ * fVar332 + fVar332;
    auVar35 = vperm2f128_avx(auVar45,auVar45,1);
    auVar35 = vshufps_avx(auVar35,auVar45,0x30);
    local_8a0 = vshufps_avx(auVar45,auVar35,0x29);
    auVar35 = vperm2f128_avx(auVar46,auVar46,1);
    auVar35 = vshufps_avx(auVar35,auVar46,0x30);
    local_8c0 = vshufps_avx(auVar46,auVar35,0x29);
    fVar412 = local_8c0._0_4_;
    fVar419 = local_8c0._4_4_;
    auVar55._4_4_ = fVar419 * fVar189;
    auVar55._0_4_ = fVar412 * fVar187;
    fVar421 = local_8c0._8_4_;
    auVar55._8_4_ = fVar421 * fVar264;
    fVar423 = local_8c0._12_4_;
    auVar55._12_4_ = fVar423 * fVar291;
    fVar425 = local_8c0._16_4_;
    auVar55._16_4_ = fVar425 * fVar313;
    fVar427 = local_8c0._20_4_;
    auVar55._20_4_ = fVar427 * fVar329;
    fVar429 = local_8c0._24_4_;
    auVar55._24_4_ = fVar429 * fVar349;
    auVar55._28_4_ = auVar35._28_4_;
    fVar431 = local_8a0._0_4_;
    fVar437 = local_8a0._4_4_;
    auVar56._4_4_ = fVar437 * fVar242;
    auVar56._0_4_ = fVar431 * fVar239;
    fVar438 = local_8a0._8_4_;
    auVar56._8_4_ = fVar438 * fVar266;
    fVar439 = local_8a0._12_4_;
    auVar56._12_4_ = fVar439 * fVar292;
    fVar440 = local_8a0._16_4_;
    auVar56._16_4_ = fVar440 * fVar314;
    fVar441 = local_8a0._20_4_;
    auVar56._20_4_ = fVar441 * fVar330;
    fVar442 = local_8a0._24_4_;
    auVar56._24_4_ = fVar442 * fVar353;
    auVar56._28_4_ = fStack_1a4;
    auVar40 = vsubps_avx(auVar56,auVar55);
    auVar35 = vperm2f128_avx(local_a20,local_a20,1);
    auVar35 = vshufps_avx(auVar35,local_a20,0x30);
    local_6c0 = vshufps_avx(local_a20,auVar35,0x29);
    fVar337 = local_6c0._0_4_;
    fVar352 = local_6c0._4_4_;
    auVar57._4_4_ = fVar352 * fVar242;
    auVar57._0_4_ = fVar337 * fVar239;
    fVar356 = local_6c0._8_4_;
    auVar57._8_4_ = fVar356 * fVar266;
    fVar360 = local_6c0._12_4_;
    auVar57._12_4_ = fVar360 * fVar292;
    fVar363 = local_6c0._16_4_;
    auVar57._16_4_ = fVar363 * fVar314;
    fVar366 = local_6c0._20_4_;
    auVar57._20_4_ = fVar366 * fVar330;
    fVar369 = local_6c0._24_4_;
    auVar57._24_4_ = fVar369 * fVar353;
    auVar57._28_4_ = auVar35._28_4_;
    auVar58._4_4_ = fVar419 * fVar243;
    auVar58._0_4_ = fVar412 * fVar192;
    auVar58._8_4_ = fVar421 * fVar268;
    auVar58._12_4_ = fVar423 * fVar293;
    auVar58._16_4_ = fVar425 * fVar316;
    auVar58._20_4_ = fVar427 * fVar331;
    uVar112 = local_8c0._28_4_;
    auVar58._24_4_ = fVar429 * fVar357;
    auVar58._28_4_ = uVar112;
    auVar35 = vsubps_avx(auVar58,auVar57);
    auVar59._4_4_ = fVar437 * fVar243;
    auVar59._0_4_ = fVar431 * fVar192;
    auVar59._8_4_ = fVar438 * fVar268;
    auVar59._12_4_ = fVar439 * fVar293;
    auVar59._16_4_ = fVar440 * fVar316;
    auVar59._20_4_ = fVar441 * fVar331;
    auVar59._24_4_ = fVar442 * fVar357;
    auVar59._28_4_ = uVar112;
    auVar60._4_4_ = fVar352 * fVar189;
    auVar60._0_4_ = fVar337 * fVar187;
    auVar60._8_4_ = fVar356 * fVar264;
    auVar60._12_4_ = fVar360 * fVar291;
    auVar60._16_4_ = fVar363 * fVar313;
    auVar60._20_4_ = fVar366 * fVar329;
    auVar60._24_4_ = fVar369 * fVar349;
    auVar60._28_4_ = local_8a0._28_4_;
    auVar41 = vsubps_avx(auVar60,auVar59);
    fVar241 = auVar41._28_4_;
    fVar334 = auVar35._28_4_ + fVar241;
    auVar61._4_4_ =
         (auVar36._4_4_ * auVar36._4_4_ +
         auVar37._4_4_ * auVar37._4_4_ + auVar39._4_4_ * auVar39._4_4_) * fVar295;
    auVar61._0_4_ =
         (auVar36._0_4_ * auVar36._0_4_ +
         auVar37._0_4_ * auVar37._0_4_ + auVar39._0_4_ * auVar39._0_4_) * fVar294;
    auVar61._8_4_ =
         (auVar36._8_4_ * auVar36._8_4_ +
         auVar37._8_4_ * auVar37._8_4_ + auVar39._8_4_ * auVar39._8_4_) * fVar296;
    auVar61._12_4_ =
         (auVar36._12_4_ * auVar36._12_4_ +
         auVar37._12_4_ * auVar37._12_4_ + auVar39._12_4_ * auVar39._12_4_) * fVar317;
    auVar61._16_4_ =
         (auVar36._16_4_ * auVar36._16_4_ +
         auVar37._16_4_ * auVar37._16_4_ + auVar39._16_4_ * auVar39._16_4_) * fVar319;
    auVar61._20_4_ =
         (auVar36._20_4_ * auVar36._20_4_ +
         auVar37._20_4_ * auVar37._20_4_ + auVar39._20_4_ * auVar39._20_4_) * fVar328;
    auVar61._24_4_ =
         (auVar36._24_4_ * auVar36._24_4_ +
         auVar37._24_4_ * auVar37._24_4_ + auVar39._24_4_ * auVar39._24_4_) * fVar332;
    auVar61._28_4_ = auVar36._28_4_ + auVar37._28_4_ + fVar224;
    auVar62._4_4_ =
         (auVar40._4_4_ * auVar40._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar41._4_4_ * auVar41._4_4_) * fVar295;
    auVar62._0_4_ =
         (auVar40._0_4_ * auVar40._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar41._0_4_ * auVar41._0_4_) * fVar294;
    auVar62._8_4_ =
         (auVar40._8_4_ * auVar40._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar41._8_4_ * auVar41._8_4_) * fVar296;
    auVar62._12_4_ =
         (auVar40._12_4_ * auVar40._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar41._12_4_ * auVar41._12_4_) * fVar317;
    auVar62._16_4_ =
         (auVar40._16_4_ * auVar40._16_4_ +
         auVar35._16_4_ * auVar35._16_4_ + auVar41._16_4_ * auVar41._16_4_) * fVar319;
    auVar62._20_4_ =
         (auVar40._20_4_ * auVar40._20_4_ +
         auVar35._20_4_ * auVar35._20_4_ + auVar41._20_4_ * auVar41._20_4_) * fVar328;
    auVar62._24_4_ =
         (auVar40._24_4_ * auVar40._24_4_ +
         auVar35._24_4_ * auVar35._24_4_ + auVar41._24_4_ * auVar41._24_4_) * fVar332;
    auVar62._28_4_ = auVar417._28_4_ + auVar139._28_4_;
    auVar139 = vmaxps_avx(auVar61,auVar62);
    auVar35 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar35 = vshufps_avx(auVar35,_local_ae0,0x30);
    auVar37 = vshufps_avx(_local_ae0,auVar35,0x29);
    auVar144._0_4_ = (float)local_ae0._0_4_ + fVar123;
    auVar144._4_4_ = (float)local_ae0._4_4_ + fVar245;
    auVar144._8_4_ = fStack_ad8 + fVar270;
    auVar144._12_4_ = fStack_ad4 + fVar274;
    auVar144._16_4_ = fStack_ad0 + fVar240;
    auVar144._20_4_ = fStack_acc + fVar244;
    auVar144._24_4_ = fStack_ac8 + fVar262;
    auVar144._28_4_ = fStack_ac4 + fVar272;
    auVar35 = vmaxps_avx(_local_ae0,auVar144);
    auVar36 = vmaxps_avx(local_720,auVar37);
    auVar35 = vmaxps_avx(auVar35,auVar36);
    auVar36 = vrsqrtps_avx(auVar172);
    fVar224 = auVar36._0_4_;
    fVar240 = auVar36._4_4_;
    fVar123 = auVar36._8_4_;
    fVar244 = auVar36._12_4_;
    fVar245 = auVar36._16_4_;
    fVar262 = auVar36._20_4_;
    fVar270 = auVar36._24_4_;
    auVar63._4_4_ = fVar240 * fVar240 * fVar240 * auVar172._4_4_ * 0.5;
    auVar63._0_4_ = fVar224 * fVar224 * fVar224 * auVar172._0_4_ * 0.5;
    auVar63._8_4_ = fVar123 * fVar123 * fVar123 * auVar172._8_4_ * 0.5;
    auVar63._12_4_ = fVar244 * fVar244 * fVar244 * auVar172._12_4_ * 0.5;
    auVar63._16_4_ = fVar245 * fVar245 * fVar245 * auVar172._16_4_ * 0.5;
    auVar63._20_4_ = fVar262 * fVar262 * fVar262 * auVar172._20_4_ * 0.5;
    auVar63._24_4_ = fVar270 * fVar270 * fVar270 * auVar172._24_4_ * 0.5;
    auVar63._28_4_ = auVar172._28_4_;
    auVar64._4_4_ = fVar240 * 1.5;
    auVar64._0_4_ = fVar224 * 1.5;
    auVar64._8_4_ = fVar123 * 1.5;
    auVar64._12_4_ = fVar244 * 1.5;
    auVar64._16_4_ = fVar245 * 1.5;
    auVar64._20_4_ = fVar262 * 1.5;
    auVar64._24_4_ = fVar270 * 1.5;
    auVar64._28_4_ = auVar36._28_4_;
    auVar36 = vsubps_avx(auVar64,auVar63);
    auVar394 = ZEXT3264(auVar36);
    auVar107._4_4_ = fVar350;
    auVar107._0_4_ = fVar335;
    auVar107._8_4_ = fVar354;
    auVar107._12_4_ = fVar358;
    auVar107._16_4_ = fStack_ab0;
    auVar107._20_4_ = fStack_aac;
    auVar107._24_4_ = fStack_aa8;
    auVar107._28_4_ = fStack_aa4;
    auVar39 = vsubps_avx(ZEXT832(0) << 0x20,auVar107);
    auVar417 = vsubps_avx(ZEXT832(0) << 0x20,auVar108);
    fVar240 = auVar417._0_4_;
    fVar244 = auVar417._4_4_;
    fVar270 = auVar417._8_4_;
    fVar294 = auVar417._12_4_;
    fVar317 = auVar417._16_4_;
    fVar332 = auVar417._20_4_;
    fVar361 = auVar417._24_4_;
    fVar123 = auVar39._0_4_;
    fVar245 = auVar39._4_4_;
    fVar272 = auVar39._8_4_;
    fVar295 = auVar39._12_4_;
    fVar319 = auVar39._16_4_;
    fVar333 = auVar39._20_4_;
    fVar364 = auVar39._24_4_;
    auVar345 = ZEXT832(0) << 0x20;
    auVar41 = vsubps_avx(auVar345,auVar109);
    fVar443 = auVar41._0_4_;
    fVar445 = auVar41._4_4_;
    fVar446 = auVar41._8_4_;
    fVar447 = auVar41._12_4_;
    fVar448 = auVar41._16_4_;
    fVar449 = auVar41._20_4_;
    fVar450 = auVar41._24_4_;
    auVar386._0_4_ = fVar443 * local_540 + local_740 * fVar123 + local_520 * fVar240;
    auVar386._4_4_ = fVar445 * fStack_53c + fStack_73c * fVar245 + fStack_51c * fVar244;
    auVar386._8_4_ = fVar446 * fStack_538 + fStack_738 * fVar272 + fStack_518 * fVar270;
    auVar386._12_4_ = fVar447 * fStack_534 + fStack_734 * fVar295 + fStack_514 * fVar294;
    auVar386._16_4_ = fVar448 * fStack_530 + fStack_730 * fVar319 + fStack_510 * fVar317;
    auVar386._20_4_ = fVar449 * fStack_52c + fStack_72c * fVar333 + fStack_50c * fVar332;
    auVar386._24_4_ = fVar450 * fStack_528 + fStack_728 * fVar364 + fStack_508 * fVar361;
    auVar386._28_4_ = fVar334 + fVar334 + auVar40._28_4_ + fVar334;
    auVar402._0_4_ = fVar443 * fVar443 + fVar123 * fVar123 + fVar240 * fVar240;
    auVar402._4_4_ = fVar445 * fVar445 + fVar245 * fVar245 + fVar244 * fVar244;
    auVar402._8_4_ = fVar446 * fVar446 + fVar272 * fVar272 + fVar270 * fVar270;
    auVar402._12_4_ = fVar447 * fVar447 + fVar295 * fVar295 + fVar294 * fVar294;
    auVar402._16_4_ = fVar448 * fVar448 + fVar319 * fVar319 + fVar317 * fVar317;
    auVar402._20_4_ = fVar449 * fVar449 + fVar333 * fVar333 + fVar332 * fVar332;
    auVar402._24_4_ = fVar450 * fVar450 + fVar364 * fVar364 + fVar361 * fVar361;
    auVar402._28_4_ = fVar241 + fVar241 + fVar334;
    fVar241 = auVar36._0_4_;
    fVar262 = auVar36._4_4_;
    fVar274 = auVar36._8_4_;
    fVar296 = auVar36._12_4_;
    fVar328 = auVar36._16_4_;
    fVar334 = auVar36._20_4_;
    fVar367 = auVar36._24_4_;
    fVar224 = auVar38._28_4_;
    fVar194 = local_540 * fVar241 * fVar192 +
              fVar187 * fVar241 * local_740 + fVar241 * fVar239 * local_520;
    fVar214 = fStack_53c * fVar262 * fVar243 +
              fVar189 * fVar262 * fStack_73c + fVar262 * fVar242 * fStack_51c;
    fVar216 = fStack_538 * fVar274 * fVar268 +
              fVar264 * fVar274 * fStack_738 + fVar274 * fVar266 * fStack_518;
    fVar218 = fStack_534 * fVar296 * fVar293 +
              fVar291 * fVar296 * fStack_734 + fVar296 * fVar292 * fStack_514;
    fVar219 = fStack_530 * fVar328 * fVar316 +
              fVar313 * fVar328 * fStack_730 + fVar328 * fVar314 * fStack_510;
    fVar221 = fStack_52c * fVar334 * fVar331 +
              fVar329 * fVar334 * fStack_72c + fVar334 * fVar330 * fStack_50c;
    fVar222 = fStack_528 * fVar367 * fVar357 +
              fVar349 * fVar367 * fStack_728 + fVar367 * fVar353 * fStack_508;
    fVar370 = fStack_524 + fVar224 + fStack_504;
    local_a40._0_4_ =
         fVar443 * fVar241 * fVar192 + fVar187 * fVar241 * fVar123 + fVar241 * fVar239 * fVar240;
    local_a40._4_4_ =
         fVar445 * fVar262 * fVar243 + fVar189 * fVar262 * fVar245 + fVar262 * fVar242 * fVar244;
    fStack_a38 = fVar446 * fVar274 * fVar268 +
                 fVar264 * fVar274 * fVar272 + fVar274 * fVar266 * fVar270;
    fStack_a34 = fVar447 * fVar296 * fVar293 +
                 fVar291 * fVar296 * fVar295 + fVar296 * fVar292 * fVar294;
    fStack_a30 = fVar448 * fVar328 * fVar316 +
                 fVar313 * fVar328 * fVar319 + fVar328 * fVar314 * fVar317;
    fStack_a2c = fVar449 * fVar334 * fVar331 +
                 fVar329 * fVar334 * fVar333 + fVar334 * fVar330 * fVar332;
    fStack_a28 = fVar450 * fVar367 * fVar357 +
                 fVar349 * fVar367 * fVar364 + fVar367 * fVar353 * fVar361;
    fStack_a24 = fVar224 + fVar370;
    auVar65._4_4_ = fVar214 * (float)local_a40._4_4_;
    auVar65._0_4_ = fVar194 * (float)local_a40._0_4_;
    auVar65._8_4_ = fVar216 * fStack_a38;
    auVar65._12_4_ = fVar218 * fStack_a34;
    auVar65._16_4_ = fVar219 * fStack_a30;
    auVar65._20_4_ = fVar221 * fStack_a2c;
    auVar65._24_4_ = fVar222 * fStack_a28;
    auVar65._28_4_ = fVar370;
    auVar38 = vsubps_avx(auVar386,auVar65);
    auVar66._4_4_ = (float)local_a40._4_4_ * (float)local_a40._4_4_;
    auVar66._0_4_ = (float)local_a40._0_4_ * (float)local_a40._0_4_;
    auVar66._8_4_ = fStack_a38 * fStack_a38;
    auVar66._12_4_ = fStack_a34 * fStack_a34;
    auVar66._16_4_ = fStack_a30 * fStack_a30;
    auVar66._20_4_ = fStack_a2c * fStack_a2c;
    auVar66._24_4_ = fStack_a28 * fStack_a28;
    auVar66._28_4_ = fVar224;
    auVar40 = vsubps_avx(auVar402,auVar66);
    auVar36 = vsqrtps_avx(auVar139);
    fVar224 = (auVar36._0_4_ + auVar35._0_4_) * 1.0000002;
    fVar370 = (auVar36._4_4_ + auVar35._4_4_) * 1.0000002;
    fVar379 = (auVar36._8_4_ + auVar35._8_4_) * 1.0000002;
    fVar395 = (auVar36._12_4_ + auVar35._12_4_) * 1.0000002;
    fVar155 = (auVar36._16_4_ + auVar35._16_4_) * 1.0000002;
    fVar156 = (auVar36._20_4_ + auVar35._20_4_) * 1.0000002;
    fVar157 = (auVar36._24_4_ + auVar35._24_4_) * 1.0000002;
    auVar67._4_4_ = fVar370 * fVar370;
    auVar67._0_4_ = fVar224 * fVar224;
    auVar67._8_4_ = fVar379 * fVar379;
    auVar67._12_4_ = fVar395 * fVar395;
    auVar67._16_4_ = fVar155 * fVar155;
    auVar67._20_4_ = fVar156 * fVar156;
    auVar67._24_4_ = fVar157 * fVar157;
    auVar67._28_4_ = auVar36._28_4_ + auVar35._28_4_;
    fVar297 = auVar38._0_4_ + auVar38._0_4_;
    fVar309 = auVar38._4_4_ + auVar38._4_4_;
    local_880._0_8_ = CONCAT44(fVar309,fVar297);
    local_880._8_4_ = auVar38._8_4_ + auVar38._8_4_;
    local_880._12_4_ = auVar38._12_4_ + auVar38._12_4_;
    local_880._16_4_ = auVar38._16_4_ + auVar38._16_4_;
    local_880._20_4_ = auVar38._20_4_ + auVar38._20_4_;
    local_880._24_4_ = auVar38._24_4_ + auVar38._24_4_;
    local_880._28_4_ = auVar38._28_4_ + auVar38._28_4_;
    auVar35 = vsubps_avx(auVar40,auVar67);
    auVar68._4_4_ = fVar214 * fVar214;
    auVar68._0_4_ = fVar194 * fVar194;
    auVar68._8_4_ = fVar216 * fVar216;
    auVar68._12_4_ = fVar218 * fVar218;
    auVar68._16_4_ = fVar219 * fVar219;
    auVar68._20_4_ = fVar221 * fVar221;
    auVar68._24_4_ = fVar222 * fVar222;
    auVar68._28_4_ = auVar40._28_4_;
    auVar378 = ZEXT3264(auVar68);
    auVar38 = vsubps_avx(local_280,auVar68);
    auVar69._4_4_ = fVar309 * fVar309;
    auVar69._0_4_ = fVar297 * fVar297;
    auVar69._8_4_ = local_880._8_4_ * local_880._8_4_;
    auVar69._12_4_ = local_880._12_4_ * local_880._12_4_;
    auVar69._16_4_ = local_880._16_4_ * local_880._16_4_;
    auVar69._20_4_ = local_880._20_4_ * local_880._20_4_;
    auVar69._24_4_ = local_880._24_4_ * local_880._24_4_;
    auVar69._28_4_ = 0x3f800002;
    fVar370 = auVar38._0_4_;
    fVar379 = auVar38._4_4_;
    fVar395 = auVar38._8_4_;
    fVar155 = auVar38._12_4_;
    fVar156 = auVar38._16_4_;
    fVar157 = auVar38._20_4_;
    fVar223 = auVar38._24_4_;
    auVar70._4_4_ = auVar35._4_4_ * fVar379 * 4.0;
    auVar70._0_4_ = auVar35._0_4_ * fVar370 * 4.0;
    auVar70._8_4_ = auVar35._8_4_ * fVar395 * 4.0;
    auVar70._12_4_ = auVar35._12_4_ * fVar155 * 4.0;
    auVar70._16_4_ = auVar35._16_4_ * fVar156 * 4.0;
    auVar70._20_4_ = auVar35._20_4_ * fVar157 * 4.0;
    auVar70._24_4_ = auVar35._24_4_ * fVar223 * 4.0;
    auVar70._28_4_ = 0x40800000;
    auVar41 = vsubps_avx(auVar69,auVar70);
    auVar139 = vcmpps_avx(auVar41,auVar345,5);
    fVar224 = auVar38._28_4_;
    if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar139 >> 0x7f,0) == '\0') &&
          (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar139 >> 0xbf,0) == '\0') &&
        (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar139[0x1f])
    {
      auVar257._8_4_ = 0x7f800000;
      auVar257._0_8_ = 0x7f8000007f800000;
      auVar257._12_4_ = 0x7f800000;
      auVar257._16_4_ = 0x7f800000;
      auVar257._20_4_ = 0x7f800000;
      auVar257._24_4_ = 0x7f800000;
      auVar257._28_4_ = 0x7f800000;
      auVar404 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar140 = vsqrtps_avx(auVar41);
      auVar302._0_4_ = fVar370 + fVar370;
      auVar302._4_4_ = fVar379 + fVar379;
      auVar302._8_4_ = fVar395 + fVar395;
      auVar302._12_4_ = fVar155 + fVar155;
      auVar302._16_4_ = fVar156 + fVar156;
      auVar302._20_4_ = fVar157 + fVar157;
      auVar302._24_4_ = fVar223 + fVar223;
      auVar302._28_4_ = fVar224 + fVar224;
      auVar42 = vrcpps_avx(auVar302);
      auVar345 = vcmpps_avx(auVar41,auVar345,5);
      fVar246 = auVar42._0_4_;
      fVar263 = auVar42._4_4_;
      auVar71._4_4_ = auVar302._4_4_ * fVar263;
      auVar71._0_4_ = auVar302._0_4_ * fVar246;
      fVar265 = auVar42._8_4_;
      auVar71._8_4_ = auVar302._8_4_ * fVar265;
      fVar267 = auVar42._12_4_;
      auVar71._12_4_ = auVar302._12_4_ * fVar267;
      fVar269 = auVar42._16_4_;
      auVar71._16_4_ = auVar302._16_4_ * fVar269;
      fVar271 = auVar42._20_4_;
      auVar71._20_4_ = auVar302._20_4_ * fVar271;
      fVar273 = auVar42._24_4_;
      auVar71._24_4_ = auVar302._24_4_ * fVar273;
      auVar71._28_4_ = auVar41._28_4_;
      auVar303._8_4_ = 0x3f800000;
      auVar303._0_8_ = &DAT_3f8000003f800000;
      auVar303._12_4_ = 0x3f800000;
      auVar303._16_4_ = 0x3f800000;
      auVar303._20_4_ = 0x3f800000;
      auVar303._24_4_ = 0x3f800000;
      auVar303._28_4_ = 0x3f800000;
      auVar41 = vsubps_avx(auVar303,auVar71);
      fVar246 = fVar246 + fVar246 * auVar41._0_4_;
      fVar263 = fVar263 + fVar263 * auVar41._4_4_;
      fVar265 = fVar265 + fVar265 * auVar41._8_4_;
      fVar267 = fVar267 + fVar267 * auVar41._12_4_;
      fVar269 = fVar269 + fVar269 * auVar41._16_4_;
      fVar271 = fVar271 + fVar271 * auVar41._20_4_;
      fVar273 = fVar273 + fVar273 * auVar41._24_4_;
      auVar304._0_8_ = CONCAT44(fVar309,fVar297) ^ 0x8000000080000000;
      auVar304._8_4_ = -local_880._8_4_;
      auVar304._12_4_ = -local_880._12_4_;
      auVar304._16_4_ = -local_880._16_4_;
      auVar304._20_4_ = -local_880._20_4_;
      auVar304._24_4_ = -local_880._24_4_;
      auVar304._28_4_ = -local_880._28_4_;
      auVar141 = vsubps_avx(auVar304,auVar140);
      fVar297 = auVar141._0_4_ * fVar246;
      fVar309 = auVar141._4_4_ * fVar263;
      auVar72._4_4_ = fVar309;
      auVar72._0_4_ = fVar297;
      fVar310 = auVar141._8_4_ * fVar265;
      auVar72._8_4_ = fVar310;
      fVar311 = auVar141._12_4_ * fVar267;
      auVar72._12_4_ = fVar311;
      fVar312 = auVar141._16_4_ * fVar269;
      auVar72._16_4_ = fVar312;
      fVar315 = auVar141._20_4_ * fVar271;
      auVar72._20_4_ = fVar315;
      fVar318 = auVar141._24_4_ * fVar273;
      auVar72._24_4_ = fVar318;
      auVar72._28_4_ = auVar141._28_4_;
      auVar140 = vsubps_avx(auVar140,local_880);
      fVar246 = auVar140._0_4_ * fVar246;
      fVar263 = auVar140._4_4_ * fVar263;
      auVar73._4_4_ = fVar263;
      auVar73._0_4_ = fVar246;
      fVar265 = auVar140._8_4_ * fVar265;
      auVar73._8_4_ = fVar265;
      fVar267 = auVar140._12_4_ * fVar267;
      auVar73._12_4_ = fVar267;
      fVar269 = auVar140._16_4_ * fVar269;
      auVar73._16_4_ = fVar269;
      fVar271 = auVar140._20_4_ * fVar271;
      auVar73._20_4_ = fVar271;
      fVar273 = auVar140._24_4_ * fVar273;
      auVar73._24_4_ = fVar273;
      auVar73._28_4_ = auVar140._28_4_;
      fStack_4c4 = fStack_a24 + auVar42._28_4_ + auVar41._28_4_;
      local_4e0[0] = fVar241 * ((float)local_a40._0_4_ + fVar194 * fVar297);
      local_4e0[1] = fVar262 * ((float)local_a40._4_4_ + fVar214 * fVar309);
      local_4e0[2] = fVar274 * (fStack_a38 + fVar216 * fVar310);
      local_4e0[3] = fVar296 * (fStack_a34 + fVar218 * fVar311);
      fStack_4d0 = fVar328 * (fStack_a30 + fVar219 * fVar312);
      fStack_4cc = fVar334 * (fStack_a2c + fVar221 * fVar315);
      fStack_4c8 = fVar367 * (fStack_a28 + fVar222 * fVar318);
      local_500[0] = fVar241 * ((float)local_a40._0_4_ + fVar194 * fVar246);
      local_500[1] = fVar262 * ((float)local_a40._4_4_ + fVar214 * fVar263);
      local_500[2] = fVar274 * (fStack_a38 + fVar216 * fVar265);
      local_500[3] = fVar296 * (fStack_a34 + fVar218 * fVar267);
      fStack_4f0 = fVar328 * (fStack_a30 + fVar219 * fVar269);
      fStack_4ec = fVar334 * (fStack_a2c + fVar221 * fVar271);
      fStack_4e8 = fVar367 * (fStack_a28 + fVar222 * fVar273);
      fStack_4e4 = fStack_a24 + fStack_4c4;
      auVar258._8_4_ = 0x7f800000;
      auVar258._0_8_ = 0x7f8000007f800000;
      auVar258._12_4_ = 0x7f800000;
      auVar258._16_4_ = 0x7f800000;
      auVar258._20_4_ = 0x7f800000;
      auVar258._24_4_ = 0x7f800000;
      auVar258._28_4_ = 0x7f800000;
      auVar257 = vblendvps_avx(auVar258,auVar72,auVar345);
      auVar325._8_4_ = 0x7fffffff;
      auVar325._0_8_ = 0x7fffffff7fffffff;
      auVar325._12_4_ = 0x7fffffff;
      auVar325._16_4_ = 0x7fffffff;
      auVar325._20_4_ = 0x7fffffff;
      auVar325._24_4_ = 0x7fffffff;
      auVar325._28_4_ = 0x7fffffff;
      auVar41 = vandps_avx(auVar68,auVar325);
      auVar41 = vmaxps_avx(local_420,auVar41);
      auVar74._4_4_ = auVar41._4_4_ * 1.9073486e-06;
      auVar74._0_4_ = auVar41._0_4_ * 1.9073486e-06;
      auVar74._8_4_ = auVar41._8_4_ * 1.9073486e-06;
      auVar74._12_4_ = auVar41._12_4_ * 1.9073486e-06;
      auVar74._16_4_ = auVar41._16_4_ * 1.9073486e-06;
      auVar74._20_4_ = auVar41._20_4_ * 1.9073486e-06;
      auVar74._24_4_ = auVar41._24_4_ * 1.9073486e-06;
      auVar74._28_4_ = auVar41._28_4_;
      auVar41 = vandps_avx(auVar38,auVar325);
      auVar42 = vcmpps_avx(auVar41,auVar74,1);
      auVar305._8_4_ = 0xff800000;
      auVar305._0_8_ = 0xff800000ff800000;
      auVar305._12_4_ = 0xff800000;
      auVar305._16_4_ = 0xff800000;
      auVar305._20_4_ = 0xff800000;
      auVar305._24_4_ = 0xff800000;
      auVar305._28_4_ = 0xff800000;
      auVar41 = vblendvps_avx(auVar305,auVar73,auVar345);
      auVar404 = ZEXT3264(auVar41);
      auVar140 = auVar345 & auVar42;
      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar140 >> 0x7f,0) != '\0') ||
            (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar140 >> 0xbf,0) != '\0') ||
          (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar140[0x1f] < '\0') {
        auVar139 = vandps_avx(auVar42,auVar345);
        auVar127 = vpackssdw_avx(auVar139._0_16_,auVar139._16_16_);
        auVar42 = vcmpps_avx(auVar35,ZEXT832(0) << 0x20,2);
        auVar435._8_4_ = 0xff800000;
        auVar435._0_8_ = 0xff800000ff800000;
        auVar435._12_4_ = 0xff800000;
        auVar435._16_4_ = 0xff800000;
        auVar435._20_4_ = 0xff800000;
        auVar435._24_4_ = 0xff800000;
        auVar435._28_4_ = 0xff800000;
        auVar347._8_4_ = 0x7f800000;
        auVar347._0_8_ = 0x7f8000007f800000;
        auVar347._12_4_ = 0x7f800000;
        auVar347._16_4_ = 0x7f800000;
        auVar347._20_4_ = 0x7f800000;
        auVar347._24_4_ = 0x7f800000;
        auVar347._28_4_ = 0x7f800000;
        auVar35 = vblendvps_avx(auVar347,auVar435,auVar42);
        auVar135 = vpmovsxwd_avx(auVar127);
        auVar127 = vpunpckhwd_avx(auVar127,auVar127);
        auVar289._16_16_ = auVar127;
        auVar289._0_16_ = auVar135;
        auVar257 = vblendvps_avx(auVar257,auVar35,auVar289);
        auVar35 = vblendvps_avx(auVar435,auVar347,auVar42);
        auVar35 = vblendvps_avx(auVar41,auVar35,auVar289);
        auVar404 = ZEXT3264(auVar35);
        auVar35 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar152._0_4_ = auVar139._0_4_ ^ auVar35._0_4_;
        auVar152._4_4_ = auVar139._4_4_ ^ auVar35._4_4_;
        auVar152._8_4_ = auVar139._8_4_ ^ auVar35._8_4_;
        auVar152._12_4_ = auVar139._12_4_ ^ auVar35._12_4_;
        auVar152._16_4_ = auVar139._16_4_ ^ auVar35._16_4_;
        auVar152._20_4_ = auVar139._20_4_ ^ auVar35._20_4_;
        auVar152._24_4_ = auVar139._24_4_ ^ auVar35._24_4_;
        auVar152._28_4_ = auVar139._28_4_ ^ auVar35._28_4_;
        auVar139 = vorps_avx(auVar42,auVar152);
        auVar139 = vandps_avx(auVar345,auVar139);
      }
    }
    auVar308 = ZEXT3264(local_880);
    auVar387 = ZEXT3264(local_2a0);
    auVar35 = local_2a0 & auVar139;
    auVar280._8_4_ = 0x3f800000;
    auVar280._0_8_ = &DAT_3f8000003f800000;
    auVar280._12_4_ = 0x3f800000;
    auVar280._16_4_ = 0x3f800000;
    auVar280._20_4_ = 0x3f800000;
    auVar280._24_4_ = 0x3f800000;
    auVar280._28_4_ = 0x3f800000;
    auVar290 = ZEXT3264(auVar280);
    if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar35 >> 0x7f,0) == '\0') &&
          (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar35 >> 0xbf,0) == '\0') &&
        (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f]) {
LAB_0121653e:
      auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
    }
    else {
      auVar127 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_810._0_4_));
      auVar127 = vshufps_avx(auVar127,auVar127,0);
      auVar281._16_16_ = auVar127;
      auVar281._0_16_ = auVar127;
      auVar41 = vmaxps_avx(auVar281,auVar257);
      auVar127 = ZEXT416((uint)(ray->tfar - (float)local_810._0_4_));
      auVar127 = vshufps_avx(auVar127,auVar127,0);
      auVar282._16_16_ = auVar127;
      auVar282._0_16_ = auVar127;
      auVar345 = vminps_avx(auVar282,auVar404._0_32_);
      fVar269 = auVar417._28_4_;
      auVar208._0_4_ = local_540 * fVar336 + local_740 * fVar396 + local_520 * fVar411;
      auVar208._4_4_ = fStack_53c * fVar351 + fStack_73c * fVar405 + fStack_51c * fVar418;
      auVar208._8_4_ = fStack_538 * fVar355 + fStack_738 * fVar406 + fStack_518 * fVar420;
      auVar208._12_4_ = fStack_534 * fVar359 + fStack_734 * fVar407 + fStack_514 * fVar422;
      auVar208._16_4_ = fStack_530 * fVar362 + fStack_730 * fVar408 + fStack_510 * fVar424;
      auVar208._20_4_ = fStack_52c * fVar365 + fStack_72c * fVar409 + fStack_50c * fVar426;
      auVar208._24_4_ = fStack_528 * fVar368 + fStack_728 * fVar410 + fStack_508 * fVar428;
      auVar208._28_4_ = fVar380 + fStack_1a4 + fVar269;
      auVar35 = vrcpps_avx(auVar208);
      fVar297 = auVar35._0_4_;
      fVar309 = auVar35._4_4_;
      auVar75._4_4_ = auVar208._4_4_ * fVar309;
      auVar75._0_4_ = auVar208._0_4_ * fVar297;
      fVar380 = auVar35._8_4_;
      auVar75._8_4_ = auVar208._8_4_ * fVar380;
      fVar246 = auVar35._12_4_;
      auVar75._12_4_ = auVar208._12_4_ * fVar246;
      fVar263 = auVar35._16_4_;
      auVar75._16_4_ = auVar208._16_4_ * fVar263;
      fVar265 = auVar35._20_4_;
      auVar75._20_4_ = auVar208._20_4_ * fVar265;
      fVar267 = auVar35._24_4_;
      auVar75._24_4_ = auVar208._24_4_ * fVar267;
      auVar75._28_4_ = fStack_1a4;
      auVar417 = vsubps_avx(auVar280,auVar75);
      auVar326._8_4_ = 0x7fffffff;
      auVar326._0_8_ = 0x7fffffff7fffffff;
      auVar326._12_4_ = 0x7fffffff;
      auVar326._16_4_ = 0x7fffffff;
      auVar326._20_4_ = 0x7fffffff;
      auVar326._24_4_ = 0x7fffffff;
      auVar326._28_4_ = 0x7fffffff;
      auVar35 = vandps_avx(auVar208,auVar326);
      auVar377._8_4_ = 0x219392ef;
      auVar377._0_8_ = 0x219392ef219392ef;
      auVar377._12_4_ = 0x219392ef;
      auVar377._16_4_ = 0x219392ef;
      auVar377._20_4_ = 0x219392ef;
      auVar377._24_4_ = 0x219392ef;
      auVar377._28_4_ = 0x219392ef;
      auVar35 = vcmpps_avx(auVar35,auVar377,1);
      auVar394 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar76._4_4_ =
           (fVar309 + fVar309 * auVar417._4_4_) *
           -(fVar445 * fVar351 + fVar405 * fVar245 + fVar418 * fVar244);
      auVar76._0_4_ =
           (fVar297 + fVar297 * auVar417._0_4_) *
           -(fVar443 * fVar336 + fVar396 * fVar123 + fVar411 * fVar240);
      auVar76._8_4_ =
           (fVar380 + fVar380 * auVar417._8_4_) *
           -(fVar446 * fVar355 + fVar406 * fVar272 + fVar420 * fVar270);
      auVar76._12_4_ =
           (fVar246 + fVar246 * auVar417._12_4_) *
           -(fVar447 * fVar359 + fVar407 * fVar295 + fVar422 * fVar294);
      auVar76._16_4_ =
           (fVar263 + fVar263 * auVar417._16_4_) *
           -(fVar448 * fVar362 + fVar408 * fVar319 + fVar424 * fVar317);
      auVar76._20_4_ =
           (fVar265 + fVar265 * auVar417._20_4_) *
           -(fVar449 * fVar365 + fVar409 * fVar333 + fVar426 * fVar332);
      auVar76._24_4_ =
           (fVar267 + fVar267 * auVar417._24_4_) *
           -(fVar450 * fVar368 + fVar410 * fVar364 + fVar428 * fVar361);
      auVar76._28_4_ = -(fVar269 + auVar39._28_4_ + fVar269);
      auVar39 = vcmpps_avx(auVar208,ZEXT832(0) << 0x20,1);
      auVar417 = vorps_avx(auVar35,auVar39);
      auVar39 = vcmpps_avx(auVar208,ZEXT832(0) << 0x20,6);
      auVar39 = vorps_avx(auVar35,auVar39);
      auVar403._8_4_ = 0xff800000;
      auVar403._0_8_ = 0xff800000ff800000;
      auVar403._12_4_ = 0xff800000;
      auVar403._16_4_ = 0xff800000;
      auVar403._20_4_ = 0xff800000;
      auVar403._24_4_ = 0xff800000;
      auVar403._28_4_ = 0xff800000;
      auVar404 = ZEXT3264(auVar403);
      auVar35 = vblendvps_avx(auVar76,auVar403,auVar417);
      auVar434._8_4_ = 0x7f800000;
      auVar434._0_8_ = 0x7f8000007f800000;
      auVar434._12_4_ = 0x7f800000;
      auVar434._16_4_ = 0x7f800000;
      auVar434._20_4_ = 0x7f800000;
      auVar434._24_4_ = 0x7f800000;
      auVar434._28_4_ = 0x7f800000;
      auVar39 = vblendvps_avx(auVar76,auVar434,auVar39);
      auVar417 = vmaxps_avx(auVar41,auVar35);
      auVar41 = vminps_avx(auVar345,auVar39);
      auVar378 = ZEXT3264(auVar41);
      auVar141 = ZEXT832(0) << 0x20;
      auVar35 = vsubps_avx(auVar141,local_960);
      auVar39 = vsubps_avx(auVar141,_local_8e0);
      auVar77._4_4_ = auVar39._4_4_ * -fVar419;
      auVar77._0_4_ = auVar39._0_4_ * -fVar412;
      auVar77._8_4_ = auVar39._8_4_ * -fVar421;
      auVar77._12_4_ = auVar39._12_4_ * -fVar423;
      auVar77._16_4_ = auVar39._16_4_ * -fVar425;
      auVar77._20_4_ = auVar39._20_4_ * -fVar427;
      auVar77._24_4_ = auVar39._24_4_ * -fVar429;
      auVar77._28_4_ = auVar39._28_4_;
      auVar78._4_4_ = fVar437 * auVar35._4_4_;
      auVar78._0_4_ = fVar431 * auVar35._0_4_;
      auVar78._8_4_ = fVar438 * auVar35._8_4_;
      auVar78._12_4_ = fVar439 * auVar35._12_4_;
      auVar78._16_4_ = fVar440 * auVar35._16_4_;
      auVar78._20_4_ = fVar441 * auVar35._20_4_;
      auVar78._24_4_ = fVar442 * auVar35._24_4_;
      auVar78._28_4_ = auVar35._28_4_;
      auVar35 = vsubps_avx(auVar77,auVar78);
      auVar39 = vsubps_avx(auVar141,local_a00);
      auVar79._4_4_ = fVar352 * auVar39._4_4_;
      auVar79._0_4_ = fVar337 * auVar39._0_4_;
      auVar79._8_4_ = fVar356 * auVar39._8_4_;
      auVar79._12_4_ = fVar360 * auVar39._12_4_;
      auVar79._16_4_ = fVar363 * auVar39._16_4_;
      auVar79._20_4_ = fVar366 * auVar39._20_4_;
      uVar7 = auVar39._28_4_;
      auVar79._24_4_ = fVar369 * auVar39._24_4_;
      auVar79._28_4_ = uVar7;
      auVar345 = vsubps_avx(auVar35,auVar79);
      auVar80._4_4_ = fStack_51c * -fVar419;
      auVar80._0_4_ = local_520 * -fVar412;
      auVar80._8_4_ = fStack_518 * -fVar421;
      auVar80._12_4_ = fStack_514 * -fVar423;
      auVar80._16_4_ = fStack_510 * -fVar425;
      auVar80._20_4_ = fStack_50c * -fVar427;
      auVar80._24_4_ = fStack_508 * -fVar429;
      auVar80._28_4_ = uVar112 ^ 0x80000000;
      auVar81._4_4_ = fStack_73c * fVar437;
      auVar81._0_4_ = local_740 * fVar431;
      auVar81._8_4_ = fStack_738 * fVar438;
      auVar81._12_4_ = fStack_734 * fVar439;
      auVar81._16_4_ = fStack_730 * fVar440;
      auVar81._20_4_ = fStack_72c * fVar441;
      auVar81._24_4_ = fStack_728 * fVar442;
      auVar81._28_4_ = uVar7;
      auVar35 = vsubps_avx(auVar80,auVar81);
      auVar82._4_4_ = fStack_53c * fVar352;
      auVar82._0_4_ = local_540 * fVar337;
      auVar82._8_4_ = fStack_538 * fVar356;
      auVar82._12_4_ = fStack_534 * fVar360;
      auVar82._16_4_ = fStack_530 * fVar363;
      auVar82._20_4_ = fStack_52c * fVar366;
      auVar82._24_4_ = fStack_528 * fVar369;
      auVar82._28_4_ = uVar7;
      auVar416._8_4_ = 0x3f800000;
      auVar416._0_8_ = &DAT_3f8000003f800000;
      auVar416._12_4_ = 0x3f800000;
      auVar416._16_4_ = 0x3f800000;
      auVar416._20_4_ = 0x3f800000;
      auVar416._24_4_ = 0x3f800000;
      auVar416._28_4_ = 0x3f800000;
      auVar42 = vsubps_avx(auVar35,auVar82);
      auVar35 = vrcpps_avx(auVar42);
      fVar240 = auVar35._0_4_;
      fVar123 = auVar35._4_4_;
      auVar83._4_4_ = auVar42._4_4_ * fVar123;
      auVar83._0_4_ = auVar42._0_4_ * fVar240;
      fVar244 = auVar35._8_4_;
      auVar83._8_4_ = auVar42._8_4_ * fVar244;
      fVar245 = auVar35._12_4_;
      auVar83._12_4_ = auVar42._12_4_ * fVar245;
      fVar270 = auVar35._16_4_;
      auVar83._16_4_ = auVar42._16_4_ * fVar270;
      fVar272 = auVar35._20_4_;
      auVar83._20_4_ = auVar42._20_4_ * fVar272;
      fVar294 = auVar35._24_4_;
      auVar83._24_4_ = auVar42._24_4_ * fVar294;
      auVar83._28_4_ = fStack_724;
      auVar140 = vsubps_avx(auVar416,auVar83);
      auVar145._8_4_ = 0x7fffffff;
      auVar145._0_8_ = 0x7fffffff7fffffff;
      auVar145._12_4_ = 0x7fffffff;
      auVar145._16_4_ = 0x7fffffff;
      auVar145._20_4_ = 0x7fffffff;
      auVar145._24_4_ = 0x7fffffff;
      auVar145._28_4_ = 0x7fffffff;
      auVar35 = vandps_avx(auVar42,auVar145);
      auVar146._8_4_ = 0x219392ef;
      auVar146._0_8_ = 0x219392ef219392ef;
      auVar146._12_4_ = 0x219392ef;
      auVar146._16_4_ = 0x219392ef;
      auVar146._20_4_ = 0x219392ef;
      auVar146._24_4_ = 0x219392ef;
      auVar146._28_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar35,auVar146,1);
      auVar308 = ZEXT3264(auVar39);
      auVar84._4_4_ = (fVar123 + fVar123 * auVar140._4_4_) * -auVar345._4_4_;
      auVar84._0_4_ = (fVar240 + fVar240 * auVar140._0_4_) * -auVar345._0_4_;
      auVar84._8_4_ = (fVar244 + fVar244 * auVar140._8_4_) * -auVar345._8_4_;
      auVar84._12_4_ = (fVar245 + fVar245 * auVar140._12_4_) * -auVar345._12_4_;
      auVar84._16_4_ = (fVar270 + fVar270 * auVar140._16_4_) * -auVar345._16_4_;
      auVar84._20_4_ = (fVar272 + fVar272 * auVar140._20_4_) * -auVar345._20_4_;
      auVar84._24_4_ = (fVar294 + fVar294 * auVar140._24_4_) * -auVar345._24_4_;
      auVar84._28_4_ = auVar345._28_4_ ^ 0x80000000;
      auVar35 = vcmpps_avx(auVar42,auVar141,1);
      auVar35 = vorps_avx(auVar39,auVar35);
      auVar35 = vblendvps_avx(auVar84,auVar403,auVar35);
      _local_780 = vmaxps_avx(auVar417,auVar35);
      auVar35 = vcmpps_avx(auVar42,ZEXT832(0) << 0x20,6);
      auVar35 = vorps_avx(auVar39,auVar35);
      auVar35 = vblendvps_avx(auVar84,auVar434,auVar35);
      auVar139 = vandps_avx(local_2a0,auVar139);
      local_480 = vminps_avx(auVar41,auVar35);
      auVar35 = vcmpps_avx(_local_780,local_480,2);
      auVar39 = auVar139 & auVar35;
      if ((((((((auVar39 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar39 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar39 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar39 >> 0x7f,0) == '\0') &&
            (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar39 >> 0xbf,0) == '\0') &&
          (auVar39 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar39[0x1f])
      {
        auVar290 = ZEXT3264(auVar416);
        goto LAB_0121653e;
      }
      auVar378 = ZEXT864(0) << 0x20;
      auVar39 = vminps_avx(_local_ae0,auVar144);
      auVar417 = vminps_avx(local_720,auVar37);
      auVar39 = vminps_avx(auVar39,auVar417);
      auVar36 = vsubps_avx(auVar39,auVar36);
      auVar139 = vandps_avx(auVar35,auVar139);
      auVar111._4_4_ = local_4e0[1];
      auVar111._0_4_ = local_4e0[0];
      auVar111._8_4_ = local_4e0[2];
      auVar111._12_4_ = local_4e0[3];
      auVar111._16_4_ = fStack_4d0;
      auVar111._20_4_ = fStack_4cc;
      auVar111._24_4_ = fStack_4c8;
      auVar111._28_4_ = fStack_4c4;
      auVar35 = vminps_avx(auVar111,auVar416);
      auVar35 = vmaxps_avx(auVar35,ZEXT832(0) << 0x20);
      local_4e0[0] = fVar193 + fVar430 * (auVar35._0_4_ + 0.0) * 0.125;
      local_4e0[1] = fVar213 + fVar186 * (auVar35._4_4_ + 1.0) * 0.125;
      local_4e0[2] = fVar215 + fVar188 * (auVar35._8_4_ + 2.0) * 0.125;
      local_4e0[3] = fVar217 + fVar191 * (auVar35._12_4_ + 3.0) * 0.125;
      fStack_4d0 = fVar193 + fVar430 * (auVar35._16_4_ + 4.0) * 0.125;
      fStack_4cc = fVar213 + fVar186 * (auVar35._20_4_ + 5.0) * 0.125;
      fStack_4c8 = fVar215 + fVar188 * (auVar35._24_4_ + 6.0) * 0.125;
      fStack_4c4 = fVar217 + auVar35._28_4_ + 7.0;
      auVar110._4_4_ = local_500[1];
      auVar110._0_4_ = local_500[0];
      auVar110._8_4_ = local_500[2];
      auVar110._12_4_ = local_500[3];
      auVar110._16_4_ = fStack_4f0;
      auVar110._20_4_ = fStack_4ec;
      auVar110._24_4_ = fStack_4e8;
      auVar110._28_4_ = fStack_4e4;
      auVar35 = vminps_avx(auVar110,auVar416);
      auVar35 = vmaxps_avx(auVar35,ZEXT832(0) << 0x20);
      local_500[0] = fVar193 + fVar430 * (auVar35._0_4_ + 0.0) * 0.125;
      local_500[1] = fVar213 + fVar186 * (auVar35._4_4_ + 1.0) * 0.125;
      local_500[2] = fVar215 + fVar188 * (auVar35._8_4_ + 2.0) * 0.125;
      local_500[3] = fVar217 + fVar191 * (auVar35._12_4_ + 3.0) * 0.125;
      fStack_4f0 = fVar193 + fVar430 * (auVar35._16_4_ + 4.0) * 0.125;
      fStack_4ec = fVar213 + fVar186 * (auVar35._20_4_ + 5.0) * 0.125;
      fStack_4e8 = fVar215 + fVar188 * (auVar35._24_4_ + 6.0) * 0.125;
      fStack_4e4 = fVar217 + auVar35._28_4_ + 7.0;
      auVar85._4_4_ = auVar36._4_4_ * 0.99999976;
      auVar85._0_4_ = auVar36._0_4_ * 0.99999976;
      auVar85._8_4_ = auVar36._8_4_ * 0.99999976;
      auVar85._12_4_ = auVar36._12_4_ * 0.99999976;
      auVar85._16_4_ = auVar36._16_4_ * 0.99999976;
      auVar85._20_4_ = auVar36._20_4_ * 0.99999976;
      auVar85._24_4_ = auVar36._24_4_ * 0.99999976;
      auVar85._28_4_ = 0x3f7ffffc;
      auVar35 = vmaxps_avx(ZEXT832(0) << 0x20,auVar85);
      auVar86._4_4_ = auVar35._4_4_ * auVar35._4_4_;
      auVar86._0_4_ = auVar35._0_4_ * auVar35._0_4_;
      auVar86._8_4_ = auVar35._8_4_ * auVar35._8_4_;
      auVar86._12_4_ = auVar35._12_4_ * auVar35._12_4_;
      auVar86._16_4_ = auVar35._16_4_ * auVar35._16_4_;
      auVar86._20_4_ = auVar35._20_4_ * auVar35._20_4_;
      auVar86._24_4_ = auVar35._24_4_ * auVar35._24_4_;
      auVar86._28_4_ = auVar35._28_4_;
      local_a60 = vsubps_avx(auVar40,auVar86);
      auVar87._4_4_ = local_a60._4_4_ * fVar379 * 4.0;
      auVar87._0_4_ = local_a60._0_4_ * fVar370 * 4.0;
      auVar87._8_4_ = local_a60._8_4_ * fVar395 * 4.0;
      auVar87._12_4_ = local_a60._12_4_ * fVar155 * 4.0;
      auVar87._16_4_ = local_a60._16_4_ * fVar156 * 4.0;
      auVar87._20_4_ = local_a60._20_4_ * fVar157 * 4.0;
      auVar87._24_4_ = local_a60._24_4_ * fVar223 * 4.0;
      auVar87._28_4_ = auVar35._28_4_;
      auVar36 = vsubps_avx(auVar69,auVar87);
      local_840 = vcmpps_avx(auVar36,ZEXT832(0) << 0x20,5);
      auVar35 = local_840;
      if ((((((((local_840 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_840 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_840 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_840 >> 0x7f,0) == '\0') &&
            (local_840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_840 >> 0xbf,0) == '\0') &&
          (local_840 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_840[0x1f]) {
        _local_7c0 = ZEXT832(0) << 0x20;
        _local_7e0 = ZEXT832(0) << 0x20;
        auVar231 = ZEXT1228(ZEXT812(0)) << 0x20;
        auVar394 = ZEXT864(0) << 0x20;
        auVar259._8_4_ = 0x7f800000;
        auVar259._0_8_ = 0x7f8000007f800000;
        auVar259._12_4_ = 0x7f800000;
        auVar259._16_4_ = 0x7f800000;
        auVar259._20_4_ = 0x7f800000;
        auVar259._24_4_ = 0x7f800000;
        auVar259._28_4_ = 0x7f800000;
        auVar283._8_4_ = 0xff800000;
        auVar283._0_8_ = 0xff800000ff800000;
        auVar283._12_4_ = 0xff800000;
        auVar283._16_4_ = 0xff800000;
        auVar283._20_4_ = 0xff800000;
        auVar283._24_4_ = 0xff800000;
        auVar283._28_4_ = 0xff800000;
        local_a60 = auVar46;
        local_840 = auVar45;
        _local_7a0 = _local_7c0;
      }
      else {
        auVar417 = vsqrtps_avx(auVar36);
        auVar236._0_4_ = fVar370 + fVar370;
        auVar236._4_4_ = fVar379 + fVar379;
        auVar236._8_4_ = fVar395 + fVar395;
        auVar236._12_4_ = fVar155 + fVar155;
        auVar236._16_4_ = fVar156 + fVar156;
        auVar236._20_4_ = fVar157 + fVar157;
        auVar236._24_4_ = fVar223 + fVar223;
        auVar236._28_4_ = fVar224 + fVar224;
        auVar39 = vrcpps_avx(auVar236);
        fVar224 = auVar39._0_4_;
        fVar240 = auVar39._4_4_;
        auVar88._4_4_ = auVar236._4_4_ * fVar240;
        auVar88._0_4_ = auVar236._0_4_ * fVar224;
        fVar123 = auVar39._8_4_;
        auVar88._8_4_ = auVar236._8_4_ * fVar123;
        fVar244 = auVar39._12_4_;
        auVar88._12_4_ = auVar236._12_4_ * fVar244;
        fVar245 = auVar39._16_4_;
        auVar88._16_4_ = auVar236._16_4_ * fVar245;
        fVar270 = auVar39._20_4_;
        auVar88._20_4_ = auVar236._20_4_ * fVar270;
        fVar272 = auVar39._24_4_;
        auVar88._24_4_ = auVar236._24_4_ * fVar272;
        auVar88._28_4_ = auVar236._28_4_;
        auVar40 = vsubps_avx(auVar416,auVar88);
        fVar224 = fVar224 + fVar224 * auVar40._0_4_;
        fVar240 = fVar240 + fVar240 * auVar40._4_4_;
        fVar123 = fVar123 + fVar123 * auVar40._8_4_;
        fVar244 = fVar244 + fVar244 * auVar40._12_4_;
        fVar245 = fVar245 + fVar245 * auVar40._16_4_;
        fVar270 = fVar270 + fVar270 * auVar40._20_4_;
        fVar272 = fVar272 + fVar272 * auVar40._24_4_;
        fVar294 = auVar39._28_4_ + auVar40._28_4_;
        auVar284._0_8_ = local_880._0_8_ ^ 0x8000000080000000;
        auVar284._8_4_ = -local_880._8_4_;
        auVar284._12_4_ = -local_880._12_4_;
        auVar284._16_4_ = -local_880._16_4_;
        auVar284._20_4_ = -local_880._20_4_;
        auVar284._24_4_ = -local_880._24_4_;
        auVar284._28_4_ = -local_880._28_4_;
        auVar39 = vsubps_avx(auVar284,auVar417);
        fVar370 = auVar39._0_4_ * fVar224;
        fVar379 = auVar39._4_4_ * fVar240;
        auVar89._4_4_ = fVar379;
        auVar89._0_4_ = fVar370;
        fVar395 = auVar39._8_4_ * fVar123;
        auVar89._8_4_ = fVar395;
        fVar155 = auVar39._12_4_ * fVar244;
        auVar89._12_4_ = fVar155;
        fVar156 = auVar39._16_4_ * fVar245;
        auVar89._16_4_ = fVar156;
        fVar157 = auVar39._20_4_ * fVar270;
        auVar89._20_4_ = fVar157;
        fVar430 = auVar39._24_4_ * fVar272;
        auVar89._24_4_ = fVar430;
        auVar89._28_4_ = 0x3f800000;
        auVar417 = vsubps_avx(auVar417,local_880);
        fVar224 = auVar417._0_4_ * fVar224;
        fVar240 = auVar417._4_4_ * fVar240;
        auVar90._4_4_ = fVar240;
        auVar90._0_4_ = fVar224;
        fVar123 = auVar417._8_4_ * fVar123;
        auVar90._8_4_ = fVar123;
        fVar244 = auVar417._12_4_ * fVar244;
        auVar90._12_4_ = fVar244;
        fVar245 = auVar417._16_4_ * fVar245;
        auVar90._16_4_ = fVar245;
        fVar270 = auVar417._20_4_ * fVar270;
        auVar90._20_4_ = fVar270;
        fVar272 = auVar417._24_4_ * fVar272;
        auVar90._24_4_ = fVar272;
        auVar90._28_4_ = 0xff800000;
        auVar404 = ZEXT3264(auVar90);
        fVar295 = fVar241 * (fVar370 * fVar194 + (float)local_a40._0_4_);
        fVar317 = fVar262 * (fVar379 * fVar214 + (float)local_a40._4_4_);
        fVar319 = fVar274 * (fVar395 * fVar216 + fStack_a38);
        fVar332 = fVar296 * (fVar155 * fVar218 + fStack_a34);
        fVar333 = fVar328 * (fVar156 * fVar219 + fStack_a30);
        fVar361 = fVar334 * (fVar157 * fVar221 + fStack_a2c);
        fVar364 = fVar367 * (fVar430 * fVar222 + fStack_a28);
        auVar173._0_4_ = local_940 + fVar192 * fVar295;
        auVar173._4_4_ = fStack_93c + fVar243 * fVar317;
        auVar173._8_4_ = fStack_938 + fVar268 * fVar319;
        auVar173._12_4_ = fStack_934 + fVar293 * fVar332;
        auVar173._16_4_ = fStack_930 + fVar316 * fVar333;
        auVar173._20_4_ = fStack_92c + fVar331 * fVar361;
        auVar173._24_4_ = fStack_928 + fVar357 * fVar364;
        auVar173._28_4_ = fStack_924 + auVar417._28_4_ + fStack_a24;
        auVar91._4_4_ = fStack_53c * fVar379;
        auVar91._0_4_ = local_540 * fVar370;
        auVar91._8_4_ = fStack_538 * fVar395;
        auVar91._12_4_ = fStack_534 * fVar155;
        auVar91._16_4_ = fStack_530 * fVar156;
        auVar91._20_4_ = fStack_52c * fVar157;
        auVar91._24_4_ = fStack_528 * fVar430;
        auVar91._28_4_ = fVar294;
        local_960 = vsubps_avx(auVar91,auVar173);
        auVar237._0_4_ = fVar335 + fVar187 * fVar295;
        auVar237._4_4_ = fVar350 + fVar189 * fVar317;
        auVar237._8_4_ = fVar354 + fVar264 * fVar319;
        auVar237._12_4_ = fVar358 + fVar291 * fVar332;
        auVar237._16_4_ = fStack_ab0 + fVar313 * fVar333;
        auVar237._20_4_ = fStack_aac + fVar329 * fVar361;
        auVar237._24_4_ = fStack_aa8 + fVar349 * fVar364;
        auVar237._28_4_ = fStack_aa4 + fVar294;
        auVar92._4_4_ = fStack_73c * fVar379;
        auVar92._0_4_ = local_740 * fVar370;
        auVar92._8_4_ = fStack_738 * fVar395;
        auVar92._12_4_ = fStack_734 * fVar155;
        auVar92._16_4_ = fStack_730 * fVar156;
        auVar92._20_4_ = fStack_72c * fVar157;
        auVar92._24_4_ = fStack_728 * fVar430;
        auVar92._28_4_ = fVar217;
        _local_8e0 = vsubps_avx(auVar92,auVar237);
        auVar285._0_4_ = local_a80 + fVar239 * fVar295;
        auVar285._4_4_ = fStack_a7c + fVar242 * fVar317;
        auVar285._8_4_ = fStack_a78 + fVar266 * fVar319;
        auVar285._12_4_ = fStack_a74 + fVar292 * fVar332;
        auVar285._16_4_ = fStack_a70 + fVar314 * fVar333;
        auVar285._20_4_ = fStack_a6c + fVar330 * fVar361;
        auVar285._24_4_ = fStack_a68 + fVar353 * fVar364;
        auVar285._28_4_ = fStack_a64 + auVar39._28_4_;
        auVar93._4_4_ = fVar379 * fStack_51c;
        auVar93._0_4_ = fVar370 * local_520;
        auVar93._8_4_ = fVar395 * fStack_518;
        auVar93._12_4_ = fVar155 * fStack_514;
        auVar93._16_4_ = fVar156 * fStack_510;
        auVar93._20_4_ = fVar157 * fStack_50c;
        auVar93._24_4_ = fVar430 * fStack_508;
        auVar93._28_4_ = fVar217;
        local_a20 = vsubps_avx(auVar93,auVar285);
        fVar241 = fVar241 * (fVar224 * fVar194 + (float)local_a40._0_4_);
        fVar262 = fVar262 * (fVar240 * fVar214 + (float)local_a40._4_4_);
        fVar274 = fVar274 * (fVar123 * fVar216 + fStack_a38);
        fVar296 = fVar296 * (fVar244 * fVar218 + fStack_a34);
        fVar328 = fVar328 * (fVar245 * fVar219 + fStack_a30);
        fVar334 = fVar334 * (fVar270 * fVar221 + fStack_a2c);
        fVar367 = fVar367 * (fVar272 * fVar222 + fStack_a28);
        auVar306._0_4_ = local_940 + fVar192 * fVar241;
        auVar306._4_4_ = fStack_93c + fVar243 * fVar262;
        auVar306._8_4_ = fStack_938 + fVar268 * fVar274;
        auVar306._12_4_ = fStack_934 + fVar293 * fVar296;
        auVar306._16_4_ = fStack_930 + fVar316 * fVar328;
        auVar306._20_4_ = fStack_92c + fVar331 * fVar334;
        auVar306._24_4_ = fStack_928 + fVar357 * fVar367;
        auVar306._28_4_ = fStack_924 + fVar217;
        auVar94._4_4_ = fStack_53c * fVar240;
        auVar94._0_4_ = local_540 * fVar224;
        auVar94._8_4_ = fStack_538 * fVar123;
        auVar94._12_4_ = fStack_534 * fVar244;
        auVar94._16_4_ = fStack_530 * fVar245;
        auVar94._20_4_ = fStack_52c * fVar270;
        auVar94._24_4_ = fStack_528 * fVar272;
        auVar94._28_4_ = fStack_924;
        _local_7a0 = vsubps_avx(auVar94,auVar306);
        auVar307._0_4_ = fVar335 + fVar187 * fVar241;
        auVar307._4_4_ = fVar350 + fVar189 * fVar262;
        auVar307._8_4_ = fVar354 + fVar264 * fVar274;
        auVar307._12_4_ = fVar358 + fVar291 * fVar296;
        auVar307._16_4_ = fStack_ab0 + fVar313 * fVar328;
        auVar307._20_4_ = fStack_aac + fVar329 * fVar334;
        auVar307._24_4_ = fStack_aa8 + fVar349 * fVar367;
        auVar307._28_4_ = fStack_aa4 + local_7a0._28_4_;
        auVar95._4_4_ = fStack_73c * fVar240;
        auVar95._0_4_ = local_740 * fVar224;
        auVar95._8_4_ = fStack_738 * fVar123;
        auVar95._12_4_ = fStack_734 * fVar244;
        auVar95._16_4_ = fStack_730 * fVar245;
        auVar95._20_4_ = fStack_72c * fVar270;
        auVar95._24_4_ = fStack_728 * fVar272;
        auVar95._28_4_ = fStack_924;
        _local_7c0 = vsubps_avx(auVar95,auVar307);
        auVar286._0_4_ = local_a80 + fVar239 * fVar241;
        auVar286._4_4_ = fStack_a7c + fVar242 * fVar262;
        auVar286._8_4_ = fStack_a78 + fVar266 * fVar274;
        auVar286._12_4_ = fStack_a74 + fVar292 * fVar296;
        auVar286._16_4_ = fStack_a70 + fVar314 * fVar328;
        auVar286._20_4_ = fStack_a6c + fVar330 * fVar334;
        auVar286._24_4_ = fStack_a68 + fVar353 * fVar367;
        auVar286._28_4_ = fStack_a64 + local_a20._28_4_ + fStack_a24;
        auVar96._4_4_ = fVar240 * fStack_51c;
        auVar96._0_4_ = fVar224 * local_520;
        auVar96._8_4_ = fVar123 * fStack_518;
        auVar96._12_4_ = fVar244 * fStack_514;
        auVar96._16_4_ = fVar245 * fStack_510;
        auVar96._20_4_ = fVar270 * fStack_50c;
        auVar96._24_4_ = fVar272 * fStack_508;
        auVar96._28_4_ = local_7c0._28_4_;
        _local_7e0 = vsubps_avx(auVar96,auVar286);
        auVar39 = vcmpps_avx(auVar36,_DAT_02020f00,5);
        auVar260._8_4_ = 0x7f800000;
        auVar260._0_8_ = 0x7f8000007f800000;
        auVar260._12_4_ = 0x7f800000;
        auVar260._16_4_ = 0x7f800000;
        auVar260._20_4_ = 0x7f800000;
        auVar260._24_4_ = 0x7f800000;
        auVar260._28_4_ = 0x7f800000;
        auVar259 = vblendvps_avx(auVar260,auVar89,auVar39);
        auVar346._8_4_ = 0x7fffffff;
        auVar346._0_8_ = 0x7fffffff7fffffff;
        auVar346._12_4_ = 0x7fffffff;
        auVar346._16_4_ = 0x7fffffff;
        auVar346._20_4_ = 0x7fffffff;
        auVar346._24_4_ = 0x7fffffff;
        auVar346._28_4_ = 0x7fffffff;
        auVar36 = vandps_avx(auVar346,auVar68);
        auVar36 = vmaxps_avx(local_420,auVar36);
        auVar97._4_4_ = auVar36._4_4_ * 1.9073486e-06;
        auVar97._0_4_ = auVar36._0_4_ * 1.9073486e-06;
        auVar97._8_4_ = auVar36._8_4_ * 1.9073486e-06;
        auVar97._12_4_ = auVar36._12_4_ * 1.9073486e-06;
        auVar97._16_4_ = auVar36._16_4_ * 1.9073486e-06;
        auVar97._20_4_ = auVar36._20_4_ * 1.9073486e-06;
        auVar97._24_4_ = auVar36._24_4_ * 1.9073486e-06;
        auVar97._28_4_ = auVar36._28_4_;
        auVar36 = vandps_avx(auVar346,auVar38);
        auVar36 = vcmpps_avx(auVar36,auVar97,1);
        auVar287._8_4_ = 0xff800000;
        auVar287._0_8_ = 0xff800000ff800000;
        auVar287._12_4_ = 0xff800000;
        auVar287._16_4_ = 0xff800000;
        auVar287._20_4_ = 0xff800000;
        auVar287._24_4_ = 0xff800000;
        auVar287._28_4_ = 0xff800000;
        auVar283 = vblendvps_avx(auVar287,auVar90,auVar39);
        auVar38 = auVar39 & auVar36;
        if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar38 >> 0x7f,0) != '\0') ||
              (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar38 >> 0xbf,0) != '\0') ||
            (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar38[0x1f] < '\0') {
          auVar35 = vandps_avx(auVar36,auVar39);
          auVar127 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
          auVar417 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar38 = vcmpps_avx(local_a60,auVar417,2);
          auVar436._8_4_ = 0xff800000;
          auVar436._0_8_ = 0xff800000ff800000;
          auVar436._12_4_ = 0xff800000;
          auVar436._16_4_ = 0xff800000;
          auVar436._20_4_ = 0xff800000;
          auVar436._24_4_ = 0xff800000;
          auVar436._28_4_ = 0xff800000;
          auVar444._8_4_ = 0x7f800000;
          auVar444._0_8_ = 0x7f8000007f800000;
          auVar444._12_4_ = 0x7f800000;
          auVar444._16_4_ = 0x7f800000;
          auVar444._20_4_ = 0x7f800000;
          auVar444._24_4_ = 0x7f800000;
          auVar444._28_4_ = 0x7f800000;
          auVar36 = vblendvps_avx(auVar444,auVar436,auVar38);
          auVar135 = vpmovsxwd_avx(auVar127);
          auVar404 = ZEXT1664(auVar135);
          auVar127 = vpunpckhwd_avx(auVar127,auVar127);
          auVar348._16_16_ = auVar127;
          auVar348._0_16_ = auVar135;
          auVar259 = vblendvps_avx(auVar259,auVar36,auVar348);
          auVar36 = vblendvps_avx(auVar436,auVar444,auVar38);
          auVar283 = vblendvps_avx(auVar283,auVar36,auVar348);
          auVar36 = vcmpps_avx(auVar417,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
          auVar153._0_4_ = auVar36._0_4_ ^ auVar35._0_4_;
          auVar153._4_4_ = auVar36._4_4_ ^ auVar35._4_4_;
          auVar153._8_4_ = auVar36._8_4_ ^ auVar35._8_4_;
          auVar153._12_4_ = auVar36._12_4_ ^ auVar35._12_4_;
          auVar153._16_4_ = auVar36._16_4_ ^ auVar35._16_4_;
          auVar153._20_4_ = auVar36._20_4_ ^ auVar35._20_4_;
          auVar153._24_4_ = auVar36._24_4_ ^ auVar35._24_4_;
          auVar153._28_4_ = auVar36._28_4_ ^ auVar35._28_4_;
          auVar35 = vorps_avx(auVar38,auVar153);
          auVar35 = vandps_avx(auVar39,auVar35);
        }
        auVar231 = local_960._0_28_;
        auVar378 = ZEXT3264(_local_8e0);
        auVar394 = ZEXT3264(local_a20);
        _local_ae0 = auVar139;
      }
      fVar224 = (ray->dir).field_0.m128[0];
      local_580._4_4_ = fVar224;
      local_580._0_4_ = fVar224;
      fStack_578 = fVar224;
      fStack_574 = fVar224;
      fStack_570 = fVar224;
      fStack_56c = fVar224;
      fStack_568 = fVar224;
      fStack_564 = fVar224;
      auVar308 = ZEXT3264(_local_580);
      fStack_5bc = (ray->dir).field_0.m128[1];
      fVar187 = (ray->dir).field_0.m128[2];
      local_5e0._4_4_ = fVar187;
      local_5e0._0_4_ = fVar187;
      fStack_5d8 = fVar187;
      fStack_5d4 = fVar187;
      fStack_5d0 = fVar187;
      fStack_5cc = fVar187;
      fStack_5c8 = fVar187;
      fStack_5c4 = fVar187;
      auVar387 = ZEXT3264(_local_5e0);
      local_460 = _local_780;
      local_440 = vminps_avx(local_480,auVar259);
      _local_5a0 = vmaxps_avx(_local_780,auVar283);
      _local_4a0 = _local_5a0;
      auVar36 = vcmpps_avx(_local_780,local_440,2);
      local_560 = vandps_avx(auVar36,auVar139);
      auVar36 = vcmpps_avx(_local_5a0,local_480,2);
      local_6a0 = vandps_avx(auVar36,auVar139);
      auVar139 = vorps_avx(local_6a0,local_560);
      if ((((((((auVar139 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar139 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar139 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar139 >> 0x7f,0) == '\0') &&
            (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar139 >> 0xbf,0) == '\0') &&
          (auVar139 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar139[0x1f]) {
        auVar290 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        goto LAB_0121653e;
      }
      auVar139 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
      local_2e0._0_4_ = auVar35._0_4_ ^ auVar139._0_4_;
      local_2e0._4_4_ = auVar35._4_4_ ^ auVar139._4_4_;
      local_2e0._8_4_ = auVar35._8_4_ ^ auVar139._8_4_;
      local_2e0._12_4_ = auVar35._12_4_ ^ auVar139._12_4_;
      local_2e0._16_4_ = auVar35._16_4_ ^ auVar139._16_4_;
      local_2e0._20_4_ = auVar35._20_4_ ^ auVar139._20_4_;
      local_2e0._24_4_ = auVar35._24_4_ ^ auVar139._24_4_;
      local_2e0._28_4_ = (uint)auVar35._28_4_ ^ (uint)auVar139._28_4_;
      local_5c0 = fStack_5bc;
      fStack_5b8 = fStack_5bc;
      fStack_5b4 = fStack_5bc;
      fStack_5b0 = fStack_5bc;
      fStack_5ac = fStack_5bc;
      fStack_5a8 = fStack_5bc;
      fStack_5a4 = fStack_5bc;
      auVar148._0_4_ =
           auVar231._0_4_ * fVar224 + auVar378._0_4_ * fStack_5bc + auVar394._0_4_ * fVar187;
      auVar148._4_4_ =
           auVar231._4_4_ * fVar224 + auVar378._4_4_ * fStack_5bc + auVar394._4_4_ * fVar187;
      auVar148._8_4_ =
           auVar231._8_4_ * fVar224 + auVar378._8_4_ * fStack_5bc + auVar394._8_4_ * fVar187;
      auVar148._12_4_ =
           auVar231._12_4_ * fVar224 + auVar378._12_4_ * fStack_5bc + auVar394._12_4_ * fVar187;
      auVar148._16_4_ =
           auVar231._16_4_ * fVar224 + auVar378._16_4_ * fStack_5bc + auVar394._16_4_ * fVar187;
      auVar148._20_4_ =
           auVar231._20_4_ * fVar224 + auVar378._20_4_ * fStack_5bc + auVar394._20_4_ * fVar187;
      auVar148._24_4_ =
           auVar231._24_4_ * fVar224 + auVar378._24_4_ * fStack_5bc + auVar394._24_4_ * fVar187;
      auVar148._28_4_ = auVar35._28_4_ + local_6a0._28_4_ + auVar139._28_4_;
      auVar175._8_4_ = 0x7fffffff;
      auVar175._0_8_ = 0x7fffffff7fffffff;
      auVar175._12_4_ = 0x7fffffff;
      auVar175._16_4_ = 0x7fffffff;
      auVar175._20_4_ = 0x7fffffff;
      auVar175._24_4_ = 0x7fffffff;
      auVar175._28_4_ = 0x7fffffff;
      auVar139 = vandps_avx(auVar148,auVar175);
      auVar176._8_4_ = 0x3e99999a;
      auVar176._0_8_ = 0x3e99999a3e99999a;
      auVar176._12_4_ = 0x3e99999a;
      auVar176._16_4_ = 0x3e99999a;
      auVar176._20_4_ = 0x3e99999a;
      auVar176._24_4_ = 0x3e99999a;
      auVar176._28_4_ = 0x3e99999a;
      auVar139 = vcmpps_avx(auVar139,auVar176,1);
      auVar139 = vorps_avx(auVar139,local_2e0);
      auVar177._8_4_ = 3;
      auVar177._0_8_ = 0x300000003;
      auVar177._12_4_ = 3;
      auVar177._16_4_ = 3;
      auVar177._20_4_ = 3;
      auVar177._24_4_ = 3;
      auVar177._28_4_ = 3;
      auVar209._8_4_ = 2;
      auVar209._0_8_ = 0x200000002;
      auVar209._12_4_ = 2;
      auVar209._16_4_ = 2;
      auVar209._20_4_ = 2;
      auVar209._24_4_ = 2;
      auVar209._28_4_ = 2;
      auVar139 = vblendvps_avx(auVar209,auVar177,auVar139);
      local_600 = ZEXT432((uint)uVar120);
      local_4b0 = vpshufd_avx(ZEXT416((uint)uVar120),0);
      auVar127 = vpcmpgtd_avx(auVar139._16_16_,local_4b0);
      auVar135 = vpcmpgtd_avx(auVar139._0_16_,local_4b0);
      auVar178._16_16_ = auVar127;
      auVar178._0_16_ = auVar135;
      local_680 = vblendps_avx(ZEXT1632(auVar135),auVar178,0xf0);
      auVar139 = vandnps_avx(local_680,local_560);
      auVar35 = local_560 & ~local_680;
      auStack_658 = auVar37._8_24_;
      local_660 = uVar120;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar35 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar35 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar35 >> 0x7f,0) == '\0') &&
            (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar35 >> 0xbf,0) == '\0') &&
          (auVar35 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar35[0x1f])
      {
        auVar327 = ZEXT864(0) << 0x20;
        auVar290 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_620 = auVar139;
      }
      else {
        local_760._4_4_ = (float)local_780._4_4_ + (float)local_860._4_4_;
        local_760._0_4_ = (float)local_780._0_4_ + (float)local_860._0_4_;
        fStack_758 = fStack_778 + fStack_858;
        fStack_754 = fStack_774 + fStack_854;
        fStack_750 = fStack_770 + fStack_850;
        fStack_74c = fStack_76c + fStack_84c;
        fStack_748 = fStack_768 + fStack_848;
        fStack_744 = fStack_764 + fStack_844;
        auVar327 = ZEXT864(0) << 0x20;
        auVar290 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        local_640 = local_6a0;
        do {
          auVar249 = auVar290._0_16_;
          auVar179._8_4_ = 0x7f800000;
          auVar179._0_8_ = 0x7f8000007f800000;
          auVar179._12_4_ = 0x7f800000;
          auVar179._16_4_ = 0x7f800000;
          auVar179._20_4_ = 0x7f800000;
          auVar179._24_4_ = 0x7f800000;
          auVar179._28_4_ = 0x7f800000;
          auVar35 = vblendvps_avx(auVar179,_local_780,auVar139);
          auVar36 = vshufps_avx(auVar35,auVar35,0xb1);
          auVar36 = vminps_avx(auVar35,auVar36);
          auVar37 = vshufpd_avx(auVar36,auVar36,5);
          auVar36 = vminps_avx(auVar36,auVar37);
          auVar37 = vperm2f128_avx(auVar36,auVar36,1);
          auVar36 = vminps_avx(auVar36,auVar37);
          auVar36 = vcmpps_avx(auVar35,auVar36,0);
          auVar37 = auVar139 & auVar36;
          auVar35 = auVar139;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar37 >> 0x7f,0) != '\0') ||
                (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0xbf,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar37[0x1f] < '\0') {
            auVar35 = vandps_avx(auVar36,auVar139);
          }
          uVar118 = vmovmskps_avx(auVar35);
          uVar112 = 0;
          if (uVar118 != 0) {
            for (; (uVar118 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
            }
          }
          uVar120 = (ulong)uVar112;
          local_620 = auVar139;
          *(undefined4 *)(local_620 + uVar120 * 4) = 0;
          aVar11 = (ray->dir).field_0;
          _local_a40 = (undefined1  [16])aVar11;
          auVar127 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
          local_ac0 = local_4e0[uVar120];
          auVar394 = ZEXT464((uint)local_ac0);
          auVar404 = ZEXT464(*(uint *)(local_460 + uVar120 * 4));
          if (auVar127._0_4_ < 0.0) {
            uStack_abc = 0;
            uStack_ab8 = 0;
            uStack_ab4 = 0;
            _local_ae0 = ZEXT416(*(uint *)(local_460 + uVar120 * 4));
            fVar224 = sqrtf(auVar127._0_4_);
            auVar404 = ZEXT1664(_local_ae0);
            auVar394 = ZEXT1664(CONCAT412(uStack_ab4,
                                          CONCAT48(uStack_ab8,CONCAT44(uStack_abc,local_ac0))));
            auVar249._8_4_ = 0x7fffffff;
            auVar249._0_8_ = 0x7fffffff7fffffff;
            auVar249._12_4_ = 0x7fffffff;
            auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          else {
            auVar127 = vsqrtss_avx(auVar127,auVar127);
            fVar224 = auVar127._0_4_;
          }
          auVar135 = vminps_avx(_local_9a0,_local_9c0);
          auVar127 = vmaxps_avx(_local_9a0,_local_9c0);
          auVar129 = vminps_avx(_local_9b0,_local_9d0);
          auVar134 = vminps_avx(auVar135,auVar129);
          auVar135 = vmaxps_avx(_local_9b0,_local_9d0);
          auVar129 = vmaxps_avx(auVar127,auVar135);
          auVar127 = vandps_avx(auVar134,auVar249);
          auVar135 = vandps_avx(auVar129,auVar249);
          auVar127 = vmaxps_avx(auVar127,auVar135);
          auVar135 = vmovshdup_avx(auVar127);
          auVar135 = vmaxss_avx(auVar135,auVar127);
          auVar127 = vshufpd_avx(auVar127,auVar127,1);
          auVar127 = vmaxss_avx(auVar127,auVar135);
          local_960._0_4_ = auVar127._0_4_ * 1.9073486e-06;
          local_6c0._0_4_ = fVar224 * 1.9073486e-06;
          local_720._0_16_ = vshufps_avx(auVar129,auVar129,0xff);
          lVar116 = 5;
          do {
            local_ac0 = auVar394._0_4_;
            fVar240 = 1.0 - local_ac0;
            local_a20._0_16_ = ZEXT416((uint)fVar240);
            fVar224 = fVar240 * fVar240;
            fVar187 = fVar240 * fVar224;
            fVar239 = local_ac0 * local_ac0;
            fVar192 = local_ac0 * fVar239;
            local_940 = local_ac0 * fVar240;
            auVar127 = vshufps_avx(ZEXT416((uint)(fVar192 * 0.16666667)),
                                   ZEXT416((uint)(fVar192 * 0.16666667)),0);
            auVar135 = ZEXT416((uint)((fVar192 * 4.0 + fVar187 +
                                      local_ac0 * local_940 * 12.0 + fVar240 * local_940 * 6.0) *
                                     0.16666667));
            auVar135 = vshufps_avx(auVar135,auVar135,0);
            auVar129 = ZEXT416((uint)((fVar187 * 4.0 + fVar192 +
                                      fVar240 * local_940 * 12.0 + local_ac0 * local_940 * 6.0) *
                                     0.16666667));
            auVar129 = vshufps_avx(auVar129,auVar129,0);
            auVar220 = auVar404._0_16_;
            auVar134 = vshufps_avx(auVar220,auVar220,0);
            auVar197._0_4_ = auVar134._0_4_ * (float)local_a40._0_4_ + 0.0;
            auVar197._4_4_ = auVar134._4_4_ * (float)local_a40._4_4_ + 0.0;
            auVar197._8_4_ = auVar134._8_4_ * fStack_a38 + 0.0;
            auVar197._12_4_ = auVar134._12_4_ * fStack_a34 + 0.0;
            auVar134 = vshufps_avx(ZEXT416((uint)(fVar187 * 0.16666667)),
                                   ZEXT416((uint)(fVar187 * 0.16666667)),0);
            auVar126._0_4_ =
                 auVar134._0_4_ * (float)local_9a0._0_4_ +
                 auVar129._0_4_ * (float)local_9c0._0_4_ +
                 auVar127._0_4_ * (float)local_9d0._0_4_ + auVar135._0_4_ * (float)local_9b0._0_4_;
            auVar126._4_4_ =
                 auVar134._4_4_ * (float)local_9a0._4_4_ +
                 auVar129._4_4_ * (float)local_9c0._4_4_ +
                 auVar127._4_4_ * (float)local_9d0._4_4_ + auVar135._4_4_ * (float)local_9b0._4_4_;
            auVar126._8_4_ =
                 auVar134._8_4_ * fStack_998 +
                 auVar129._8_4_ * fStack_9b8 +
                 auVar127._8_4_ * fStack_9c8 + auVar135._8_4_ * fStack_9a8;
            auVar126._12_4_ =
                 auVar134._12_4_ * fStack_994 +
                 auVar129._12_4_ * fStack_9b4 +
                 auVar127._12_4_ * fStack_9c4 + auVar135._12_4_ * fStack_9a4;
            local_840._0_16_ = auVar126;
            auVar127 = vsubps_avx(auVar197,auVar126);
            _local_8e0 = auVar127;
            auVar127 = vdpps_avx(auVar127,auVar127,0x7f);
            local_a80 = auVar127._0_4_;
            auVar388 = auVar394._0_16_;
            uStack_abc = auVar394._4_4_;
            uStack_ab8 = auVar394._8_4_;
            uStack_ab4 = auVar394._12_4_;
            _local_ae0 = auVar220;
            fStack_a7c = auVar127._4_4_;
            fStack_a78 = auVar127._8_4_;
            fStack_a74 = auVar127._12_4_;
            if (local_a80 < 0.0) {
              local_a20._0_16_ = ZEXT416((uint)fVar240);
              local_a60._0_4_ = fVar239;
              local_a00._0_4_ = fVar224;
              auVar387._0_4_ = sqrtf(local_a80);
              auVar387._4_60_ = extraout_var;
              auVar388._4_4_ = uStack_abc;
              auVar388._0_4_ = local_ac0;
              auVar388._8_4_ = uStack_ab8;
              auVar388._12_4_ = uStack_ab4;
              auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar127 = auVar387._0_16_;
              fVar239 = (float)local_a60._0_4_;
              fVar224 = (float)local_a00._0_4_;
              auVar220 = _local_ae0;
            }
            else {
              auVar127 = vsqrtss_avx(auVar127,auVar127);
            }
            auVar387 = ZEXT1664(auVar127);
            fVar192 = local_a20._0_4_;
            fVar187 = auVar388._0_4_;
            auVar135 = vshufps_avx(ZEXT416((uint)(fVar239 * 0.5)),ZEXT416((uint)(fVar239 * 0.5)),0);
            auVar129 = ZEXT416((uint)((fVar224 + local_940 * 4.0) * 0.5));
            auVar129 = vshufps_avx(auVar129,auVar129,0);
            auVar134 = ZEXT416((uint)((fVar187 * -fVar187 - local_940 * 4.0) * 0.5));
            auVar134 = vshufps_avx(auVar134,auVar134,0);
            auVar128 = ZEXT416((uint)(fVar192 * -fVar192 * 0.5));
            auVar128 = vshufps_avx(auVar128,auVar128,0);
            auVar371._0_4_ =
                 (float)local_9a0._0_4_ * auVar128._0_4_ +
                 (float)local_9c0._0_4_ * auVar134._0_4_ +
                 (float)local_9d0._0_4_ * auVar135._0_4_ + (float)local_9b0._0_4_ * auVar129._0_4_;
            auVar371._4_4_ =
                 (float)local_9a0._4_4_ * auVar128._4_4_ +
                 (float)local_9c0._4_4_ * auVar134._4_4_ +
                 (float)local_9d0._4_4_ * auVar135._4_4_ + (float)local_9b0._4_4_ * auVar129._4_4_;
            auVar371._8_4_ =
                 fStack_998 * auVar128._8_4_ +
                 fStack_9b8 * auVar134._8_4_ +
                 fStack_9c8 * auVar135._8_4_ + fStack_9a8 * auVar129._8_4_;
            auVar371._12_4_ =
                 fStack_994 * auVar128._12_4_ +
                 fStack_9b4 * auVar134._12_4_ +
                 fStack_9c4 * auVar135._12_4_ + fStack_9a4 * auVar129._12_4_;
            auVar378 = ZEXT1664(auVar371);
            auVar135 = vshufps_avx(auVar388,auVar388,0);
            auVar129 = ZEXT416((uint)(fVar192 - (fVar187 + fVar187)));
            auVar134 = vshufps_avx(auVar129,auVar129,0);
            auVar129 = ZEXT416((uint)(fVar187 - (fVar192 + fVar192)));
            auVar128 = vshufps_avx(auVar129,auVar129,0);
            auVar12 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0);
            auVar129 = vdpps_avx(auVar371,auVar371,0x7f);
            auVar161._0_4_ =
                 (float)local_9a0._0_4_ * auVar12._0_4_ +
                 (float)local_9c0._0_4_ * auVar128._0_4_ +
                 (float)local_9d0._0_4_ * auVar135._0_4_ + (float)local_9b0._0_4_ * auVar134._0_4_;
            auVar161._4_4_ =
                 (float)local_9a0._4_4_ * auVar12._4_4_ +
                 (float)local_9c0._4_4_ * auVar128._4_4_ +
                 (float)local_9d0._4_4_ * auVar135._4_4_ + (float)local_9b0._4_4_ * auVar134._4_4_;
            auVar161._8_4_ =
                 fStack_998 * auVar12._8_4_ +
                 fStack_9b8 * auVar128._8_4_ +
                 fStack_9c8 * auVar135._8_4_ + fStack_9a8 * auVar134._8_4_;
            auVar161._12_4_ =
                 fStack_994 * auVar12._12_4_ +
                 fStack_9b4 * auVar128._12_4_ +
                 fStack_9c4 * auVar135._12_4_ + fStack_9a4 * auVar134._12_4_;
            auVar135 = vblendps_avx(auVar129,_DAT_01feba10,0xe);
            auVar134 = vrsqrtss_avx(auVar135,auVar135);
            fVar187 = auVar134._0_4_;
            fVar224 = auVar129._0_4_;
            auVar134 = vdpps_avx(auVar371,auVar161,0x7f);
            auVar128 = vshufps_avx(auVar129,auVar129,0);
            auVar162._0_4_ = auVar161._0_4_ * auVar128._0_4_;
            auVar162._4_4_ = auVar161._4_4_ * auVar128._4_4_;
            auVar162._8_4_ = auVar161._8_4_ * auVar128._8_4_;
            auVar162._12_4_ = auVar161._12_4_ * auVar128._12_4_;
            auVar134 = vshufps_avx(auVar134,auVar134,0);
            auVar250._0_4_ = auVar371._0_4_ * auVar134._0_4_;
            auVar250._4_4_ = auVar371._4_4_ * auVar134._4_4_;
            auVar250._8_4_ = auVar371._8_4_ * auVar134._8_4_;
            auVar250._12_4_ = auVar371._12_4_ * auVar134._12_4_;
            auVar128 = vsubps_avx(auVar162,auVar250);
            auVar134 = vrcpss_avx(auVar135,auVar135);
            auVar135 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                  ZEXT416((uint)(auVar220._0_4_ * (float)local_6c0._0_4_)));
            local_940 = auVar135._0_4_;
            auVar135 = ZEXT416((uint)(auVar134._0_4_ * (2.0 - fVar224 * auVar134._0_4_)));
            auVar135 = vshufps_avx(auVar135,auVar135,0);
            uVar120 = CONCAT44(auVar371._4_4_,auVar371._0_4_);
            auVar338._0_8_ = uVar120 ^ 0x8000000080000000;
            auVar338._8_4_ = -auVar371._8_4_;
            auVar338._12_4_ = -auVar371._12_4_;
            auVar134 = ZEXT416((uint)(fVar187 * 1.5 + fVar224 * -0.5 * fVar187 * fVar187 * fVar187))
            ;
            auVar134 = vshufps_avx(auVar134,auVar134,0);
            auVar227._0_4_ = auVar134._0_4_ * auVar128._0_4_ * auVar135._0_4_;
            auVar227._4_4_ = auVar134._4_4_ * auVar128._4_4_ * auVar135._4_4_;
            auVar227._8_4_ = auVar134._8_4_ * auVar128._8_4_ * auVar135._8_4_;
            auVar227._12_4_ = auVar134._12_4_ * auVar128._12_4_ * auVar135._12_4_;
            local_a20._0_16_ = auVar371;
            local_8a0._0_4_ = auVar371._0_4_ * auVar134._0_4_;
            local_8a0._4_4_ = auVar371._4_4_ * auVar134._4_4_;
            local_8a0._8_4_ = auVar371._8_4_ * auVar134._8_4_;
            local_8a0._12_4_ = auVar371._12_4_ * auVar134._12_4_;
            if (fVar224 < 0.0) {
              local_a60._0_4_ = auVar127._0_4_;
              local_a00._0_16_ = auVar338;
              local_8c0._0_16_ = auVar227;
              auVar378 = ZEXT1664(auVar371);
              fVar224 = sqrtf(fVar224);
              auVar387 = ZEXT464((uint)local_a60._0_4_);
              auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar227 = local_8c0._0_16_;
              auVar338 = local_a00._0_16_;
            }
            else {
              auVar127 = vsqrtss_avx(auVar129,auVar129);
              fVar224 = auVar127._0_4_;
            }
            auVar413._4_4_ = fStack_a7c;
            auVar413._0_4_ = local_a80;
            auVar413._8_4_ = fStack_a78;
            auVar413._12_4_ = fStack_a74;
            local_a60._0_16_ = vdpps_avx(_local_8e0,local_8a0._0_16_,0x7f);
            local_a00._0_4_ =
                 ((float)local_960._0_4_ / fVar224) * (auVar387._0_4_ + 1.0) +
                 auVar387._0_4_ * (float)local_960._0_4_ + local_940;
            auVar127 = vdpps_avx(auVar338,local_8a0._0_16_,0x7f);
            auVar135 = vdpps_avx(_local_8e0,auVar227,0x7f);
            auVar129 = vdpps_avx(_local_a40,local_8a0._0_16_,0x7f);
            auVar134 = vdpps_avx(_local_8e0,auVar338,0x7f);
            fVar224 = auVar127._0_4_ + auVar135._0_4_;
            fVar187 = local_a60._0_4_;
            auVar130._0_4_ = fVar187 * fVar187;
            auVar130._4_4_ = local_a60._4_4_ * local_a60._4_4_;
            auVar130._8_4_ = local_a60._8_4_ * local_a60._8_4_;
            auVar130._12_4_ = local_a60._12_4_ * local_a60._12_4_;
            auVar135 = vsubps_avx(auVar413,auVar130);
            local_8a0._0_16_ = ZEXT416((uint)fVar224);
            auVar127 = vdpps_avx(_local_8e0,_local_a40,0x7f);
            fVar239 = auVar134._0_4_ - fVar187 * fVar224;
            fVar187 = auVar127._0_4_ - fVar187 * auVar129._0_4_;
            auVar127 = vrsqrtss_avx(auVar135,auVar135);
            fVar192 = auVar135._0_4_;
            fVar224 = auVar127._0_4_;
            fVar224 = fVar224 * 1.5 + fVar192 * -0.5 * fVar224 * fVar224 * fVar224;
            if (fVar192 < 0.0) {
              local_8c0._0_16_ = auVar129;
              local_880._0_4_ = fVar239;
              local_6e0._0_4_ = fVar187;
              local_700._0_4_ = fVar224;
              auVar378 = ZEXT1664(auVar378._0_16_);
              auVar387 = ZEXT1664(auVar387._0_16_);
              fVar192 = sqrtf(fVar192);
              auVar413._4_4_ = fStack_a7c;
              auVar413._0_4_ = local_a80;
              auVar413._8_4_ = fStack_a78;
              auVar413._12_4_ = fStack_a74;
              auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar224 = (float)local_700._0_4_;
              fVar239 = (float)local_880._0_4_;
              fVar187 = (float)local_6e0._0_4_;
              auVar129 = local_8c0._0_16_;
            }
            else {
              auVar127 = vsqrtss_avx(auVar135,auVar135);
              fVar192 = auVar127._0_4_;
            }
            auVar134 = vpermilps_avx(local_840._0_16_,0xff);
            auVar220 = vpermilps_avx(local_a20._0_16_,0xff);
            fVar239 = fVar239 * fVar224 - auVar220._0_4_;
            auVar251._0_8_ = auVar129._0_8_ ^ 0x8000000080000000;
            auVar251._8_4_ = auVar129._8_4_ ^ 0x80000000;
            auVar251._12_4_ = auVar129._12_4_ ^ 0x80000000;
            auVar277._0_4_ = -fVar239;
            auVar277._4_4_ = 0x80000000;
            auVar277._8_4_ = 0x80000000;
            auVar277._12_4_ = 0x80000000;
            auVar127 = vinsertps_avx(ZEXT416((uint)(fVar187 * fVar224)),auVar251,0x10);
            auVar135 = vmovsldup_avx(ZEXT416((uint)(local_8a0._0_4_ * fVar187 * fVar224 -
                                                   auVar129._0_4_ * fVar239)));
            auVar127 = vdivps_avx(auVar127,auVar135);
            auVar308 = ZEXT1664(local_a60._0_16_);
            auVar134 = ZEXT416((uint)(fVar192 - auVar134._0_4_));
            auVar129 = vinsertps_avx(local_a60._0_16_,auVar134,0x10);
            auVar228._0_4_ = auVar129._0_4_ * auVar127._0_4_;
            auVar228._4_4_ = auVar129._4_4_ * auVar127._4_4_;
            auVar228._8_4_ = auVar129._8_4_ * auVar127._8_4_;
            auVar228._12_4_ = auVar129._12_4_ * auVar127._12_4_;
            auVar127 = vinsertps_avx(auVar277,local_8a0._0_16_,0x1c);
            auVar127 = vdivps_avx(auVar127,auVar135);
            auVar135 = vhaddps_avx(auVar228,auVar228);
            auVar198._0_4_ = auVar129._0_4_ * auVar127._0_4_;
            auVar198._4_4_ = auVar129._4_4_ * auVar127._4_4_;
            auVar198._8_4_ = auVar129._8_4_ * auVar127._8_4_;
            auVar198._12_4_ = auVar129._12_4_ * auVar127._12_4_;
            auVar127 = vhaddps_avx(auVar198,auVar198);
            local_ac0 = local_ac0 - auVar135._0_4_;
            auVar394 = ZEXT464((uint)local_ac0);
            fVar224 = (float)local_ae0._0_4_ - auVar127._0_4_;
            auVar404 = ZEXT464((uint)fVar224);
            auVar252._8_4_ = 0x7fffffff;
            auVar252._0_8_ = 0x7fffffff7fffffff;
            auVar252._12_4_ = 0x7fffffff;
            auVar290 = ZEXT1664(auVar252);
            auVar127 = vandps_avx(local_a60._0_16_,auVar252);
            bVar98 = true;
            if (auVar127._0_4_ < (float)local_a00._0_4_) {
              auVar127 = vandps_avx(auVar134,auVar252);
              if (auVar127._0_4_ <
                  (float)local_720._0_4_ * 1.9073486e-06 + (float)local_a00._0_4_ + local_940) {
                fVar224 = fVar224 + (float)local_810._0_4_;
                auVar404 = ZEXT464((uint)fVar224);
                if ((ray->org).field_0.m128[3] <= fVar224) {
                  fVar187 = ray->tfar;
                  auVar308 = ZEXT464((uint)fVar187);
                  if (((fVar224 <= fVar187) && (0.0 <= local_ac0)) && (local_ac0 <= 1.0)) {
                    auVar127 = vrsqrtss_avx(auVar413,auVar413);
                    fVar239 = auVar127._0_4_;
                    pGVar31 = (context->scene->geometries).items[local_a88].ptr;
                    if ((pGVar31->mask & ray->mask) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        uVar115 = 1;
                      }
                      else {
                        auVar127 = ZEXT416((uint)(fVar239 * 1.5 +
                                                 auVar413._0_4_ * -0.5 * fVar239 * fVar239 * fVar239
                                                 ));
                        auVar127 = vshufps_avx(auVar127,auVar127,0);
                        auVar163._0_4_ = auVar127._0_4_ * (float)local_8e0._0_4_;
                        auVar163._4_4_ = auVar127._4_4_ * (float)local_8e0._4_4_;
                        auVar163._8_4_ = auVar127._8_4_ * fStack_8d8;
                        auVar163._12_4_ = auVar127._12_4_ * fStack_8d4;
                        auVar131._0_4_ = local_a20._0_4_ + auVar220._0_4_ * auVar163._0_4_;
                        auVar131._4_4_ = local_a20._4_4_ + auVar220._4_4_ * auVar163._4_4_;
                        auVar131._8_4_ = local_a20._8_4_ + auVar220._8_4_ * auVar163._8_4_;
                        auVar131._12_4_ = local_a20._12_4_ + auVar220._12_4_ * auVar163._12_4_;
                        auVar127 = vshufps_avx(auVar163,auVar163,0xc9);
                        auVar135 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                        auVar164._0_4_ = auVar135._0_4_ * auVar163._0_4_;
                        auVar164._4_4_ = auVar135._4_4_ * auVar163._4_4_;
                        auVar164._8_4_ = auVar135._8_4_ * auVar163._8_4_;
                        auVar164._12_4_ = auVar135._12_4_ * auVar163._12_4_;
                        auVar199._0_4_ = local_a20._0_4_ * auVar127._0_4_;
                        auVar199._4_4_ = local_a20._4_4_ * auVar127._4_4_;
                        auVar199._8_4_ = local_a20._8_4_ * auVar127._8_4_;
                        auVar199._12_4_ = local_a20._12_4_ * auVar127._12_4_;
                        auVar129 = vsubps_avx(auVar199,auVar164);
                        auVar127 = vshufps_avx(auVar129,auVar129,0xc9);
                        auVar135 = vshufps_avx(auVar131,auVar131,0xc9);
                        auVar200._0_4_ = auVar135._0_4_ * auVar127._0_4_;
                        auVar200._4_4_ = auVar135._4_4_ * auVar127._4_4_;
                        auVar200._8_4_ = auVar135._8_4_ * auVar127._8_4_;
                        auVar200._12_4_ = auVar135._12_4_ * auVar127._12_4_;
                        auVar127 = vshufps_avx(auVar129,auVar129,0xd2);
                        auVar132._0_4_ = auVar131._0_4_ * auVar127._0_4_;
                        auVar132._4_4_ = auVar131._4_4_ * auVar127._4_4_;
                        auVar132._8_4_ = auVar131._8_4_ * auVar127._8_4_;
                        auVar132._12_4_ = auVar131._12_4_ * auVar127._12_4_;
                        auVar135 = vsubps_avx(auVar200,auVar132);
                        auVar127 = vshufps_avx(auVar135,auVar135,0xe9);
                        local_920 = vmovlps_avx(auVar127);
                        local_918 = auVar135._0_4_;
                        local_910 = 0;
                        local_90c = (undefined4)local_8e8;
                        local_908 = (undefined4)local_a88;
                        local_904 = context->user->instID[0];
                        local_900 = context->user->instPrimID[0];
                        ray->tfar = fVar224;
                        local_ae4 = -1;
                        local_990.valid = &local_ae4;
                        local_990.geometryUserPtr = pGVar31->userPtr;
                        local_990.context = context->user;
                        local_990.hit = (RTCHitN *)&local_920;
                        local_990.N = 1;
                        uStack_abc = 0;
                        uStack_ab8 = 0;
                        uStack_ab4 = 0;
                        _local_ae0 = ZEXT416((uint)fVar224);
                        local_a80 = fVar187;
                        local_990.ray = (RTCRayN *)ray;
                        local_914 = local_ac0;
                        if (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0121707e:
                          p_Var34 = context->args->filter;
                          if (p_Var34 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar31->field_8).field_0x2 & 0x40) != 0)) {
                              auVar378 = ZEXT1664(auVar378._0_16_);
                              auVar387 = ZEXT1664(auVar387._0_16_);
                              (*p_Var34)(&local_990);
                              auVar308 = ZEXT464((uint)local_a80);
                              auVar404 = ZEXT1664(_local_ae0);
                              auVar394 = ZEXT1664(CONCAT412(uStack_ab4,
                                                            CONCAT48(uStack_ab8,
                                                                     CONCAT44(uStack_abc,local_ac0))
                                                           ));
                              auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                            CONCAT48(0x7fffffff,0x7fffffff7fffffff))
                                                 );
                              auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                            }
                            if (*local_990.valid == 0) goto LAB_012170db;
                          }
                          uVar115 = 1;
                        }
                        else {
                          auVar378 = ZEXT1664(auVar378._0_16_);
                          auVar387 = ZEXT1664(auVar387._0_16_);
                          (*pGVar31->occlusionFilterN)(&local_990);
                          auVar308 = ZEXT464((uint)local_a80);
                          auVar404 = ZEXT1664(_local_ae0);
                          auVar394 = ZEXT1664(CONCAT412(uStack_ab4,
                                                        CONCAT48(uStack_ab8,
                                                                 CONCAT44(uStack_abc,local_ac0))));
                          auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                          if (*local_990.valid != 0) goto LAB_0121707e;
LAB_012170db:
                          uVar115 = 0;
                        }
                        if ((char)uVar115 == '\0') {
                          ray->tfar = auVar308._0_4_;
                        }
                      }
                      bVar98 = false;
                      goto LAB_01216ef6;
                    }
                  }
                }
                bVar98 = false;
                uVar115 = 0;
              }
            }
LAB_01216ef6:
            bVar114 = (byte)uVar115;
            if (!bVar98) goto LAB_012170f2;
            lVar116 = lVar116 + -1;
          } while (lVar116 != 0);
          bVar114 = 0;
LAB_012170f2:
          uVar115 = (ulong)(bVar114 & 1);
          bVar122 = bVar122 | bVar114 & 1;
          fVar224 = ray->tfar;
          auVar149._4_4_ = fVar224;
          auVar149._0_4_ = fVar224;
          auVar149._8_4_ = fVar224;
          auVar149._12_4_ = fVar224;
          auVar149._16_4_ = fVar224;
          auVar149._20_4_ = fVar224;
          auVar149._24_4_ = fVar224;
          auVar149._28_4_ = fVar224;
          auVar35 = vcmpps_avx(_local_760,auVar149,2);
          auVar139 = vandps_avx(auVar35,local_620);
          auVar35 = local_620 & auVar35;
          uVar120 = local_660;
          local_620 = auVar139;
        } while ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(auVar35 >> 0x7f,0) != '\0') ||
                   (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(auVar35 >> 0xbf,0) != '\0') ||
                 (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 auVar35[0x1f] < '\0');
      }
      auVar150._0_4_ =
           (float)local_580._0_4_ * (float)local_7a0._0_4_ +
           local_5c0 * (float)local_7c0._0_4_ + (float)local_5e0._0_4_ * (float)local_7e0._0_4_;
      auVar150._4_4_ =
           (float)local_580._4_4_ * (float)local_7a0._4_4_ +
           fStack_5bc * (float)local_7c0._4_4_ + (float)local_5e0._4_4_ * (float)local_7e0._4_4_;
      auVar150._8_4_ = fStack_578 * fStack_798 + fStack_5b8 * fStack_7b8 + fStack_5d8 * fStack_7d8;
      auVar150._12_4_ = fStack_574 * fStack_794 + fStack_5b4 * fStack_7b4 + fStack_5d4 * fStack_7d4;
      auVar150._16_4_ = fStack_570 * fStack_790 + fStack_5b0 * fStack_7b0 + fStack_5d0 * fStack_7d0;
      auVar150._20_4_ = fStack_56c * fStack_78c + fStack_5ac * fStack_7ac + fStack_5cc * fStack_7cc;
      auVar150._24_4_ = fStack_568 * fStack_788 + fStack_5a8 * fStack_7a8 + fStack_5c8 * fStack_7c8;
      auVar150._28_4_ = fStack_564 + fStack_5a4 + fStack_5c4;
      auVar180._8_4_ = 0x7fffffff;
      auVar180._0_8_ = 0x7fffffff7fffffff;
      auVar180._12_4_ = 0x7fffffff;
      auVar180._16_4_ = 0x7fffffff;
      auVar180._20_4_ = 0x7fffffff;
      auVar180._24_4_ = 0x7fffffff;
      auVar180._28_4_ = 0x7fffffff;
      auVar139 = vandps_avx(auVar150,auVar180);
      auVar181._8_4_ = 0x3e99999a;
      auVar181._0_8_ = 0x3e99999a3e99999a;
      auVar181._12_4_ = 0x3e99999a;
      auVar181._16_4_ = 0x3e99999a;
      auVar181._20_4_ = 0x3e99999a;
      auVar181._24_4_ = 0x3e99999a;
      auVar181._28_4_ = 0x3e99999a;
      auVar139 = vcmpps_avx(auVar139,auVar181,1);
      auVar35 = vorps_avx(auVar139,local_2e0);
      auVar182._0_4_ = (float)local_860._0_4_ + (float)local_5a0._0_4_;
      auVar182._4_4_ = (float)local_860._4_4_ + (float)local_5a0._4_4_;
      auVar182._8_4_ = fStack_858 + fStack_598;
      auVar182._12_4_ = fStack_854 + fStack_594;
      auVar182._16_4_ = fStack_850 + fStack_590;
      auVar182._20_4_ = fStack_84c + fStack_58c;
      auVar182._24_4_ = fStack_848 + fStack_588;
      auVar182._28_4_ = fStack_844 + fStack_584;
      fVar224 = ray->tfar;
      auVar210._4_4_ = fVar224;
      auVar210._0_4_ = fVar224;
      auVar210._8_4_ = fVar224;
      auVar210._12_4_ = fVar224;
      auVar210._16_4_ = fVar224;
      auVar210._20_4_ = fVar224;
      auVar210._24_4_ = fVar224;
      auVar210._28_4_ = fVar224;
      auVar139 = vcmpps_avx(auVar182,auVar210,2);
      _local_7c0 = vandps_avx(auVar139,local_6a0);
      auVar183._8_4_ = 3;
      auVar183._0_8_ = 0x300000003;
      auVar183._12_4_ = 3;
      auVar183._16_4_ = 3;
      auVar183._20_4_ = 3;
      auVar183._24_4_ = 3;
      auVar183._28_4_ = 3;
      auVar211._8_4_ = 2;
      auVar211._0_8_ = 0x200000002;
      auVar211._12_4_ = 2;
      auVar211._16_4_ = 2;
      auVar211._20_4_ = 2;
      auVar211._24_4_ = 2;
      auVar211._28_4_ = 2;
      auVar139 = vblendvps_avx(auVar211,auVar183,auVar35);
      auVar127 = vpcmpgtd_avx(auVar139._16_16_,local_4b0);
      auVar135 = vpshufd_avx(local_600._0_16_,0);
      auVar135 = vpcmpgtd_avx(auVar139._0_16_,auVar135);
      auVar184._16_16_ = auVar127;
      auVar184._0_16_ = auVar135;
      _local_7e0 = vblendps_avx(ZEXT1632(auVar135),auVar184,0xf0);
      auVar139 = vandnps_avx(_local_7e0,_local_7c0);
      auVar35 = _local_7c0 & ~_local_7e0;
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        _local_760 = _local_4a0;
        local_7a0._4_4_ = (float)local_860._4_4_ + (float)local_4a0._4_4_;
        local_7a0._0_4_ = (float)local_860._0_4_ + (float)local_4a0._0_4_;
        fStack_798 = fStack_858 + fStack_498;
        fStack_794 = fStack_854 + fStack_494;
        fStack_790 = fStack_850 + fStack_490;
        fStack_78c = fStack_84c + fStack_48c;
        fStack_788 = fStack_848 + fStack_488;
        fStack_784 = fStack_844 + fStack_484;
        do {
          auVar253 = auVar290._0_16_;
          auVar185._8_4_ = 0x7f800000;
          auVar185._0_8_ = 0x7f8000007f800000;
          auVar185._12_4_ = 0x7f800000;
          auVar185._16_4_ = 0x7f800000;
          auVar185._20_4_ = 0x7f800000;
          auVar185._24_4_ = 0x7f800000;
          auVar185._28_4_ = 0x7f800000;
          auVar35 = vblendvps_avx(auVar185,_local_760,auVar139);
          auVar36 = vshufps_avx(auVar35,auVar35,0xb1);
          auVar36 = vminps_avx(auVar35,auVar36);
          auVar37 = vshufpd_avx(auVar36,auVar36,5);
          auVar36 = vminps_avx(auVar36,auVar37);
          auVar37 = vperm2f128_avx(auVar36,auVar36,1);
          auVar36 = vminps_avx(auVar36,auVar37);
          auVar36 = vcmpps_avx(auVar35,auVar36,0);
          auVar37 = auVar139 & auVar36;
          auVar35 = auVar139;
          if ((((((((auVar37 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar37 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar37 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar37 >> 0x7f,0) != '\0') ||
                (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar37 >> 0xbf,0) != '\0') ||
              (auVar37 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar37[0x1f] < '\0') {
            auVar35 = vandps_avx(auVar36,auVar139);
          }
          uVar118 = vmovmskps_avx(auVar35);
          uVar112 = 0;
          if (uVar118 != 0) {
            for (; (uVar118 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
            }
          }
          uVar120 = (ulong)uVar112;
          local_640 = auVar139;
          *(undefined4 *)(local_640 + uVar120 * 4) = 0;
          aVar11 = (ray->dir).field_0;
          _local_a40 = (undefined1  [16])aVar11;
          auVar127 = vdpps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0x7f);
          local_ac0 = local_500[uVar120];
          auVar387 = ZEXT464((uint)local_ac0);
          auVar394 = ZEXT464(*(uint *)(local_480 + uVar120 * 4));
          if (auVar127._0_4_ < 0.0) {
            uStack_abc = 0;
            uStack_ab8 = 0;
            uStack_ab4 = 0;
            _local_ae0 = ZEXT416(*(uint *)(local_480 + uVar120 * 4));
            fVar224 = sqrtf(auVar127._0_4_);
            auVar394 = ZEXT1664(_local_ae0);
            auVar387 = ZEXT1664(CONCAT412(uStack_ab4,
                                          CONCAT48(uStack_ab8,CONCAT44(uStack_abc,local_ac0))));
            auVar253._8_4_ = 0x7fffffff;
            auVar253._0_8_ = 0x7fffffff7fffffff;
            auVar253._12_4_ = 0x7fffffff;
            auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          else {
            auVar127 = vsqrtss_avx(auVar127,auVar127);
            fVar224 = auVar127._0_4_;
          }
          auVar135 = vminps_avx(_local_9a0,_local_9c0);
          auVar127 = vmaxps_avx(_local_9a0,_local_9c0);
          auVar129 = vminps_avx(_local_9b0,_local_9d0);
          auVar134 = vminps_avx(auVar135,auVar129);
          auVar135 = vmaxps_avx(_local_9b0,_local_9d0);
          auVar129 = vmaxps_avx(auVar127,auVar135);
          auVar127 = vandps_avx(auVar134,auVar253);
          auVar135 = vandps_avx(auVar129,auVar253);
          auVar127 = vmaxps_avx(auVar127,auVar135);
          auVar135 = vmovshdup_avx(auVar127);
          auVar135 = vmaxss_avx(auVar135,auVar127);
          auVar127 = vshufpd_avx(auVar127,auVar127,1);
          auVar127 = vmaxss_avx(auVar127,auVar135);
          local_960._0_4_ = auVar127._0_4_ * 1.9073486e-06;
          local_6c0._0_4_ = fVar224 * 1.9073486e-06;
          local_720._0_16_ = vshufps_avx(auVar129,auVar129,0xff);
          lVar116 = 5;
          do {
            local_ac0 = auVar387._0_4_;
            fVar240 = 1.0 - local_ac0;
            local_a20._0_16_ = ZEXT416((uint)fVar240);
            fVar224 = fVar240 * fVar240;
            fVar187 = fVar240 * fVar224;
            fVar239 = local_ac0 * local_ac0;
            fVar192 = local_ac0 * fVar239;
            local_940 = local_ac0 * fVar240;
            auVar127 = vshufps_avx(ZEXT416((uint)(fVar192 * 0.16666667)),
                                   ZEXT416((uint)(fVar192 * 0.16666667)),0);
            auVar135 = ZEXT416((uint)((fVar192 * 4.0 + fVar187 +
                                      local_ac0 * local_940 * 12.0 + fVar240 * local_940 * 6.0) *
                                     0.16666667));
            auVar135 = vshufps_avx(auVar135,auVar135,0);
            auVar129 = ZEXT416((uint)((fVar187 * 4.0 + fVar192 +
                                      fVar240 * local_940 * 12.0 + local_ac0 * local_940 * 6.0) *
                                     0.16666667));
            auVar129 = vshufps_avx(auVar129,auVar129,0);
            auVar220 = auVar394._0_16_;
            auVar134 = vshufps_avx(auVar220,auVar220,0);
            auVar201._0_4_ = auVar134._0_4_ * (float)local_a40._0_4_ + 0.0;
            auVar201._4_4_ = auVar134._4_4_ * (float)local_a40._4_4_ + 0.0;
            auVar201._8_4_ = auVar134._8_4_ * fStack_a38 + 0.0;
            auVar201._12_4_ = auVar134._12_4_ * fStack_a34 + 0.0;
            auVar134 = vshufps_avx(ZEXT416((uint)(fVar187 * 0.16666667)),
                                   ZEXT416((uint)(fVar187 * 0.16666667)),0);
            auVar133._0_4_ =
                 auVar134._0_4_ * (float)local_9a0._0_4_ +
                 auVar129._0_4_ * (float)local_9c0._0_4_ +
                 auVar127._0_4_ * (float)local_9d0._0_4_ + auVar135._0_4_ * (float)local_9b0._0_4_;
            auVar133._4_4_ =
                 auVar134._4_4_ * (float)local_9a0._4_4_ +
                 auVar129._4_4_ * (float)local_9c0._4_4_ +
                 auVar127._4_4_ * (float)local_9d0._4_4_ + auVar135._4_4_ * (float)local_9b0._4_4_;
            auVar133._8_4_ =
                 auVar134._8_4_ * fStack_998 +
                 auVar129._8_4_ * fStack_9b8 +
                 auVar127._8_4_ * fStack_9c8 + auVar135._8_4_ * fStack_9a8;
            auVar133._12_4_ =
                 auVar134._12_4_ * fStack_994 +
                 auVar129._12_4_ * fStack_9b4 +
                 auVar127._12_4_ * fStack_9c4 + auVar135._12_4_ * fStack_9a4;
            local_840._0_16_ = auVar133;
            auVar127 = vsubps_avx(auVar201,auVar133);
            _local_8e0 = auVar127;
            auVar127 = vdpps_avx(auVar127,auVar127,0x7f);
            local_a80 = auVar127._0_4_;
            auVar381 = auVar387._0_16_;
            uStack_abc = auVar387._4_4_;
            uStack_ab8 = auVar387._8_4_;
            uStack_ab4 = auVar387._12_4_;
            _local_ae0 = auVar220;
            fStack_a7c = auVar127._4_4_;
            fStack_a78 = auVar127._8_4_;
            fStack_a74 = auVar127._12_4_;
            if (local_a80 < 0.0) {
              local_a20._0_16_ = ZEXT416((uint)fVar240);
              local_a60._0_4_ = fVar239;
              local_a00._0_4_ = fVar224;
              fVar187 = sqrtf(local_a80);
              auVar381._4_4_ = uStack_abc;
              auVar381._0_4_ = local_ac0;
              auVar381._8_4_ = uStack_ab8;
              auVar381._12_4_ = uStack_ab4;
              auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar239 = (float)local_a60._0_4_;
              fVar224 = (float)local_a00._0_4_;
              auVar220 = _local_ae0;
            }
            else {
              auVar127 = vsqrtss_avx(auVar127,auVar127);
              fVar187 = auVar127._0_4_;
            }
            fVar240 = local_a20._0_4_;
            fVar192 = auVar381._0_4_;
            auVar127 = vshufps_avx(ZEXT416((uint)(fVar239 * 0.5)),ZEXT416((uint)(fVar239 * 0.5)),0);
            auVar135 = ZEXT416((uint)((fVar224 + local_940 * 4.0) * 0.5));
            auVar135 = vshufps_avx(auVar135,auVar135,0);
            auVar129 = ZEXT416((uint)((fVar192 * -fVar192 - local_940 * 4.0) * 0.5));
            auVar129 = vshufps_avx(auVar129,auVar129,0);
            auVar134 = ZEXT416((uint)(fVar240 * -fVar240 * 0.5));
            auVar134 = vshufps_avx(auVar134,auVar134,0);
            auVar372._0_4_ =
                 (float)local_9a0._0_4_ * auVar134._0_4_ +
                 (float)local_9c0._0_4_ * auVar129._0_4_ +
                 (float)local_9d0._0_4_ * auVar127._0_4_ + (float)local_9b0._0_4_ * auVar135._0_4_;
            auVar372._4_4_ =
                 (float)local_9a0._4_4_ * auVar134._4_4_ +
                 (float)local_9c0._4_4_ * auVar129._4_4_ +
                 (float)local_9d0._4_4_ * auVar127._4_4_ + (float)local_9b0._4_4_ * auVar135._4_4_;
            auVar372._8_4_ =
                 fStack_998 * auVar134._8_4_ +
                 fStack_9b8 * auVar129._8_4_ +
                 fStack_9c8 * auVar127._8_4_ + fStack_9a8 * auVar135._8_4_;
            auVar372._12_4_ =
                 fStack_994 * auVar134._12_4_ +
                 fStack_9b4 * auVar129._12_4_ +
                 fStack_9c4 * auVar127._12_4_ + fStack_9a4 * auVar135._12_4_;
            auVar378 = ZEXT1664(auVar372);
            auVar127 = vshufps_avx(auVar381,auVar381,0);
            auVar135 = ZEXT416((uint)(fVar240 - (fVar192 + fVar192)));
            auVar129 = vshufps_avx(auVar135,auVar135,0);
            auVar135 = ZEXT416((uint)(fVar192 - (fVar240 + fVar240)));
            auVar134 = vshufps_avx(auVar135,auVar135,0);
            auVar128 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0);
            auVar135 = vdpps_avx(auVar372,auVar372,0x7f);
            auVar165._0_4_ =
                 (float)local_9a0._0_4_ * auVar128._0_4_ +
                 (float)local_9c0._0_4_ * auVar134._0_4_ +
                 (float)local_9d0._0_4_ * auVar127._0_4_ + (float)local_9b0._0_4_ * auVar129._0_4_;
            auVar165._4_4_ =
                 (float)local_9a0._4_4_ * auVar128._4_4_ +
                 (float)local_9c0._4_4_ * auVar134._4_4_ +
                 (float)local_9d0._4_4_ * auVar127._4_4_ + (float)local_9b0._4_4_ * auVar129._4_4_;
            auVar165._8_4_ =
                 fStack_998 * auVar128._8_4_ +
                 fStack_9b8 * auVar134._8_4_ +
                 fStack_9c8 * auVar127._8_4_ + fStack_9a8 * auVar129._8_4_;
            auVar165._12_4_ =
                 fStack_994 * auVar128._12_4_ +
                 fStack_9b4 * auVar134._12_4_ +
                 fStack_9c4 * auVar127._12_4_ + fStack_9a4 * auVar129._12_4_;
            auVar127 = vblendps_avx(auVar135,_DAT_01feba10,0xe);
            auVar129 = vrsqrtss_avx(auVar127,auVar127);
            fVar239 = auVar129._0_4_;
            fVar224 = auVar135._0_4_;
            auVar129 = vdpps_avx(auVar372,auVar165,0x7f);
            auVar134 = vshufps_avx(auVar135,auVar135,0);
            auVar166._0_4_ = auVar165._0_4_ * auVar134._0_4_;
            auVar166._4_4_ = auVar165._4_4_ * auVar134._4_4_;
            auVar166._8_4_ = auVar165._8_4_ * auVar134._8_4_;
            auVar166._12_4_ = auVar165._12_4_ * auVar134._12_4_;
            auVar129 = vshufps_avx(auVar129,auVar129,0);
            auVar254._0_4_ = auVar372._0_4_ * auVar129._0_4_;
            auVar254._4_4_ = auVar372._4_4_ * auVar129._4_4_;
            auVar254._8_4_ = auVar372._8_4_ * auVar129._8_4_;
            auVar254._12_4_ = auVar372._12_4_ * auVar129._12_4_;
            auVar134 = vsubps_avx(auVar166,auVar254);
            auVar129 = vrcpss_avx(auVar127,auVar127);
            auVar127 = vmaxss_avx(ZEXT416((uint)local_960._0_4_),
                                  ZEXT416((uint)(auVar220._0_4_ * (float)local_6c0._0_4_)));
            local_940 = auVar127._0_4_;
            auVar127 = ZEXT416((uint)(auVar129._0_4_ * (2.0 - fVar224 * auVar129._0_4_)));
            auVar127 = vshufps_avx(auVar127,auVar127,0);
            uVar120 = CONCAT44(auVar372._4_4_,auVar372._0_4_);
            auVar339._0_8_ = uVar120 ^ 0x8000000080000000;
            auVar339._8_4_ = -auVar372._8_4_;
            auVar339._12_4_ = -auVar372._12_4_;
            auVar129 = ZEXT416((uint)(fVar239 * 1.5 + fVar224 * -0.5 * fVar239 * fVar239 * fVar239))
            ;
            auVar129 = vshufps_avx(auVar129,auVar129,0);
            auVar229._0_4_ = auVar129._0_4_ * auVar134._0_4_ * auVar127._0_4_;
            auVar229._4_4_ = auVar129._4_4_ * auVar134._4_4_ * auVar127._4_4_;
            auVar229._8_4_ = auVar129._8_4_ * auVar134._8_4_ * auVar127._8_4_;
            auVar229._12_4_ = auVar129._12_4_ * auVar134._12_4_ * auVar127._12_4_;
            local_8a0._0_4_ = auVar372._0_4_ * auVar129._0_4_;
            local_8a0._4_4_ = auVar372._4_4_ * auVar129._4_4_;
            local_8a0._8_4_ = auVar372._8_4_ * auVar129._8_4_;
            local_8a0._12_4_ = auVar372._12_4_ * auVar129._12_4_;
            local_a20._0_16_ = auVar372;
            if (fVar224 < 0.0) {
              local_a60._0_4_ = fVar187;
              local_a00._0_16_ = auVar339;
              local_8c0._0_16_ = auVar229;
              auVar378 = ZEXT1664(auVar372);
              fVar224 = sqrtf(fVar224);
              auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar229 = local_8c0._0_16_;
              auVar339 = local_a00._0_16_;
            }
            else {
              auVar127 = vsqrtss_avx(auVar135,auVar135);
              fVar224 = auVar127._0_4_;
              local_a60._0_4_ = fVar187;
            }
            auVar397._4_4_ = fStack_a7c;
            auVar397._0_4_ = local_a80;
            auVar397._8_4_ = fStack_a78;
            auVar397._12_4_ = fStack_a74;
            auVar127 = vdpps_avx(_local_8e0,local_8a0._0_16_,0x7f);
            local_a00._0_4_ =
                 ((float)local_960._0_4_ / fVar224) * ((float)local_a60._0_4_ + 1.0) +
                 (float)local_a60._0_4_ * (float)local_960._0_4_ + local_940;
            auVar135 = vdpps_avx(auVar339,local_8a0._0_16_,0x7f);
            auVar129 = vdpps_avx(_local_8e0,auVar229,0x7f);
            auVar134 = vdpps_avx(_local_a40,local_8a0._0_16_,0x7f);
            auVar220 = vdpps_avx(_local_8e0,auVar339,0x7f);
            fVar224 = auVar135._0_4_ + auVar129._0_4_;
            fVar187 = auVar127._0_4_;
            auVar136._0_4_ = fVar187 * fVar187;
            auVar136._4_4_ = auVar127._4_4_ * auVar127._4_4_;
            auVar136._8_4_ = auVar127._8_4_ * auVar127._8_4_;
            auVar136._12_4_ = auVar127._12_4_ * auVar127._12_4_;
            auVar129 = vsubps_avx(auVar397,auVar136);
            local_8a0._0_16_ = ZEXT416((uint)fVar224);
            auVar135 = vdpps_avx(_local_8e0,_local_a40,0x7f);
            fVar239 = auVar220._0_4_ - fVar187 * fVar224;
            local_a60._0_16_ = auVar127;
            fVar187 = auVar135._0_4_ - fVar187 * auVar134._0_4_;
            auVar127 = vrsqrtss_avx(auVar129,auVar129);
            fVar192 = auVar129._0_4_;
            fVar224 = auVar127._0_4_;
            fVar224 = fVar224 * 1.5 + fVar192 * -0.5 * fVar224 * fVar224 * fVar224;
            if (fVar192 < 0.0) {
              local_8c0._0_16_ = auVar134;
              local_880._0_4_ = fVar239;
              local_6e0._0_4_ = fVar187;
              local_700._0_4_ = fVar224;
              auVar378 = ZEXT1664(auVar378._0_16_);
              fVar192 = sqrtf(fVar192);
              auVar397._4_4_ = fStack_a7c;
              auVar397._0_4_ = local_a80;
              auVar397._8_4_ = fStack_a78;
              auVar397._12_4_ = fStack_a74;
              auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar224 = (float)local_700._0_4_;
              fVar239 = (float)local_880._0_4_;
              fVar187 = (float)local_6e0._0_4_;
              auVar134 = local_8c0._0_16_;
            }
            else {
              auVar127 = vsqrtss_avx(auVar129,auVar129);
              fVar192 = auVar127._0_4_;
            }
            auVar404 = ZEXT1664(auVar397);
            auVar129 = vpermilps_avx(local_840._0_16_,0xff);
            auVar220 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xff);
            fVar239 = fVar239 * fVar224 - auVar220._0_4_;
            auVar255._0_8_ = auVar134._0_8_ ^ 0x8000000080000000;
            auVar255._8_4_ = auVar134._8_4_ ^ 0x80000000;
            auVar255._12_4_ = auVar134._12_4_ ^ 0x80000000;
            auVar278._0_4_ = -fVar239;
            auVar278._4_4_ = 0x80000000;
            auVar278._8_4_ = 0x80000000;
            auVar278._12_4_ = 0x80000000;
            auVar127 = vinsertps_avx(ZEXT416((uint)(fVar187 * fVar224)),auVar255,0x10);
            auVar135 = vmovsldup_avx(ZEXT416((uint)(local_8a0._0_4_ * fVar187 * fVar224 -
                                                   auVar134._0_4_ * fVar239)));
            auVar127 = vdivps_avx(auVar127,auVar135);
            auVar308 = ZEXT1664(local_a60._0_16_);
            auVar134 = ZEXT416((uint)(fVar192 - auVar129._0_4_));
            auVar129 = vinsertps_avx(local_a60._0_16_,auVar134,0x10);
            auVar230._0_4_ = auVar129._0_4_ * auVar127._0_4_;
            auVar230._4_4_ = auVar129._4_4_ * auVar127._4_4_;
            auVar230._8_4_ = auVar129._8_4_ * auVar127._8_4_;
            auVar230._12_4_ = auVar129._12_4_ * auVar127._12_4_;
            auVar127 = vinsertps_avx(auVar278,local_8a0._0_16_,0x1c);
            auVar127 = vdivps_avx(auVar127,auVar135);
            auVar135 = vhaddps_avx(auVar230,auVar230);
            auVar202._0_4_ = auVar129._0_4_ * auVar127._0_4_;
            auVar202._4_4_ = auVar129._4_4_ * auVar127._4_4_;
            auVar202._8_4_ = auVar129._8_4_ * auVar127._8_4_;
            auVar202._12_4_ = auVar129._12_4_ * auVar127._12_4_;
            auVar127 = vhaddps_avx(auVar202,auVar202);
            local_ac0 = local_ac0 - auVar135._0_4_;
            auVar387 = ZEXT464((uint)local_ac0);
            fVar224 = (float)local_ae0._0_4_ - auVar127._0_4_;
            auVar394 = ZEXT464((uint)fVar224);
            auVar256._8_4_ = 0x7fffffff;
            auVar256._0_8_ = 0x7fffffff7fffffff;
            auVar256._12_4_ = 0x7fffffff;
            auVar290 = ZEXT1664(auVar256);
            auVar127 = vandps_avx(local_a60._0_16_,auVar256);
            bVar98 = true;
            if (auVar127._0_4_ < (float)local_a00._0_4_) {
              auVar127 = vandps_avx(auVar134,auVar256);
              if (auVar127._0_4_ <
                  (float)local_720._0_4_ * 1.9073486e-06 + (float)local_a00._0_4_ + local_940) {
                fVar224 = fVar224 + (float)local_810._0_4_;
                auVar394 = ZEXT464((uint)fVar224);
                if (((((ray->org).field_0.m128[3] <= fVar224) &&
                     (fVar187 = ray->tfar, fVar224 <= fVar187)) && (0.0 <= local_ac0)) &&
                   (local_ac0 <= 1.0)) {
                  auVar127 = vrsqrtss_avx(auVar397,auVar397);
                  fVar239 = auVar127._0_4_;
                  pGVar31 = (context->scene->geometries).items[local_a88].ptr;
                  if ((pGVar31->mask & ray->mask) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar115 = 1;
                    }
                    else {
                      auVar127 = ZEXT416((uint)(fVar239 * 1.5 +
                                               auVar397._0_4_ * -0.5 * fVar239 * fVar239 * fVar239))
                      ;
                      auVar127 = vshufps_avx(auVar127,auVar127,0);
                      auVar167._0_4_ = auVar127._0_4_ * (float)local_8e0._0_4_;
                      auVar167._4_4_ = auVar127._4_4_ * (float)local_8e0._4_4_;
                      auVar167._8_4_ = auVar127._8_4_ * fStack_8d8;
                      auVar167._12_4_ = auVar127._12_4_ * fStack_8d4;
                      auVar137._0_4_ = local_a20._0_4_ + auVar220._0_4_ * auVar167._0_4_;
                      auVar137._4_4_ = local_a20._4_4_ + auVar220._4_4_ * auVar167._4_4_;
                      auVar137._8_4_ = local_a20._8_4_ + auVar220._8_4_ * auVar167._8_4_;
                      auVar137._12_4_ = local_a20._12_4_ + auVar220._12_4_ * auVar167._12_4_;
                      auVar127 = vshufps_avx(auVar167,auVar167,0xc9);
                      auVar135 = vshufps_avx(local_a20._0_16_,local_a20._0_16_,0xc9);
                      auVar168._0_4_ = auVar135._0_4_ * auVar167._0_4_;
                      auVar168._4_4_ = auVar135._4_4_ * auVar167._4_4_;
                      auVar168._8_4_ = auVar135._8_4_ * auVar167._8_4_;
                      auVar168._12_4_ = auVar135._12_4_ * auVar167._12_4_;
                      auVar203._0_4_ = local_a20._0_4_ * auVar127._0_4_;
                      auVar203._4_4_ = local_a20._4_4_ * auVar127._4_4_;
                      auVar203._8_4_ = local_a20._8_4_ * auVar127._8_4_;
                      auVar203._12_4_ = local_a20._12_4_ * auVar127._12_4_;
                      auVar129 = vsubps_avx(auVar203,auVar168);
                      auVar127 = vshufps_avx(auVar129,auVar129,0xc9);
                      auVar135 = vshufps_avx(auVar137,auVar137,0xc9);
                      auVar204._0_4_ = auVar135._0_4_ * auVar127._0_4_;
                      auVar204._4_4_ = auVar135._4_4_ * auVar127._4_4_;
                      auVar204._8_4_ = auVar135._8_4_ * auVar127._8_4_;
                      auVar204._12_4_ = auVar135._12_4_ * auVar127._12_4_;
                      auVar127 = vshufps_avx(auVar129,auVar129,0xd2);
                      auVar138._0_4_ = auVar137._0_4_ * auVar127._0_4_;
                      auVar138._4_4_ = auVar137._4_4_ * auVar127._4_4_;
                      auVar138._8_4_ = auVar137._8_4_ * auVar127._8_4_;
                      auVar138._12_4_ = auVar137._12_4_ * auVar127._12_4_;
                      auVar135 = vsubps_avx(auVar204,auVar138);
                      auVar127 = vshufps_avx(auVar135,auVar135,0xe9);
                      local_920 = vmovlps_avx(auVar127);
                      local_918 = auVar135._0_4_;
                      local_910 = 0;
                      local_90c = (undefined4)local_8e8;
                      local_908 = (undefined4)local_a88;
                      local_904 = context->user->instID[0];
                      local_900 = context->user->instPrimID[0];
                      ray->tfar = fVar224;
                      local_ae4 = -1;
                      local_990.valid = &local_ae4;
                      local_990.geometryUserPtr = pGVar31->userPtr;
                      local_990.context = context->user;
                      local_990.hit = (RTCHitN *)&local_920;
                      local_990.N = 1;
                      uStack_abc = 0;
                      uStack_ab8 = 0;
                      uStack_ab4 = 0;
                      _local_ae0 = ZEXT416((uint)fVar224);
                      local_a80 = fVar187;
                      local_990.ray = (RTCRayN *)ray;
                      local_914 = local_ac0;
                      if (pGVar31->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01217b16:
                        p_Var34 = context->args->filter;
                        if (p_Var34 != (RTCFilterFunctionN)0x0) {
                          if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar31->field_8).field_0x2 & 0x40) != 0)) {
                            auVar308 = ZEXT1664(auVar308._0_16_);
                            auVar378 = ZEXT1664(auVar378._0_16_);
                            auVar404 = ZEXT1664(auVar404._0_16_);
                            (*p_Var34)(&local_990);
                            auVar394 = ZEXT1664(_local_ae0);
                            auVar387 = ZEXT1664(CONCAT412(uStack_ab4,
                                                          CONCAT48(uStack_ab8,
                                                                   CONCAT44(uStack_abc,local_ac0))))
                            ;
                            auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          if (*local_990.valid == 0) goto LAB_01217b73;
                        }
                        uVar115 = 1;
                      }
                      else {
                        auVar308 = ZEXT1664(local_a60._0_16_);
                        auVar378 = ZEXT1664(auVar378._0_16_);
                        auVar404 = ZEXT1664(auVar397);
                        (*pGVar31->occlusionFilterN)(&local_990);
                        auVar394 = ZEXT1664(_local_ae0);
                        auVar387 = ZEXT1664(CONCAT412(uStack_ab4,
                                                      CONCAT48(uStack_ab8,
                                                               CONCAT44(uStack_abc,local_ac0))));
                        auVar290 = ZEXT1664(CONCAT412(0x7fffffff,
                                                      CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        auVar327 = ZEXT1664(ZEXT816(0) << 0x40);
                        if (*local_990.valid != 0) goto LAB_01217b16;
LAB_01217b73:
                        uVar115 = 0;
                      }
                      if ((char)uVar115 == '\0') {
                        ray->tfar = local_a80;
                      }
                    }
                    bVar98 = false;
                    goto LAB_01217996;
                  }
                }
                bVar98 = false;
                uVar115 = 0;
              }
            }
LAB_01217996:
            bVar114 = (byte)uVar115;
            if (!bVar98) goto LAB_01217b8a;
            lVar116 = lVar116 + -1;
          } while (lVar116 != 0);
          bVar114 = 0;
LAB_01217b8a:
          uVar115 = (ulong)(bVar114 & 1);
          bVar122 = bVar122 | bVar114 & 1;
          fVar224 = ray->tfar;
          auVar151._4_4_ = fVar224;
          auVar151._0_4_ = fVar224;
          auVar151._8_4_ = fVar224;
          auVar151._12_4_ = fVar224;
          auVar151._16_4_ = fVar224;
          auVar151._20_4_ = fVar224;
          auVar151._24_4_ = fVar224;
          auVar151._28_4_ = fVar224;
          auVar35 = vcmpps_avx(_local_7a0,auVar151,2);
          auVar139 = vandps_avx(auVar35,local_640);
          local_640 = local_640 & auVar35;
          uVar120 = local_660;
        } while ((((((((local_640 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_640 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_640 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_640 >> 0x7f,0) != '\0') ||
                   (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_640 >> 0xbf,0) != '\0') ||
                 (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_640[0x1f] < '\0');
      }
      auVar139 = vandps_avx(local_680,local_560);
      auVar35 = vandps_avx(_local_7e0,_local_7c0);
      auVar212._0_4_ = (float)local_860._0_4_ + local_460._0_4_;
      auVar212._4_4_ = (float)local_860._4_4_ + local_460._4_4_;
      auVar212._8_4_ = fStack_858 + local_460._8_4_;
      auVar212._12_4_ = fStack_854 + local_460._12_4_;
      auVar212._16_4_ = fStack_850 + local_460._16_4_;
      auVar212._20_4_ = fStack_84c + local_460._20_4_;
      auVar212._24_4_ = fStack_848 + local_460._24_4_;
      auVar212._28_4_ = fStack_844 + local_460._28_4_;
      fVar224 = ray->tfar;
      auVar261._4_4_ = fVar224;
      auVar261._0_4_ = fVar224;
      auVar261._8_4_ = fVar224;
      auVar261._12_4_ = fVar224;
      auVar261._16_4_ = fVar224;
      auVar261._20_4_ = fVar224;
      auVar261._24_4_ = fVar224;
      auVar261._28_4_ = fVar224;
      auVar36 = vcmpps_avx(auVar212,auVar261,2);
      auVar139 = vandps_avx(auVar36,auVar139);
      auVar288._0_4_ = (float)local_860._0_4_ + local_4a0._0_4_;
      auVar288._4_4_ = (float)local_860._4_4_ + local_4a0._4_4_;
      auVar288._8_4_ = fStack_858 + local_4a0._8_4_;
      auVar288._12_4_ = fStack_854 + local_4a0._12_4_;
      auVar288._16_4_ = fStack_850 + local_4a0._16_4_;
      auVar288._20_4_ = fStack_84c + local_4a0._20_4_;
      auVar288._24_4_ = fStack_848 + local_4a0._24_4_;
      auVar288._28_4_ = fStack_844 + local_4a0._28_4_;
      auVar36 = vcmpps_avx(auVar288,auVar261,2);
      auVar35 = vandps_avx(auVar36,auVar35);
      auVar35 = vorps_avx(auVar139,auVar35);
      if ((((((((auVar35 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar35 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar35 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar35 >> 0x7f,0) != '\0') ||
            (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar35 >> 0xbf,0) != '\0') ||
          (auVar35 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar35[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar113 * 0x60) = auVar35;
        auVar139 = vblendvps_avx(_local_4a0,local_460,auVar139);
        *(undefined1 (*) [32])(auStack_160 + uVar113 * 0x60) = auVar139;
        uVar8 = vmovlps_avx(local_800);
        *(undefined8 *)(afStack_140 + uVar113 * 0x18) = uVar8;
        auStack_138[uVar113 * 0x18] = (int)uVar120 + 1;
        uVar113 = (ulong)((int)uVar113 + 1);
      }
      auVar290 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    fVar224 = ray->tfar;
    auVar147._4_4_ = fVar224;
    auVar147._0_4_ = fVar224;
    auVar147._8_4_ = fVar224;
    auVar147._12_4_ = fVar224;
    auVar147._16_4_ = fVar224;
    auVar147._20_4_ = fVar224;
    auVar147._24_4_ = fVar224;
    auVar147._28_4_ = fVar224;
    uVar121 = uVar113;
    do {
      if ((int)uVar121 == 0) {
        if (bVar122 != 0) {
          return local_af1;
        }
        fVar224 = ray->tfar;
        auVar154._4_4_ = fVar224;
        auVar154._0_4_ = fVar224;
        auVar154._8_4_ = fVar224;
        auVar154._12_4_ = fVar224;
        auVar154._16_4_ = fVar224;
        auVar154._20_4_ = fVar224;
        auVar154._24_4_ = fVar224;
        auVar154._28_4_ = fVar224;
        auVar139 = vcmpps_avx(local_2c0,auVar154,2);
        uVar112 = vmovmskps_avx(auVar139);
        uVar112 = (uint)local_7e8 - 1 & (uint)local_7e8 & uVar112;
        local_af1 = uVar112 != 0;
        if (!local_af1) {
          return local_af1;
        }
        goto LAB_012153b1;
      }
      uVar113 = (ulong)((int)uVar121 - 1);
      lVar116 = uVar113 * 0x60;
      auVar139 = *(undefined1 (*) [32])(auStack_160 + lVar116);
      auVar174._0_4_ = (float)local_860._0_4_ + auVar139._0_4_;
      auVar174._4_4_ = (float)local_860._4_4_ + auVar139._4_4_;
      auVar174._8_4_ = fStack_858 + auVar139._8_4_;
      auVar174._12_4_ = fStack_854 + auVar139._12_4_;
      auVar174._16_4_ = fStack_850 + auVar139._16_4_;
      auVar174._20_4_ = fStack_84c + auVar139._20_4_;
      auVar174._24_4_ = fStack_848 + auVar139._24_4_;
      auVar174._28_4_ = fStack_844 + auVar139._28_4_;
      auVar36 = vcmpps_avx(auVar174,auVar147,2);
      auVar35 = vandps_avx(auVar36,*(undefined1 (*) [32])(auStack_180 + lVar116));
      local_460 = auVar35;
      auVar36 = *(undefined1 (*) [32])(auStack_180 + lVar116) & auVar36;
      bVar104 = (auVar36 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar105 = (auVar36 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar103 = (auVar36 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar102 = SUB321(auVar36 >> 0x7f,0) == '\0';
      bVar101 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar100 = SUB321(auVar36 >> 0xbf,0) == '\0';
      bVar99 = (auVar36 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar98 = -1 < auVar36[0x1f];
      if (((((((!bVar104 || !bVar105) || !bVar103) || !bVar102) || !bVar101) || !bVar100) || !bVar99
          ) || !bVar98) {
        auVar238._8_4_ = 0x7f800000;
        auVar238._0_8_ = 0x7f8000007f800000;
        auVar238._12_4_ = 0x7f800000;
        auVar238._16_4_ = 0x7f800000;
        auVar238._20_4_ = 0x7f800000;
        auVar238._24_4_ = 0x7f800000;
        auVar238._28_4_ = 0x7f800000;
        auVar139 = vblendvps_avx(auVar238,auVar139,auVar35);
        auVar36 = vshufps_avx(auVar139,auVar139,0xb1);
        auVar36 = vminps_avx(auVar139,auVar36);
        auVar37 = vshufpd_avx(auVar36,auVar36,5);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar37 = vperm2f128_avx(auVar36,auVar36,1);
        auVar36 = vminps_avx(auVar36,auVar37);
        auVar139 = vcmpps_avx(auVar139,auVar36,0);
        auVar36 = auVar35 & auVar139;
        if ((((((((auVar36 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar36 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar36 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar36 >> 0x7f,0) != '\0') ||
              (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar36 >> 0xbf,0) != '\0') ||
            (auVar36 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar36[0x1f] < '\0') {
          auVar35 = vandps_avx(auVar139,auVar35);
        }
        fVar224 = afStack_140[uVar113 * 0x18 + 1];
        uVar120 = (ulong)auStack_138[uVar113 * 0x18];
        uVar118 = vmovmskps_avx(auVar35);
        uVar112 = 0;
        if (uVar118 != 0) {
          for (; (uVar118 >> uVar112 & 1) == 0; uVar112 = uVar112 + 1) {
          }
        }
        fVar187 = afStack_140[uVar113 * 0x18];
        *(undefined4 *)(local_460 + (ulong)uVar112 * 4) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar116) = local_460;
        if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_460 >> 0x7f,0) != '\0') ||
              (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_460 >> 0xbf,0) != '\0') ||
            (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_460[0x1f] < '\0') {
          uVar113 = uVar121;
        }
        auVar127 = vshufps_avx(ZEXT416((uint)(fVar224 - fVar187)),ZEXT416((uint)(fVar224 - fVar187))
                               ,0);
        local_4a0._4_4_ = fVar187 + auVar127._4_4_ * 0.14285715;
        local_4a0._0_4_ = fVar187 + auVar127._0_4_ * 0.0;
        fStack_498 = fVar187 + auVar127._8_4_ * 0.2857143;
        fStack_494 = fVar187 + auVar127._12_4_ * 0.42857146;
        fStack_490 = fVar187 + auVar127._0_4_ * 0.5714286;
        fStack_48c = fVar187 + auVar127._4_4_ * 0.71428573;
        fStack_488 = fVar187 + auVar127._8_4_ * 0.8571429;
        fStack_484 = fVar187 + auVar127._12_4_;
        local_800._8_8_ = 0;
        local_800._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar112 * 4);
      }
      uVar121 = uVar113;
    } while (((((((bVar104 && bVar105) && bVar103) && bVar102) && bVar101) && bVar100) && bVar99) &&
             bVar98);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }